

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces_box.cpp
# Opt level: O2

void EBMOL::ExtrapVelToFacesBox
               (Box *ubx,Box *vbx,Box *wbx,Array4<double> *u,Array4<double> *v,Array4<double> *w,
               Array4<const_double> *vcc,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,Geometry *geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  pointer pBVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  EBCellFlag *pEVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  double *pdVar38;
  undefined1 auVar39 [16];
  undefined8 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  double *pdVar88;
  double *pdVar89;
  double *pdVar90;
  double *pdVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  Real *pRVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  int iVar134;
  int iVar135;
  Real (*paRVar136) [3];
  long lVar137;
  int k_2;
  long lVar138;
  long lVar139;
  int k;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  long lVar144;
  long lVar145;
  int iVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  int iVar150;
  int iVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  int iVar157;
  int iVar158;
  long lVar159;
  long lVar160;
  long lVar161;
  char cVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  int kk_14;
  int iVar166;
  double *pdVar167;
  long lVar168;
  long lVar169;
  char cVar170;
  long lVar171;
  int kk;
  double *pdVar172;
  long lVar173;
  long lVar174;
  int j;
  int iVar175;
  int iVar176;
  long lVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  double *pdVar181;
  long lVar182;
  bool bVar183;
  ulong uVar184;
  ulong uVar185;
  double dVar186;
  double dVar187;
  Real RVar188;
  ulong uVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  double dVar195;
  ulong uVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined4 uVar203;
  undefined4 uVar204;
  undefined4 uVar205;
  undefined4 uVar206;
  undefined4 uVar207;
  undefined4 uVar208;
  Real delta_y_1;
  double dVar209;
  undefined1 auVar210 [16];
  double dVar211;
  double dVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar225;
  double dVar226;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  Real delta_y;
  undefined1 auVar233 [16];
  double dVar234;
  double dVar235;
  double dVar236;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  EBCellFlag *local_a30;
  undefined1 local_a08 [8];
  double dStack_a00;
  ulong local_9b0;
  double *local_8d8;
  double dStack_8d0;
  double *local_7f0;
  double *local_7e8;
  double *local_7e0;
  double *local_718;
  double *local_710;
  double *local_708;
  double *local_698;
  double *local_690;
  double *local_688;
  double local_618 [4];
  undefined8 local_5f8;
  Array4<double> *local_5e8;
  double *local_5e0;
  long local_5d8;
  long local_5d0;
  double *local_5c8;
  long local_5c0;
  double *local_5b8;
  double *local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  EBCellFlag *local_598;
  ulong local_590;
  long local_588;
  ulong local_580;
  long local_578;
  double *local_570;
  long local_568;
  double *local_560;
  long local_558;
  long local_550;
  double *local_548;
  double *local_540;
  double *local_538;
  double *local_530;
  double *local_528;
  double *local_520;
  EBCellFlag *local_518;
  double *local_510;
  double *local_508;
  double *local_500;
  double *local_4f8;
  double *local_4f0;
  long local_4e8;
  long local_4e0;
  double *local_4d8;
  double *local_4d0;
  double local_4c8;
  undefined8 uStack_4c0;
  double local_4b8;
  EBCellFlag *local_4a8;
  undefined8 uStack_4a0;
  double local_498;
  undefined8 uStack_490;
  long local_480;
  ulong local_478;
  long local_470;
  long local_468;
  ulong local_460;
  double local_458;
  double local_450;
  double dStack_448;
  double local_438;
  double dStack_430;
  double local_418;
  double *local_408;
  long local_400;
  long local_3f8;
  double *local_3f0;
  long local_3e8;
  long local_3e0;
  double *local_3d8;
  double *local_3d0;
  long local_3c8;
  EBCellFlag *local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  Real du [27];
  Real A [27] [3];
  
  iVar143 = (geom->domain).smallend.vect[0];
  iVar180 = (geom->domain).smallend.vect[1];
  iVar4 = (geom->domain).bigend.vect[0];
  iVar5 = (geom->domain).bigend.vect[1];
  iVar6 = (geom->domain).smallend.vect[2];
  iVar7 = (geom->domain).bigend.vect[2];
  pBVar23 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_5e8 = w;
  if ((pBVar23->bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar143)) {
    iVar8 = (ubx->bigend).vect[0];
  }
  else {
    iVar8 = (ubx->bigend).vect[0];
    if ((((iVar8 < iVar4 || pBVar23->bc[3] - 5U < 0xfffffffe) &&
         ((1 < pBVar23->bc[1] - 3U || (iVar180 < (vbx->smallend).vect[1] + -1)))) &&
        ((pBVar23->bc[4] - 5U < 0xfffffffe || ((vbx->bigend).vect[1] < iVar5)))) &&
       (((1 < pBVar23->bc[2] - 3U || (iVar6 < (wbx->smallend).vect[2] + -1)) &&
        ((pBVar23->bc[5] - 5U < 0xfffffffe || ((wbx->bigend).vect[2] < iVar7)))))) {
      lVar123 = (long)(ubx->smallend).vect[2];
      local_560 = u->p;
      local_540 = (double *)u->jstride;
      local_568 = u->kstride;
      local_4e0 = (long)(u->begin).x;
      lVar24 = ccc->kstride;
      lVar25 = ccc->nstride;
      iVar9 = (ccc->begin).x;
      lVar147 = (long)iVar9;
      iVar141 = (ccc->begin).z;
      local_570 = (double *)(long)iVar141;
      local_4e8 = lVar25 * 0x10;
      lVar152 = (~(ulong)local_570 + lVar123) * lVar24;
      local_548 = (double *)(long)(u->begin).y;
      iVar140 = (u->begin).z;
      uVar13 = (vfrac->begin).y;
      lVar119 = (long)(int)uVar13;
      uVar21 = (vfrac->begin).z;
      local_578 = (long)(int)uVar21;
      local_580 = (ulong)~uVar21;
      uVar22 = (vcc->begin).x;
      local_4f8 = (double *)(long)(int)(~uVar22 + iVar143);
      iVar10 = (ubx->smallend).vect[0];
      iVar115 = iVar10 + -1;
      pdVar26 = ccc->p;
      local_688 = pdVar26 + ((lVar152 + -1) - lVar147);
      iVar11 = (ccc->begin).y;
      local_690 = pdVar26 + ((lVar152 + lVar25 + -1) - lVar147);
      local_698 = pdVar26 + ((lVar152 + lVar25 * 2 + -1) - lVar147);
      local_588 = (long)(ubx->smallend).vect[1];
      local_4f0 = (double *)(long)(ubx->bigend).vect[1];
      local_558 = (long)(ubx->bigend).vect[2];
      pdVar32 = vcc->p;
      lVar152 = vcc->jstride;
      lVar147 = vcc->kstride;
      iVar175 = (vcc->begin).y;
      iVar178 = (vcc->begin).z;
      local_590 = (ulong)iVar178;
      local_598 = flag->p;
      lVar27 = flag->jstride;
      local_5a0 = flag->kstride;
      iVar14 = (flag->begin).x;
      local_4b8 = (double)CONCAT44(local_4b8._4_4_,iVar14);
      iVar15 = (flag->begin).y;
      local_5a8 = (ulong)(flag->begin).z;
      local_5b0 = fcx->p;
      lVar28 = fcx->jstride;
      local_5b8 = (double *)fcx->kstride;
      lVar30 = fcx->nstride;
      iVar16 = (fcx->begin).x;
      iVar17 = (fcx->begin).y;
      local_5c0 = (long)(fcx->begin).z;
      local_5c8 = fcy->p;
      lVar31 = fcy->jstride;
      local_5d0 = fcy->kstride;
      lVar33 = fcy->nstride;
      iVar18 = (fcy->begin).x;
      iVar19 = (fcy->begin).y;
      local_5d8 = (long)(fcy->begin).z;
      local_5e0 = fcz->p;
      local_550 = fcz->jstride;
      lVar34 = fcz->kstride;
      lVar35 = fcz->nstride;
      iVar20 = (fcz->begin).x;
      iVar82 = (fcz->begin).y;
      iVar83 = (fcz->begin).z;
      lVar36 = ccc->jstride;
      pdVar37 = vfrac->p;
      lVar163 = vfrac->jstride;
      lVar164 = vfrac->kstride;
      local_5f8._0_4_ = (vfrac->begin).x;
      while (lVar123 <= local_558) {
        iVar116 = (int)lVar123;
        iVar135 = iVar116 - iVar141;
        iVar157 = iVar116 - iVar178;
        pdVar89 = (double *)(iVar157 * lVar147);
        lVar148 = (lVar123 - local_578) * lVar164;
        lVar168 = ((lVar123 + -1) - local_578) * lVar164;
        lVar120 = lVar123 + 1;
        lVar122 = (lVar120 - local_578) * lVar164;
        lVar124 = ((lVar123 + -1) - local_590) * lVar147;
        lVar92 = (lVar120 - local_590) * lVar147;
        local_500 = local_5c8 + (lVar123 - local_5d8) * local_5d0;
        local_508 = local_5e0 + ((iVar116 - iVar83) + 1) * lVar34;
        lVar93 = (lVar123 - iVar83) * lVar34;
        lVar94 = (int)(~uVar21 + iVar116) * lVar164;
        local_510 = (double *)((int)((iVar116 - uVar21) + 1) * lVar164);
        local_518 = local_598 + (lVar123 - local_5a8) * local_5a0;
        local_520 = local_5b0 + (lVar123 - local_5c0) * (long)local_5b8;
        local_528 = pdVar26 + iVar135 * lVar24;
        local_530 = pdVar37 + lVar148;
        local_538 = pdVar32 + (long)pdVar89;
        lVar121 = local_588;
        while (lVar121 <= (long)local_4f0) {
          if (iVar8 < iVar10) {
            lVar121 = lVar121 + 1;
          }
          else {
            lVar95 = (lVar121 - iVar15) * lVar27;
            lVar96 = lVar121 - (long)local_548;
            lVar97 = (lVar121 - iVar17) * lVar28;
            iVar116 = (int)lVar121;
            iVar158 = iVar116 - iVar11;
            lVar98 = iVar158 * lVar36;
            iVar87 = iVar116 - iVar175;
            lVar99 = iVar87 * lVar152;
            lVar100 = (lVar121 - lVar119) * lVar163;
            lVar138 = ((lVar121 + -1) - lVar119) * lVar163;
            lVar154 = lVar121 + 1;
            lVar159 = (lVar154 - lVar119) * lVar163;
            lVar125 = ((lVar121 + -1) - (long)iVar175) * lVar152;
            lVar126 = (lVar154 - iVar175) * lVar152;
            lVar127 = ((iVar116 - iVar19) + 1) * lVar31;
            lVar128 = (lVar121 - iVar19) * lVar31;
            lVar129 = (lVar121 - iVar82) * local_550;
            lVar130 = (int)(~uVar13 + iVar116) * lVar163;
            lVar131 = (int)((iVar116 - uVar13) + 1) * lVar163;
            lVar173 = (lVar121 + ~(long)iVar11) * lVar36 * 8;
            local_4d0 = (double *)((long)local_688 + lVar173);
            local_4d8 = (double *)((long)local_690 + lVar173);
            pdVar38 = pdVar32 + (long)(lVar99 + (long)pdVar89);
            iVar85 = iVar115;
            iVar86 = iVar10;
            iVar116 = iVar115 - iVar9;
            iVar166 = iVar115 - uVar22;
            iVar117 = iVar10 - uVar22;
            iVar84 = (iVar10 - uVar22) + -2;
            do {
              uVar12 = local_518[lVar95 + (iVar86 - iVar14)].flag;
              dVar197 = 0.0;
              if ((uVar12 >> 0x11 & 1) != 0) {
                lVar121 = (long)iVar85;
                local_8d8 = local_4d0 + lVar121;
                pdVar88 = local_4d8 + lVar121;
                lVar121 = (long)local_698 + lVar121 * 8 + lVar173;
                iVar118 = iVar86 - iVar16;
                pdVar1 = local_520 + lVar97 + iVar118;
                dVar197 = *pdVar1;
                dVar199 = pdVar1[lVar30];
                pdVar91 = local_528 + lVar98 + (iVar86 - iVar9);
                dVar198 = *pdVar91;
                dVar195 = pdVar91[lVar25];
                dVar186 = pdVar91[lVar25 * 2];
                iVar151 = iVar86 + -1;
                lVar153 = (long)(int)(iVar151 - uVar22);
                dVar2 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                lVar101 = (long)(int)(iVar86 - uVar22);
                pdVar91 = pdVar32 + lVar99 + lVar101;
                dVar3 = pdVar91[(long)pdVar89];
                cVar170 = '\x05';
                iVar142 = 0;
                for (lVar182 = -1; lVar182 != 2; lVar182 = lVar182 + 1) {
                  iVar179 = (int)lVar182;
                  iVar176 = iVar142;
                  cVar162 = cVar170;
                  for (lVar102 = -1; iVar142 = iVar142 + 3, lVar102 != 2; lVar102 = lVar102 + 1) {
                    lVar104 = (long)iVar176;
                    paRVar136 = A + lVar104;
                    iVar150 = (int)lVar102;
                    iVar176 = iVar176 + 3;
                    for (lVar103 = 0; iVar142 - lVar104 != lVar103; lVar103 = lVar103 + 1) {
                      iVar80 = (int)lVar103 + -1;
                      if (((iVar150 == 0 && iVar179 == 0) && iVar80 == 0) ||
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) == 0)) {
                        (*paRVar136)[0] = 0.0;
                        (*paRVar136)[1] = 0.0;
                        (*paRVar136)[2] = 0.0;
                      }
                      else {
                        pdVar167 = pdVar26 + (iVar135 + iVar179) * lVar24 +
                                             (iVar158 + iVar150) * lVar36 +
                                             (long)(iVar116 + (int)lVar103);
                        dVar187 = pdVar167[lVar25];
                        (*paRVar136)[0] = (*pdVar167 + (double)iVar80) - dVar198;
                        (*paRVar136)[1] = (dVar187 + (double)iVar150) - dVar195;
                        (*paRVar136)[2] = (pdVar167[lVar25 * 2] + (double)iVar179) - dVar186;
                      }
                      paRVar136 = paRVar136 + 1;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                  iVar142 = iVar176;
                }
                local_4a8 = (EBCellFlag *)(dVar198 + 0.5);
                uStack_4a0 = 0;
                iVar142 = 0;
                cVar170 = '\x05';
                for (lVar182 = -1; lVar182 != 2; lVar182 = lVar182 + 1) {
                  iVar176 = iVar142;
                  cVar162 = cVar170;
                  for (lVar102 = -1; iVar176 = iVar176 + 3, lVar102 != 2; lVar102 = lVar102 + 1) {
                    lVar103 = (long)iVar142;
                    iVar142 = iVar142 + 3;
                    for (lVar104 = 0; iVar176 - lVar103 != lVar104; lVar104 = lVar104 + 1) {
                      RVar188 = 0.0;
                      if (((int)lVar104 != 1 || ((int)lVar102 != 0 || (int)lVar182 != 0)) &&
                         ((1 << (cVar162 + (char)lVar104 & 0x1fU) & uVar12) != 0)) {
                        RVar188 = pdVar32[(iVar157 + (int)lVar182) * lVar147 +
                                          (iVar87 + (int)lVar102) * lVar152 +
                                          (long)(iVar166 + (int)lVar104)] - dVar3;
                      }
                      du[lVar103 + lVar104] = RVar188;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar187 = dVar199 - dVar186;
                pdVar167 = &local_458;
                for (lVar182 = 0; lVar102 = -0x48, lVar182 != 3; lVar182 = lVar182 + 1) {
                  for (; lVar102 != 0; lVar102 = lVar102 + 0x18) {
                    *(undefined8 *)((long)pdVar167 + lVar102 + 0x48) = 0;
                  }
                  local_618[lVar182] = 0.0;
                  pdVar167 = pdVar167 + 1;
                }
                local_4c8 = dVar2;
                if (dVar2 <= dVar3) {
                  local_4c8 = dVar3;
                }
                uStack_4c0 = 0;
                pRVar114 = A[0] + 2;
                dVar217 = local_618[1];
                dVar220 = local_618[2];
                dVar216 = local_438;
                dVar218 = dStack_448;
                dVar221 = local_418;
                dVar235 = local_618[0];
                dVar222 = local_458;
                dVar225 = dStack_430;
                dVar209 = local_450;
                for (lVar182 = 0; lVar182 != 0x1b; lVar182 = lVar182 + 1) {
                  dVar234 = (*(Real (*) [3])(pRVar114 + -2))[0];
                  dVar236 = pRVar114[-1];
                  dVar211 = *pRVar114;
                  dVar216 = dVar216 + dVar236 * pRVar114[-1];
                  dVar218 = dVar218 + dVar234 * *pRVar114;
                  dVar225 = dVar225 + dVar211 * dVar236;
                  dVar209 = dVar209 + dVar236 * dVar234;
                  dVar221 = dVar221 + dVar211 * dVar211;
                  dVar211 = du[lVar182];
                  dVar235 = dVar235 + dVar234 * dVar211;
                  dVar222 = dVar222 + dVar234 * dVar234;
                  dVar217 = dVar217 + dVar211 * pRVar114[-1];
                  dVar220 = dVar220 + dVar211 * *pRVar114;
                  pRVar114 = pRVar114 + 3;
                }
                dVar211 = dVar209 * dVar221 - dVar218 * dVar225;
                auVar231._8_4_ = SUB84(dVar235,0);
                auVar231._0_8_ = dVar209;
                auVar231._12_4_ = (int)((ulong)dVar235 >> 0x20);
                dVar236 = dVar209 * dVar220 - dVar218 * dVar217;
                dVar234 = dVar209 * dVar225 + dVar218 * -dVar216;
                dVar212 = dVar221 * dVar216 - dVar225 * dVar225;
                dVar221 = dVar221 * dVar217 - dVar225 * dVar220;
                dStack_a00 = auVar231._8_8_;
                auVar227._8_8_ = dVar218 * dVar236 + (dVar222 * dVar221 - dVar211 * dStack_a00);
                auVar227._0_8_ =
                     dVar218 * (dVar225 * dVar217 - dVar220 * dVar216) +
                     (dVar235 * dVar212 - dVar221 * dVar209);
                dVar218 = dVar234 * dVar218 + (dVar212 * dVar222 - dVar211 * dVar209);
                auVar228._8_8_ = dVar218;
                auVar228._0_8_ = dVar218;
                auVar228 = divpd(auVar227,auVar228);
                dVar218 = (dVar234 * dVar235 +
                          ((dVar220 * dVar216 + -dVar217 * dVar225) * dVar222 - dVar236 * dVar209))
                          / dVar218;
                iVar142 = iVar86 - (int)local_5f8;
                lVar182 = (long)iVar142;
                dVar217 = pdVar37[lVar100 + lVar148 + lVar182];
                dVar220 = auVar228._0_8_;
                dVar216 = auVar228._8_8_;
                if ((dVar217 == 1.0) && (!NAN(dVar217))) {
                  if ((pdVar37[lVar100 + lVar148 + (iVar151 - (int)local_5f8)] == 1.0) &&
                     (!NAN(pdVar37[lVar100 + lVar148 + (iVar151 - (int)local_5f8)]))) {
                    if ((pdVar37[lVar100 + lVar148 + ((iVar86 + 1) - (int)local_5f8)] == 1.0) &&
                       (!NAN(pdVar37[lVar100 + lVar148 + ((iVar86 + 1) - (int)local_5f8)]))) {
                      dVar225 = pdVar38[(int)((iVar86 + 1) - uVar22)] - dVar3;
                      dVar222 = (dVar3 - dVar2) + (dVar3 - dVar2);
                      dVar225 = dVar225 + dVar225;
                      dVar235 = (pdVar38[(int)((iVar86 + 1) - uVar22)] - dVar2) * 0.5;
                      dVar220 = ABS(dVar222);
                      uVar184 = -(ulong)(0.0 < dVar235);
                      dVar235 = ABS(dVar235);
                      dVar221 = ABS(dVar225);
                      if (dVar220 <= dVar235) {
                        dVar235 = dVar220;
                      }
                      if (dVar235 <= dVar221) {
                        dVar221 = dVar235;
                      }
                      uVar189 = -(ulong)(0.0 < dVar222 * dVar225) & (ulong)dVar221;
                      dVar220 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) |
                                        uVar184 & uVar189);
                    }
                  }
                  if ((((local_530[lVar138 + lVar182] == 1.0) &&
                       (!NAN(local_530[lVar138 + lVar182]))) &&
                      (local_530[lVar159 + lVar182] == 1.0)) && (!NAN(local_530[lVar159 + lVar182]))
                     ) {
                    dVar216 = dVar3 - local_538[lVar125 + lVar101];
                    dVar221 = local_538[lVar126 + lVar101] - dVar3;
                    dVar216 = dVar216 + dVar216;
                    dVar221 = dVar221 + dVar221;
                    dVar222 = (local_538[lVar126 + lVar101] - local_538[lVar125 + lVar101]) * 0.5;
                    dVar225 = ABS(dVar216);
                    uVar184 = -(ulong)(0.0 < dVar222);
                    dVar222 = ABS(dVar222);
                    dVar235 = ABS(dVar221);
                    if (dVar225 <= dVar222) {
                      dVar222 = dVar225;
                    }
                    if (dVar222 <= dVar235) {
                      dVar235 = dVar222;
                    }
                    uVar189 = -(ulong)(0.0 < dVar216 * dVar221) & (ulong)dVar235;
                    dVar216 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189
                                      );
                  }
                  if (((pdVar37[lVar100 + lVar182 + lVar168] == 1.0) &&
                      (!NAN(pdVar37[lVar100 + lVar182 + lVar168]))) &&
                     ((pdVar37[lVar100 + lVar182 + lVar122] == 1.0 &&
                      (!NAN(pdVar37[lVar100 + lVar182 + lVar122]))))) {
                    dVar218 = dVar3 - pdVar91[lVar124];
                    dVar221 = pdVar91[lVar92] - dVar3;
                    dVar218 = dVar218 + dVar218;
                    dVar221 = dVar221 + dVar221;
                    dVar222 = (pdVar91[lVar92] - pdVar91[lVar124]) * 0.5;
                    dVar225 = ABS(dVar218);
                    uVar184 = -(ulong)(0.0 < dVar222);
                    dVar222 = ABS(dVar222);
                    dVar235 = ABS(dVar221);
                    if (dVar225 <= dVar222) {
                      dVar222 = dVar225;
                    }
                    if (dVar222 <= dVar235) {
                      dVar235 = dVar222;
                    }
                    uVar189 = -(ulong)(0.0 < dVar218 * dVar221) & (ulong)dVar235;
                    dVar218 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189
                                      );
                  }
                }
                local_498 = dVar2;
                if (dVar3 <= dVar2) {
                  local_498 = dVar3;
                }
                uStack_490 = 0;
                dVar221 = dVar197 - dVar195;
                iVar179 = 0;
                iVar150 = 0;
                iVar80 = 0;
                stack0xfffffffffffff5fc = auVar231._4_12_;
                auVar74._12_4_ = 0;
                auVar74._0_12_ = stack0xfffffffffffff5fc;
                _local_a08 = auVar74 << 0x20;
                iVar176 = -1;
                while (iVar176 != 2) {
                  iVar146 = iVar179;
                  iVar81 = -1;
                  while (iVar81 != 2) {
                    for (iVar134 = 5; iVar134 != 8; iVar134 = iVar134 + 1) {
                      if (((uVar12 >> (iVar146 + iVar134 & 0x1fU) & 1) != 0) &&
                         ((iVar134 != 6 || iVar81 != 0) || iVar176 != 0)) {
                        local_a08._0_4_ =
                             local_a08._0_4_ +
                             (uint)((iVar134 - 5U & 0xfffffffd) == 0 &&
                                   (iVar81 == 0 && iVar176 == 0));
                        iVar80 = iVar80 + (uint)((iVar134 == 6 && iVar176 == 0) &&
                                                (iVar81 == 1 || iVar81 + 1 == 0));
                        iVar150 = iVar150 + (uint)((iVar134 == 6 && iVar81 == 0) &&
                                                  (iVar176 == 1 || iVar176 + 1 == 0));
                      }
                    }
                    iVar146 = iVar146 + 3;
                    iVar81 = iVar81 + 1;
                  }
                  iVar179 = iVar179 + 9;
                  iVar176 = iVar176 + 1;
                }
                dVar235 = 2.0;
                if ((uVar12 >> 0x15 & 1) != 0) {
                  cVar170 = '\b';
                  dVar222 = dVar3;
                  dVar235 = dVar3;
                  for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                    cVar162 = cVar170;
                    for (lVar102 = 0; lVar102 != 2; lVar102 = lVar102 + 1) {
                      for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                        if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                           ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                          dVar225 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                            (iVar87 + (int)lVar102) * lVar152 +
                                            (long)(iVar166 + (int)lVar103)];
                          dVar209 = dVar225;
                          if (dVar225 <= dVar235) {
                            dVar209 = dVar235;
                          }
                          dVar235 = dVar209;
                          if (dVar225 < dVar222) {
                            dVar222 = dVar225;
                          }
                        }
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar225 = (((local_500 + lVar127 + (iVar86 - iVar18))[lVar33] - dVar186) * dVar218
                            + (0.5 - dVar195) * dVar216 +
                              (local_500[lVar127 + (iVar86 - iVar18)] - dVar198) * dVar220 + dVar3)
                            - dVar3;
                  if (dVar225 <= 1e-13) {
                    dVar235 = 1.0;
                    if ((dVar225 < -1e-13) &&
                       (dVar235 = (dVar222 - dVar3) / dVar225, 1.0 <= dVar235)) {
                      dVar235 = 1.0;
                    }
                  }
                  else {
                    dVar235 = (dVar235 - dVar3) / dVar225;
                    if (1.0 <= dVar235) {
                      dVar235 = 1.0;
                    }
                  }
                  if (2.0 <= dVar235) {
                    dVar235 = 2.0;
                  }
                }
                dVar222 = dVar235;
                if ((short)uVar12 < 0) {
                  cVar170 = '\x05';
                  dVar225 = dVar3;
                  dVar222 = dVar3;
                  for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                    cVar162 = cVar170;
                    for (lVar102 = -1; lVar102 != 1; lVar102 = lVar102 + 1) {
                      for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                        if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                           ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                          dVar209 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                            (iVar87 + (int)lVar102) * lVar152 +
                                            (long)(iVar166 + (int)lVar103)];
                          dVar211 = dVar209;
                          if (dVar209 <= dVar222) {
                            dVar211 = dVar222;
                          }
                          dVar222 = dVar211;
                          if (dVar209 < dVar225) {
                            dVar225 = dVar209;
                          }
                        }
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar209 = (((local_500 + lVar128 + (iVar86 - iVar18))[lVar33] - dVar186) * dVar218
                            + -(dVar195 + 0.5) * dVar216 +
                              (local_500[lVar128 + (iVar86 - iVar18)] - dVar198) * dVar220 + dVar3)
                            - dVar3;
                  if (dVar209 <= 1e-13) {
                    dVar222 = 1.0;
                    if ((dVar209 < -1e-13) &&
                       (dVar222 = (dVar225 - dVar3) / dVar209, 1.0 <= dVar222)) {
                      dVar222 = 1.0;
                    }
                  }
                  else {
                    dVar222 = (dVar222 - dVar3) / dVar209;
                    if (1.0 <= dVar222) {
                      dVar222 = 1.0;
                    }
                  }
                  if (dVar235 <= dVar222) {
                    dVar222 = dVar235;
                  }
                }
                dVar235 = dVar222;
                if ((uVar12 >> 0x13 & 1) != 0) {
                  cVar170 = '\x06';
                  dVar225 = dVar3;
                  dVar235 = dVar3;
                  for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                    cVar162 = cVar170;
                    for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                      for (lVar103 = 0; lVar103 != 2; lVar103 = lVar103 + 1) {
                        dVar209 = dVar225;
                        if ((((int)lVar102 != 0 || (int)lVar101 != 0) || (int)lVar103 != 0) &&
                           ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                          dVar209 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                            (iVar87 + (int)lVar102) * lVar152 +
                                            (long)(iVar117 + (int)lVar103)];
                          dVar211 = dVar209;
                          if (dVar209 <= dVar235) {
                            dVar211 = dVar235;
                          }
                          dVar235 = dVar211;
                          if (dVar225 <= dVar209) {
                            dVar209 = dVar225;
                          }
                        }
                        dVar225 = dVar209;
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar209 = (((local_520 + lVar97 + (iVar118 + 1))[lVar30] - dVar186) * dVar218 +
                            (local_520[lVar97 + (iVar118 + 1)] - dVar195) * dVar216 +
                            (0.5 - dVar198) * dVar220 + dVar3) - dVar3;
                  if (dVar209 <= 1e-13) {
                    dVar235 = 1.0;
                    if ((dVar209 < -1e-13) &&
                       (dVar235 = (dVar225 - dVar3) / dVar209, 1.0 <= dVar235)) {
                      dVar235 = 1.0;
                    }
                  }
                  else {
                    dVar235 = (dVar235 - dVar3) / dVar209;
                    if (1.0 <= dVar235) {
                      dVar235 = 1.0;
                    }
                  }
                  if (dVar222 <= dVar235) {
                    dVar235 = dVar222;
                  }
                }
                cVar170 = '\x05';
                uVar203 = SUB84(dVar3,0);
                uVar205 = (undefined4)((ulong)dVar3 >> 0x20);
                dVar222 = dVar3;
                for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                  cVar162 = cVar170;
                  for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                    for (lVar103 = 0; lVar103 != 2; lVar103 = lVar103 + 1) {
                      if (((int)lVar103 == 1 && ((int)lVar102 == 0 && (int)lVar101 == 0)) ||
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) == 0)) {
                        dVar225 = (double)CONCAT44(uVar205,uVar203);
                      }
                      else {
                        dVar225 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                          (iVar87 + (int)lVar102) * lVar152 +
                                          (long)(iVar166 + (int)lVar103)];
                        dVar209 = dVar225;
                        if (dVar225 <= dVar222) {
                          dVar209 = dVar222;
                        }
                        dVar222 = dVar209;
                        if ((double)CONCAT44(uVar205,uVar203) < dVar225 ||
                            (double)CONCAT44(uVar205,uVar203) == dVar225) {
                          dVar225 = (double)CONCAT44(uVar205,uVar203);
                        }
                      }
                      uVar203 = SUB84(dVar225,0);
                      uVar205 = (undefined4)((ulong)dVar225 >> 0x20);
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar225 = (dVar187 * dVar218 +
                          dVar221 * dVar216 + (dVar3 - dVar220 * (double)local_4a8)) - dVar3;
                if (dVar225 <= 1e-13) {
                  dVar222 = 1.0;
                  if ((dVar225 < -1e-13) &&
                     (dVar222 = ((double)CONCAT44(uVar205,uVar203) - dVar3) / dVar225,
                     1.0 <= dVar222)) {
                    dVar222 = 1.0;
                  }
                }
                else {
                  dVar222 = (dVar222 - dVar3) / dVar225;
                  if (1.0 <= dVar222) {
                    dVar222 = 1.0;
                  }
                }
                if (dVar235 <= dVar222) {
                  dVar222 = dVar235;
                }
                dVar235 = dVar222;
                if ((uVar12 >> 0x1b & 1) != 0) {
                  cVar170 = '\x0e';
                  dVar235 = dVar3;
                  dVar225 = dVar3;
                  for (lVar101 = 0; lVar101 != 2; lVar101 = lVar101 + 1) {
                    cVar162 = cVar170;
                    for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                      for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                        dVar209 = dVar225;
                        if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                           ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                          dVar209 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                            (iVar87 + (int)lVar102) * lVar152 +
                                            (long)(iVar166 + (int)lVar103)];
                          dVar211 = dVar209;
                          if (dVar209 <= dVar235) {
                            dVar211 = dVar235;
                          }
                          dVar235 = dVar211;
                          if (dVar225 <= dVar209) {
                            dVar209 = dVar225;
                          }
                        }
                        dVar225 = dVar209;
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar209 = ((0.5 - dVar186) * dVar218 +
                            ((local_508 + lVar129 + (iVar86 - iVar20))[lVar35] - dVar195) * dVar216
                            + (local_508[lVar129 + (iVar86 - iVar20)] - dVar198) * dVar220 + dVar3)
                            - dVar3;
                  if (dVar209 <= 1e-13) {
                    dVar235 = 1.0;
                    if ((dVar209 < -1e-13) &&
                       (dVar235 = (dVar225 - dVar3) / dVar209, 1.0 <= dVar235)) {
                      dVar235 = 1.0;
                    }
                  }
                  else {
                    dVar235 = (dVar235 - dVar3) / dVar209;
                    if (1.0 <= dVar235) {
                      dVar235 = 1.0;
                    }
                  }
                  if (dVar222 <= dVar235) {
                    dVar235 = dVar222;
                  }
                }
                dVar222 = dVar235;
                if ((uVar12 >> 9 & 1) != 0) {
                  cVar170 = '\x05';
                  dVar225 = dVar3;
                  dVar222 = dVar3;
                  for (lVar101 = -1; lVar101 != 1; lVar101 = lVar101 + 1) {
                    cVar162 = cVar170;
                    for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                      for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                        dVar209 = dVar225;
                        if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                           ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                          dVar209 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                            (iVar87 + (int)lVar102) * lVar152 +
                                            (long)(iVar166 + (int)lVar103)];
                          dVar211 = dVar209;
                          if (dVar209 <= dVar222) {
                            dVar211 = dVar222;
                          }
                          dVar222 = dVar211;
                          if (dVar225 <= dVar209) {
                            dVar209 = dVar225;
                          }
                        }
                        dVar225 = dVar209;
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar198 = ((((local_5e0 + lVar93 + lVar129 + (iVar86 - iVar20))[lVar35] - dVar195)
                              * dVar216 +
                             (local_5e0[lVar93 + lVar129 + (iVar86 - iVar20)] - dVar198) * dVar220 +
                             dVar3) - (dVar186 + 0.5) * dVar218) - dVar3;
                  if (dVar198 <= 1e-13) {
                    dVar222 = 1.0;
                    if ((dVar198 < -1e-13) &&
                       (dVar222 = (dVar225 - dVar3) / dVar198, 1.0 <= dVar222)) {
                      dVar222 = 1.0;
                    }
                  }
                  else {
                    dVar222 = (dVar222 - dVar3) / dVar198;
                    if (1.0 <= dVar222) {
                      dVar222 = 1.0;
                    }
                  }
                  if (dVar235 <= dVar222) {
                    dVar222 = dVar235;
                  }
                }
                dVar198 = 0.0;
                if (1 < (int)local_a08._0_4_) {
                  dVar198 = dVar222;
                }
                uVar204 = (undefined4)((ulong)dVar222 >> 0x20);
                uVar203 = 0;
                uVar205 = 0;
                if (1 < iVar80) {
                  uVar203 = SUB84(dVar222,0);
                  uVar205 = uVar204;
                }
                uVar206 = 0;
                uVar207 = 0;
                if (1 < iVar150) {
                  uVar206 = SUB84(dVar222,0);
                  uVar207 = uVar204;
                }
                if ((dVar217 == 1.0) && (!NAN(dVar217))) {
                  if ((pdVar37[lVar100 + lVar148 + (iVar151 - (int)local_5f8)] == 1.0) &&
                     (((!NAN(pdVar37[lVar100 + lVar148 + (iVar151 - (int)local_5f8)]) &&
                       (pdVar37[lVar100 + lVar148 + (iVar142 + 1)] == 1.0)) &&
                      (!NAN(pdVar37[lVar100 + lVar148 + (iVar142 + 1)]))))) {
                    dVar198 = 1.0;
                  }
                  if (((local_530[lVar130 + lVar182] == 1.0) && (!NAN(local_530[lVar130 + lVar182]))
                      ) && ((local_530[lVar131 + lVar182] == 1.0 &&
                            (!NAN(local_530[lVar131 + lVar182]))))) {
                    uVar203 = 0;
                    uVar205 = 0x3ff00000;
                  }
                  if (((pdVar37[lVar100 + lVar94 + lVar182] == 1.0) &&
                      (!NAN(pdVar37[lVar100 + lVar94 + lVar182]))) &&
                     ((pdVar37[(long)local_510 + lVar100 + lVar182] == 1.0 &&
                      (!NAN(pdVar37[(long)local_510 + lVar100 + lVar182]))))) {
                    uVar206 = 0;
                    uVar207 = 0x3ff00000;
                  }
                }
                dVar195 = dVar187 * dVar218 * (double)CONCAT44(uVar207,uVar206) +
                          dVar221 * dVar216 * (double)CONCAT44(uVar205,uVar203) +
                          (dVar3 - (double)local_4a8 * dVar198 * dVar220);
                dVar198 = local_4c8;
                if (dVar195 <= local_4c8) {
                  dVar198 = dVar195;
                }
                lVar101 = (long)(iVar151 - iVar9);
                dVar195 = local_528[lVar98 + lVar101];
                dVar186 = local_528[lVar98 + lVar101 + lVar25];
                dVar3 = local_528[lVar98 + lVar101 + lVar25 * 2];
                uVar12 = local_518[lVar95 + (iVar151 - iVar14)].flag;
                iVar118 = 0;
                cVar170 = '\x05';
                for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                  local_a08 = (undefined1  [8])lVar101;
                  lVar103 = lVar121;
                  pdVar167 = local_8d8;
                  pdVar181 = pdVar88;
                  iVar176 = iVar118;
                  cVar162 = cVar170;
                  for (lVar102 = -1; iVar176 = iVar176 + 3, lVar102 != 2; lVar102 = lVar102 + 1) {
                    lVar104 = (long)iVar118;
                    paRVar136 = A + lVar104;
                    iVar118 = iVar118 + 3;
                    for (lVar105 = 0; iVar176 - lVar104 != lVar105; lVar105 = lVar105 + 1) {
                      iVar179 = (int)lVar105 + -1;
                      if ((((int)lVar102 == 0 && (int)lVar101 == 0) && iVar179 == 0) ||
                         ((1 << (cVar162 + (char)lVar105 & 0x1fU) & uVar12) == 0)) {
                        (*paRVar136)[0] = 0.0;
                        (*paRVar136)[1] = 0.0;
                        (*paRVar136)[2] = 0.0;
                      }
                      else {
                        dVar187 = pdVar181[lVar105];
                        (*paRVar136)[0] =
                             (*(double *)((long)pdVar167 + lVar105 * 8) + (double)iVar179) - dVar195
                        ;
                        (*paRVar136)[1] = (dVar187 + (double)(int)lVar102) - dVar186;
                        (*paRVar136)[2] =
                             (*(double *)(lVar103 + lVar105 * 8) + (double)(int)lVar101) - dVar3;
                      }
                      paRVar136 = paRVar136 + 1;
                    }
                    pdVar167 = (double *)((long)pdVar167 + lVar36 * 8);
                    pdVar181 = pdVar181 + lVar36;
                    lVar103 = lVar103 + lVar36 * 8;
                    cVar162 = cVar162 + '\x03';
                  }
                  local_8d8 = (double *)((long)local_8d8 + lVar24 * 8);
                  pdVar88 = pdVar88 + lVar24;
                  lVar121 = lVar121 + lVar24 * 8;
                  cVar170 = cVar170 + '\t';
                }
                dVar187 = local_498;
                if (local_498 <= dVar198) {
                  dVar187 = dVar198;
                }
                iVar118 = 0;
                lVar121 = 5;
                for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                  local_a08 = (undefined1  [8])lVar121;
                  lVar103 = lVar121;
                  iVar176 = iVar118;
                  for (lVar102 = -1; iVar176 = iVar176 + 3, lVar102 != 2; lVar102 = lVar102 + 1) {
                    lVar104 = (long)iVar118;
                    iVar118 = iVar118 + 3;
                    for (lVar105 = 0; iVar176 - lVar104 != lVar105; lVar105 = lVar105 + 1) {
                      RVar188 = 0.0;
                      if (((int)lVar105 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                         ((1 << ((char)lVar103 + (char)lVar105 & 0x1fU) & uVar12) != 0)) {
                        RVar188 = pdVar32[(iVar157 + (int)lVar101) * lVar147 +
                                          (iVar87 + (int)lVar102) * lVar152 +
                                          (long)(iVar84 + (int)lVar105)] - dVar2;
                      }
                      du[lVar104 + lVar105] = RVar188;
                    }
                    lVar103 = lVar103 + 3;
                  }
                  lVar121 = lVar121 + 9;
                }
                pdVar88 = &local_458;
                for (lVar121 = 0; lVar101 = -0x48, lVar121 != 3; lVar121 = lVar121 + 1) {
                  for (; lVar101 != 0; lVar101 = lVar101 + 0x18) {
                    *(undefined8 *)((long)pdVar88 + lVar101 + 0x48) = 0;
                  }
                  local_618[lVar121] = 0.0;
                  pdVar88 = pdVar88 + 1;
                }
                pRVar114 = A[0] + 2;
                dVar198 = local_438;
                dVar220 = dStack_448;
                dVar216 = local_418;
                dVar218 = local_618[0];
                dVar221 = local_458;
                dVar235 = dStack_430;
                dVar222 = local_450;
                dVar225 = local_618[1];
                dVar209 = local_618[2];
                for (lVar121 = 0; lVar121 != 0x1b; lVar121 = lVar121 + 1) {
                  dVar234 = (*(Real (*) [3])(pRVar114 + -2))[0];
                  dVar236 = pRVar114[-1];
                  dVar211 = *pRVar114;
                  dVar198 = dVar198 + dVar236 * pRVar114[-1];
                  dVar220 = dVar220 + dVar234 * *pRVar114;
                  dVar235 = dVar235 + dVar211 * dVar236;
                  dVar222 = dVar222 + dVar236 * dVar234;
                  dVar216 = dVar216 + dVar211 * dVar211;
                  dVar211 = du[lVar121];
                  dVar218 = dVar218 + dVar234 * dVar211;
                  dVar221 = dVar221 + dVar234 * dVar234;
                  dVar225 = dVar225 + dVar211 * pRVar114[-1];
                  dVar209 = dVar209 + dVar211 * *pRVar114;
                  pRVar114 = pRVar114 + 3;
                }
                dVar211 = dVar222 * dVar216 - dVar220 * dVar235;
                dVar236 = dVar222 * dVar209 - dVar220 * dVar225;
                dVar234 = dVar222 * dVar235 + dVar220 * -dVar198;
                dVar212 = dVar216 * dVar198 - dVar235 * dVar235;
                dVar216 = dVar216 * dVar225 - dVar235 * dVar209;
                auVar213._0_8_ =
                     dVar220 * (dVar235 * dVar225 - dVar209 * dVar198) +
                     (dVar218 * dVar212 - dVar216 * dVar222);
                auVar213._8_8_ = dVar220 * dVar236 + (dVar221 * dVar216 - dVar211 * dVar218);
                dVar220 = dVar234 * dVar220 + (dVar212 * dVar221 - dVar211 * dVar222);
                auVar190._8_8_ = dVar220;
                auVar190._0_8_ = dVar220;
                auVar231 = divpd(auVar213,auVar190);
                dVar220 = (dVar234 * dVar218 +
                          ((dVar209 * dVar198 + -dVar225 * dVar235) * dVar221 - dVar236 * dVar222))
                          / dVar220;
                lVar121 = (long)(iVar151 - (int)local_5f8);
                dVar198 = pdVar37[lVar100 + lVar148 + lVar121];
                dVar216 = auVar231._0_8_;
                dVar218 = auVar231._8_8_;
                if ((dVar198 == 1.0) && (!NAN(dVar198))) {
                  uVar184 = (ulong)DAT_005fe970;
                  if ((pdVar37[lVar100 + lVar148 + ((iVar86 + -2) - (int)local_5f8)] == 1.0) &&
                     (((!NAN(pdVar37[lVar100 + lVar148 + ((iVar86 + -2) - (int)local_5f8)]) &&
                       (dVar217 == 1.0)) && (!NAN(dVar217))))) {
                    dVar221 = pdVar32[(long)pdVar89 + lVar99 + lVar153] -
                              pdVar38[(int)((iVar86 + -2) - uVar22)];
                    dVar235 = pdVar91[(long)pdVar89] - pdVar32[(long)pdVar89 + lVar99 + lVar153];
                    dVar221 = dVar221 + dVar221;
                    dVar235 = dVar235 + dVar235;
                    dVar216 = (pdVar91[(long)pdVar89] - pdVar38[(int)((iVar86 + -2) - uVar22)]) *
                              0.5;
                    dVar222 = (double)((ulong)dVar221 & uVar184);
                    uVar189 = -(ulong)(0.0 < dVar216);
                    dVar216 = (double)((ulong)dVar216 & uVar184);
                    uVar203 = SUB84(dVar216,0);
                    uVar205 = (undefined4)((ulong)dVar216 >> 0x20);
                    dVar217 = (double)((ulong)dVar235 & uVar184);
                    if (dVar222 <= dVar216) {
                      uVar203 = SUB84(dVar222,0);
                      uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                    }
                    if ((double)CONCAT44(uVar205,uVar203) <= dVar217) {
                      dVar217 = (double)CONCAT44(uVar205,uVar203);
                    }
                    uVar185 = -(ulong)(0.0 < dVar221 * dVar235) & (ulong)dVar217;
                    dVar216 = (double)(~uVar189 & (uVar185 ^ 0x8000000000000000) | uVar189 & uVar185
                                      );
                  }
                  if (((local_530[lVar138 + lVar121] == 1.0) && (!NAN(local_530[lVar138 + lVar121]))
                      ) && ((local_530[lVar159 + lVar121] == 1.0 &&
                            (!NAN(local_530[lVar159 + lVar121]))))) {
                    dVar221 = pdVar32[(long)pdVar89 + lVar99 + lVar153] -
                              local_538[lVar125 + lVar153];
                    dVar235 = local_538[lVar126 + lVar153] -
                              pdVar32[(long)pdVar89 + lVar99 + lVar153];
                    dVar221 = dVar221 + dVar221;
                    dVar235 = dVar235 + dVar235;
                    dVar218 = (local_538[lVar126 + lVar153] - local_538[lVar125 + lVar153]) * 0.5;
                    dVar222 = (double)((ulong)dVar221 & uVar184);
                    uVar189 = -(ulong)(0.0 < dVar218);
                    dVar218 = (double)((ulong)dVar218 & uVar184);
                    uVar203 = SUB84(dVar218,0);
                    uVar205 = (undefined4)((ulong)dVar218 >> 0x20);
                    dVar217 = (double)((ulong)dVar235 & uVar184);
                    if (dVar222 <= dVar218) {
                      uVar203 = SUB84(dVar222,0);
                      uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                    }
                    if ((double)CONCAT44(uVar205,uVar203) <= dVar217) {
                      dVar217 = (double)CONCAT44(uVar205,uVar203);
                    }
                    uVar184 = -(ulong)(0.0 < dVar221 * dVar235) & (ulong)dVar217;
                    dVar218 = (double)(~uVar189 & (uVar184 ^ 0x8000000000000000) | uVar189 & uVar184
                                      );
                  }
                  if (((pdVar37[lVar100 + lVar121 + lVar168] == 1.0) &&
                      (!NAN(pdVar37[lVar100 + lVar121 + lVar168]))) &&
                     ((pdVar37[lVar100 + lVar121 + lVar122] == 1.0 &&
                      (!NAN(pdVar37[lVar100 + lVar121 + lVar122]))))) {
                    dVar220 = pdVar32[(long)pdVar89 + lVar99 + lVar153] -
                              pdVar32[lVar99 + lVar153 + lVar124];
                    dVar221 = pdVar32[lVar99 + lVar153 + lVar92] -
                              pdVar32[(long)pdVar89 + lVar99 + lVar153];
                    dVar220 = dVar220 + dVar220;
                    dVar221 = dVar221 + dVar221;
                    dVar217 = (pdVar32[lVar99 + lVar153 + lVar92] -
                              pdVar32[lVar99 + lVar153 + lVar124]) * 0.5;
                    dVar222 = ABS(dVar220);
                    uVar184 = -(ulong)(0.0 < dVar217);
                    dVar217 = ABS(dVar217);
                    dVar235 = ABS(dVar221);
                    if (dVar222 <= dVar217) {
                      dVar217 = dVar222;
                    }
                    if (dVar217 <= dVar235) {
                      dVar235 = dVar217;
                    }
                    uVar189 = -(ulong)(0.0 < dVar220 * dVar221) & (ulong)dVar235;
                    dVar220 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189
                                      );
                  }
                }
                iVar176 = 0;
                iVar179 = 0;
                iVar150 = 0;
                auVar75._12_4_ = 0;
                auVar75._0_12_ = stack0xfffffffffffff5fc;
                _local_a08 = auVar75 << 0x20;
                iVar118 = -1;
                while (iVar118 != 2) {
                  iVar81 = iVar118 + 1;
                  local_8d8._0_4_ = iVar81;
                  iVar80 = iVar176;
                  iVar146 = -1;
                  while (iVar146 != 2) {
                    for (iVar134 = 5; iVar134 != 8; iVar134 = iVar134 + 1) {
                      if (((uVar12 >> (iVar80 + iVar134 & 0x1fU) & 1) != 0) &&
                         ((iVar134 != 6 || iVar146 != 0) || iVar118 != 0)) {
                        local_a08._0_4_ =
                             local_a08._0_4_ +
                             (uint)((iVar134 - 5U & 0xfffffffd) == 0 &&
                                   (iVar146 == 0 && iVar118 == 0));
                        iVar150 = iVar150 + (uint)((iVar134 == 6 && iVar118 == 0) &&
                                                  (iVar146 == 1 || iVar146 + 1 == 0));
                        iVar179 = iVar179 + (uint)((iVar134 == 6 && iVar146 == 0) &&
                                                  (iVar118 == 1 || iVar81 == 0));
                      }
                    }
                    iVar80 = iVar80 + 3;
                    iVar146 = iVar146 + 1;
                  }
                  iVar176 = iVar176 + 9;
                  iVar118 = iVar81;
                }
                dVar217 = 2.0;
                if ((uVar12 >> 0x15 & 1) != 0) {
                  dVar221 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                  cVar170 = '\b';
                  uVar203 = SUB84(dVar221,0);
                  uVar205 = (undefined4)((ulong)dVar221 >> 0x20);
                  dVar217 = dVar221;
                  for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                    cVar162 = cVar170;
                    for (lVar101 = 0; lVar101 != 2; lVar101 = lVar101 + 1) {
                      for (lVar102 = 0; lVar102 != 3; lVar102 = lVar102 + 1) {
                        uVar204 = SUB84(dVar217,0);
                        uVar206 = (undefined4)((ulong)dVar217 >> 0x20);
                        if (((int)lVar102 == 1 && ((int)lVar101 == 0 && (int)lVar121 == 0)) ||
                           ((1 << (cVar162 + (char)lVar102 & 0x1fU) & uVar12) == 0)) {
LAB_0033c199:
                          dVar235 = (double)CONCAT44(uVar205,uVar203);
                          uVar207 = uVar204;
                          uVar208 = uVar206;
                        }
                        else {
                          dVar235 = pdVar32[(iVar157 + (int)lVar121) * lVar147 +
                                            (iVar87 + (int)lVar101) * lVar152 +
                                            (long)(iVar84 + (int)lVar102)];
                          uVar207 = SUB84(dVar235,0);
                          uVar208 = (int)((ulong)dVar235 >> 0x20);
                          if (dVar235 <= dVar217) {
                            uVar207 = uVar204;
                            uVar208 = uVar206;
                          }
                          uVar204 = uVar207;
                          uVar206 = uVar208;
                          if ((double)CONCAT44(uVar205,uVar203) < dVar235 ||
                              (double)CONCAT44(uVar205,uVar203) == dVar235) goto LAB_0033c199;
                        }
                        dVar217 = (double)CONCAT44(uVar208,uVar207);
                        uVar203 = SUB84(dVar235,0);
                        uVar205 = (undefined4)((ulong)dVar235 >> 0x20);
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar235 = (((local_500 + lVar127 + (iVar151 - iVar18))[lVar33] - dVar3) * dVar220
                            + (0.5 - dVar186) * dVar218 +
                              (local_500[lVar127 + (iVar151 - iVar18)] - dVar195) * dVar216 +
                              dVar221) - dVar221;
                  if (dVar235 <= 1e-13) {
                    dVar217 = 1.0;
                    if ((dVar235 < -1e-13) &&
                       (dVar217 = ((double)CONCAT44(uVar205,uVar203) - dVar221) / dVar235,
                       1.0 <= dVar217)) {
                      dVar217 = 1.0;
                    }
                  }
                  else {
                    dVar217 = (dVar217 - dVar221) / dVar235;
                    if (1.0 <= dVar217) {
                      dVar217 = 1.0;
                    }
                  }
                  if (2.0 <= dVar217) {
                    dVar217 = 2.0;
                  }
                }
                dVar221 = dVar217;
                if ((short)uVar12 < 0) {
                  dVar235 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                  cVar170 = '\x05';
                  uVar203 = SUB84(dVar235,0);
                  uVar205 = (undefined4)((ulong)dVar235 >> 0x20);
                  uVar204 = 0;
                  uVar206 = 0;
                  dVar222 = dVar235;
                  for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                    cVar162 = cVar170;
                    for (lVar101 = -1; lVar101 != 1; lVar101 = lVar101 + 1) {
                      for (lVar102 = 0; lVar102 != 3; lVar102 = lVar102 + 1) {
                        if (((int)lVar102 == 1 && ((int)lVar101 == 0 && (int)lVar121 == 0)) ||
                           ((1 << (cVar162 + (char)lVar102 & 0x1fU) & uVar12) == 0)) {
                          auVar229._4_4_ = uVar205;
                          auVar229._0_4_ = uVar203;
                          auVar229._12_4_ = uVar206;
                          auVar229._8_4_ = uVar204;
                        }
                        else {
                          dVar221 = pdVar32[(iVar157 + (int)lVar121) * lVar147 +
                                            (iVar87 + (int)lVar101) * lVar152 +
                                            (long)(iVar84 + (int)lVar102)];
                          dVar225 = dVar221;
                          if (dVar221 <= (double)CONCAT44(uVar205,uVar203)) {
                            dVar225 = (double)CONCAT44(uVar205,uVar203);
                          }
                          auVar229._8_8_ = 0;
                          auVar229._0_8_ = dVar225;
                          if (dVar221 < dVar222) {
                            dVar222 = dVar221;
                          }
                        }
                        uVar203 = auVar229._0_4_;
                        uVar205 = auVar229._4_4_;
                        uVar204 = auVar229._8_4_;
                        uVar206 = auVar229._12_4_;
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar225 = (((local_500 + lVar128 + (iVar151 - iVar18))[lVar33] - dVar3) * dVar220
                            + -(dVar186 + 0.5) * dVar218 +
                              (local_500[lVar128 + (iVar151 - iVar18)] - dVar195) * dVar216 +
                              dVar235) - dVar235;
                  if (dVar225 <= 1e-13) {
                    dVar221 = 1.0;
                    if ((dVar225 < -1e-13) &&
                       (dVar221 = (dVar222 - dVar235) / dVar225, 1.0 <= dVar221)) {
                      dVar221 = 1.0;
                    }
                  }
                  else {
                    dVar221 = ((double)CONCAT44(uVar205,uVar203) - dVar235) / dVar225;
                    if (1.0 <= dVar221) {
                      dVar221 = 1.0;
                    }
                  }
                  if (dVar217 <= dVar221) {
                    dVar221 = dVar217;
                  }
                }
                dVar217 = dVar221;
                if ((uVar12 >> 0x13 & 1) != 0) {
                  dVar235 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                  cVar170 = '\x06';
                  uVar204 = SUB84(dVar235,0);
                  uVar206 = (undefined4)((ulong)dVar235 >> 0x20);
                  uVar207 = 0;
                  uVar208 = 0;
                  uVar203 = uVar204;
                  uVar205 = uVar206;
                  for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                    cVar162 = cVar170;
                    for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                      for (lVar102 = 0; lVar102 != 2; lVar102 = lVar102 + 1) {
                        if ((((int)lVar101 == 0 && (int)lVar121 == 0) && (int)lVar102 == 0) ||
                           ((1 << (cVar162 + (char)lVar102 & 0x1fU) & uVar12) == 0)) {
                          dVar217 = (double)CONCAT44(uVar205,uVar203);
                          auVar237._4_4_ = uVar206;
                          auVar237._0_4_ = uVar204;
                          auVar237._12_4_ = uVar208;
                          auVar237._8_4_ = uVar207;
                        }
                        else {
                          dVar217 = pdVar32[(iVar157 + (int)lVar121) * lVar147 +
                                            (iVar87 + (int)lVar101) * lVar152 +
                                            (long)(iVar166 + (int)lVar102)];
                          dVar222 = dVar217;
                          if (dVar217 <= (double)CONCAT44(uVar206,uVar204)) {
                            dVar222 = (double)CONCAT44(uVar206,uVar204);
                          }
                          auVar237._8_8_ = 0;
                          auVar237._0_8_ = dVar222;
                          if ((double)CONCAT44(uVar205,uVar203) < dVar217 ||
                              (double)CONCAT44(uVar205,uVar203) == dVar217) {
                            dVar217 = (double)CONCAT44(uVar205,uVar203);
                          }
                        }
                        uVar203 = SUB84(dVar217,0);
                        uVar205 = (undefined4)((ulong)dVar217 >> 0x20);
                        uVar204 = auVar237._0_4_;
                        uVar206 = auVar237._4_4_;
                        uVar207 = auVar237._8_4_;
                        uVar208 = auVar237._12_4_;
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar222 = ((pdVar1[lVar30] - dVar3) * dVar220 +
                            (*pdVar1 - dVar186) * dVar218 + (0.5 - dVar195) * dVar216 + dVar235) -
                            dVar235;
                  if (dVar222 <= 1e-13) {
                    dVar217 = 1.0;
                    if ((dVar222 < -1e-13) &&
                       (dVar217 = ((double)CONCAT44(uVar205,uVar203) - dVar235) / dVar222,
                       1.0 <= dVar217)) {
                      dVar217 = 1.0;
                    }
                  }
                  else {
                    dVar217 = ((double)CONCAT44(uVar206,uVar204) - dVar235) / dVar222;
                    if (1.0 <= dVar217) {
                      dVar217 = 1.0;
                    }
                  }
                  if (dVar221 <= dVar217) {
                    dVar217 = dVar221;
                  }
                }
                dVar221 = dVar217;
                if ((uVar12 >> 0x11 & 1) != 0) {
                  dVar235 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                  cVar170 = '\x05';
                  uVar203 = SUB84(dVar235,0);
                  uVar205 = (undefined4)((ulong)dVar235 >> 0x20);
                  dVar221 = dVar235;
                  for (lVar121 = -1; lVar121 != 2; lVar121 = lVar121 + 1) {
                    cVar162 = cVar170;
                    for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                      for (lVar102 = 0; lVar102 != 2; lVar102 = lVar102 + 1) {
                        if (((int)lVar102 == 1 && ((int)lVar101 == 0 && (int)lVar121 == 0)) ||
                           ((1 << (cVar162 + (char)lVar102 & 0x1fU) & uVar12) == 0)) {
                          dVar222 = (double)CONCAT44(uVar205,uVar203);
                        }
                        else {
                          dVar222 = pdVar32[(iVar157 + (int)lVar121) * lVar147 +
                                            (iVar87 + (int)lVar101) * lVar152 +
                                            (long)(iVar84 + (int)lVar102)];
                          dVar225 = dVar222;
                          if (dVar222 <= dVar221) {
                            dVar225 = dVar221;
                          }
                          dVar221 = dVar225;
                          if ((double)CONCAT44(uVar205,uVar203) < dVar222 ||
                              (double)CONCAT44(uVar205,uVar203) == dVar222) {
                            dVar222 = (double)CONCAT44(uVar205,uVar203);
                          }
                        }
                        uVar203 = SUB84(dVar222,0);
                        uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar222 = (((local_520 + lVar97 + (iVar151 - iVar16))[lVar30] - dVar3) * dVar220 +
                            (local_520[lVar97 + (iVar151 - iVar16)] - dVar186) * dVar218 +
                            (dVar235 - (dVar195 + 0.5) * dVar216)) - dVar235;
                  if (dVar222 <= 1e-13) {
                    dVar221 = 1.0;
                    if ((dVar222 < -1e-13) &&
                       (dVar221 = ((double)CONCAT44(uVar205,uVar203) - dVar235) / dVar222,
                       1.0 <= dVar221)) {
                      dVar221 = 1.0;
                    }
                  }
                  else {
                    dVar221 = (dVar221 - dVar235) / dVar222;
                    if (1.0 <= dVar221) {
                      dVar221 = 1.0;
                    }
                  }
                  if (dVar217 <= dVar221) {
                    dVar221 = dVar217;
                  }
                }
                dVar217 = dVar221;
                if ((uVar12 >> 0x1b & 1) != 0) {
                  dVar235 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                  cVar170 = '\x0e';
                  uVar203 = SUB84(dVar235,0);
                  uVar205 = (undefined4)((ulong)dVar235 >> 0x20);
                  dVar222 = dVar235;
                  for (lVar121 = 0; lVar121 != 2; lVar121 = lVar121 + 1) {
                    cVar162 = cVar170;
                    for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                      for (lVar102 = 0; lVar102 != 3; lVar102 = lVar102 + 1) {
                        if (((int)lVar102 == 1 && ((int)lVar101 == 0 && (int)lVar121 == 0)) ||
                           ((1 << (cVar162 + (char)lVar102 & 0x1fU) & uVar12) == 0)) {
                          dVar225 = (double)CONCAT44(uVar205,uVar203);
                          dVar217 = dVar222;
                        }
                        else {
                          dVar217 = pdVar32[(iVar157 + (int)lVar121) * lVar147 +
                                            (iVar87 + (int)lVar101) * lVar152 +
                                            (long)(iVar84 + (int)lVar102)];
                          dVar225 = dVar217;
                          if (dVar217 <= (double)CONCAT44(uVar205,uVar203)) {
                            dVar225 = (double)CONCAT44(uVar205,uVar203);
                          }
                          if (dVar222 <= dVar217) {
                            dVar217 = dVar222;
                          }
                        }
                        uVar203 = SUB84(dVar225,0);
                        uVar205 = (undefined4)((ulong)dVar225 >> 0x20);
                        dVar222 = dVar217;
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar225 = ((0.5 - dVar3) * dVar220 +
                            ((local_508 + lVar129 + (iVar151 - iVar20))[lVar35] - dVar186) * dVar218
                            + (local_508[lVar129 + (iVar151 - iVar20)] - dVar195) * dVar216 +
                              dVar235) - dVar235;
                  if (dVar225 <= 1e-13) {
                    dVar217 = 1.0;
                    if ((dVar225 < -1e-13) &&
                       (dVar217 = (dVar222 - dVar235) / dVar225, 1.0 <= dVar217)) {
                      dVar217 = 1.0;
                    }
                  }
                  else {
                    dVar217 = ((double)CONCAT44(uVar205,uVar203) - dVar235) / dVar225;
                    if (1.0 <= dVar217) {
                      dVar217 = 1.0;
                    }
                  }
                  if (dVar221 <= dVar217) {
                    dVar217 = dVar221;
                  }
                }
                dVar221 = dVar217;
                if ((uVar12 >> 9 & 1) != 0) {
                  dVar235 = pdVar32[(long)pdVar89 + lVar99 + lVar153];
                  cVar170 = '\x05';
                  uVar204 = SUB84(dVar235,0);
                  uVar206 = (undefined4)((ulong)dVar235 >> 0x20);
                  uVar203 = uVar204;
                  uVar205 = uVar206;
                  for (lVar121 = -1; lVar121 != 1; lVar121 = lVar121 + 1) {
                    cVar162 = cVar170;
                    for (lVar153 = -1; lVar153 != 2; lVar153 = lVar153 + 1) {
                      for (lVar101 = 0; lVar101 != 3; lVar101 = lVar101 + 1) {
                        if (((int)lVar101 == 1 && ((int)lVar153 == 0 && (int)lVar121 == 0)) ||
                           ((1 << (cVar162 + (char)lVar101 & 0x1fU) & uVar12) == 0)) {
                          dVar221 = (double)CONCAT44(uVar205,uVar203);
                          dVar222 = (double)CONCAT44(uVar206,uVar204);
                        }
                        else {
                          dVar221 = pdVar32[(iVar157 + (int)lVar121) * lVar147 +
                                            (iVar87 + (int)lVar153) * lVar152 +
                                            (long)(iVar84 + (int)lVar101)];
                          dVar222 = dVar221;
                          if (dVar221 <= (double)CONCAT44(uVar206,uVar204)) {
                            dVar222 = (double)CONCAT44(uVar206,uVar204);
                          }
                          if ((double)CONCAT44(uVar205,uVar203) < dVar221 ||
                              (double)CONCAT44(uVar205,uVar203) == dVar221) {
                            dVar221 = (double)CONCAT44(uVar205,uVar203);
                          }
                        }
                        uVar203 = SUB84(dVar221,0);
                        uVar205 = (undefined4)((ulong)dVar221 >> 0x20);
                        uVar204 = SUB84(dVar222,0);
                        uVar206 = (undefined4)((ulong)dVar222 >> 0x20);
                      }
                      cVar162 = cVar162 + '\x03';
                    }
                    cVar170 = cVar170 + '\t';
                  }
                  dVar222 = ((((local_5e0 + lVar93 + lVar129 + (iVar151 - iVar20))[lVar35] - dVar186
                              ) * dVar218 +
                             (local_5e0[lVar93 + lVar129 + (iVar151 - iVar20)] - dVar195) * dVar216
                             + dVar235) - (dVar3 + 0.5) * dVar220) - dVar235;
                  if (dVar222 <= 1e-13) {
                    dVar221 = 1.0;
                    if ((dVar222 < -1e-13) &&
                       (dVar221 = ((double)CONCAT44(uVar205,uVar203) - dVar235) / dVar222,
                       1.0 <= dVar221)) {
                      dVar221 = 1.0;
                    }
                  }
                  else {
                    dVar221 = ((double)CONCAT44(uVar206,uVar204) - dVar235) / dVar222;
                    if (1.0 <= dVar221) {
                      dVar221 = 1.0;
                    }
                  }
                  if (dVar217 <= dVar221) {
                    dVar221 = dVar217;
                  }
                }
                uVar204 = (undefined4)((ulong)dVar221 >> 0x20);
                uVar203 = 0;
                uVar205 = 0;
                if (1 < (int)local_a08._0_4_) {
                  uVar203 = SUB84(dVar221,0);
                  uVar205 = uVar204;
                }
                uVar206 = 0;
                uVar207 = 0;
                if (1 < iVar150) {
                  uVar206 = SUB84(dVar221,0);
                  uVar207 = uVar204;
                }
                lVar121 = (long)(iVar151 - (int)local_5f8);
                dVar217 = 0.0;
                if (1 < iVar179) {
                  dVar217 = dVar221;
                }
                if ((dVar198 == 1.0) && (!NAN(dVar198))) {
                  if ((pdVar37[lVar100 + lVar148 + (iVar142 + -2)] == 1.0) &&
                     (((!NAN(pdVar37[lVar100 + lVar148 + (iVar142 + -2)]) &&
                       (pdVar37[lVar100 + lVar148 + lVar182] == 1.0)) &&
                      (!NAN(pdVar37[lVar100 + lVar148 + lVar182]))))) {
                    uVar203 = 0;
                    uVar205 = 0x3ff00000;
                  }
                  if (((local_530[lVar130 + lVar121] == 1.0) && (!NAN(local_530[lVar130 + lVar121]))
                      ) && ((local_530[lVar131 + lVar121] == 1.0 &&
                            (!NAN(local_530[lVar131 + lVar121]))))) {
                    uVar206 = 0;
                    uVar207 = 0x3ff00000;
                  }
                  if (((pdVar37[lVar100 + lVar94 + lVar121] == 1.0) &&
                      (!NAN(pdVar37[lVar100 + lVar94 + lVar121]))) &&
                     ((pdVar37[(long)local_510 + lVar100 + lVar121] == 1.0 &&
                      (!NAN(pdVar37[(long)local_510 + lVar100 + lVar121]))))) {
                    dVar217 = 1.0;
                  }
                }
                dVar199 = (0.5 - dVar195) * dVar216 * (double)CONCAT44(uVar205,uVar203) + dVar2 +
                          (dVar197 - dVar186) * dVar218 * (double)CONCAT44(uVar207,uVar206) +
                          (dVar199 - dVar3) * dVar220 * dVar217;
                dVar197 = local_4c8;
                if (dVar199 <= local_4c8) {
                  dVar197 = dVar199;
                }
                dVar199 = local_498;
                if (local_498 <= dVar197) {
                  dVar199 = dVar197;
                }
                iVar142 = d_bcrec->bc[3];
                if (iVar143 == iVar86) {
                  iVar118 = d_bcrec->bc[0];
                  switch(iVar118) {
                  case 1:
                  case 2:
                  case 4:
                    dVar199 = dVar187;
                  default:
                    if ((iVar118 == 4) || (iVar118 == 2)) {
                      dVar199 = 0.0;
                      if (dVar187 <= 0.0) {
                        dVar199 = dVar187;
                      }
switchD_0033cc81_caseD_1:
                      dVar187 = dVar199;
                    }
                    break;
                  case 3:
                    pdVar88 = local_4f8;
                    pdVar91 = pdVar38;
LAB_0033cd31:
                    dVar199 = pdVar91[(long)pdVar88];
                    dVar187 = dVar199;
                    break;
                  case -1:
switchD_0033cc39_caseD_ffffffff:
                    dVar187 = 0.0;
                    dVar199 = 0.0;
                  }
                }
                else if (iVar4 + 1 == iVar86) {
                  switch(iVar142) {
                  default:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    goto switchD_0033cc81_caseD_1;
                  case 3:
                    pdVar88 = pdVar89;
                    goto LAB_0033cd31;
                  case -1:
                    goto switchD_0033cc39_caseD_ffffffff;
                  }
                }
                dVar197 = dVar199;
                if ((iVar4 + 1 == iVar86) &&
                   (((iVar142 == 4 || (iVar142 == 2)) &&
                    (dVar187 = 0.0, dVar197 = 0.0, 0.0 <= dVar199)))) {
                  dVar187 = dVar199;
                  dVar197 = dVar199;
                }
                if ((0.0 <= dVar197) || (dVar187 <= 0.0)) {
                  dVar199 = (dVar187 + dVar197) * 0.5;
                  if ((dVar199 < 1e-08) && (dVar197 = 0.0, dVar199 <= -1e-08)) {
                    dVar197 = dVar187;
                  }
                }
                else {
                  dVar197 = 0.0;
                }
              }
              local_560[(lVar123 - iVar140) * local_568 +
                        lVar96 * (long)local_540 + (iVar86 - local_4e0)] = dVar197;
              iVar116 = iVar116 + 1;
              iVar166 = iVar166 + 1;
              iVar117 = iVar117 + 1;
              iVar85 = iVar85 + 1;
              iVar84 = iVar84 + 1;
              bVar183 = iVar86 != iVar8;
              lVar121 = lVar154;
              iVar86 = iVar86 + 1;
            } while (bVar183);
          }
        }
        local_688 = local_688 + lVar24;
        local_690 = local_690 + lVar24;
        local_698 = local_698 + lVar24;
        lVar123 = lVar120;
      }
      goto LAB_0033ce28;
    }
  }
  iVar9 = (ubx->smallend).vect[0];
  iVar141 = (ubx->smallend).vect[1];
  iVar140 = (ubx->smallend).vect[2];
  iVar10 = (ubx->bigend).vect[1];
  iVar11 = (ubx->bigend).vect[2];
  uVar40 = *(undefined8 *)&(u->begin).z;
  uVar41 = (u->end).y;
  A[2][0]._0_4_ = uVar41;
  A[2]._4_8_ = *(undefined8 *)&(u->end).z;
  A[1][1] = *(Real *)&u->begin;
  A[1][2]._0_4_ = (undefined4)uVar40;
  A[1][2]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
  A[0][2] = (Real)u->kstride;
  A[1][0] = (Real)u->nstride;
  A[0][0] = (Real)u->p;
  A[0][1] = (Real)u->jstride;
  uVar40 = *(undefined8 *)&(vcc->begin).z;
  uVar42 = (vcc->end).y;
  A[4][2]._0_4_ = uVar42;
  A._116_8_ = *(undefined8 *)&(vcc->end).z;
  A[4][0] = *(Real *)&vcc->begin;
  A[4][1]._0_4_ = (undefined4)uVar40;
  A[4][1]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
  A[3][1] = (Real)vcc->kstride;
  A[3][2] = (Real)vcc->nstride;
  A[2][2] = (Real)vcc->p;
  A[3][0] = (Real)vcc->jstride;
  uVar43 = (flag->end).x;
  uVar44 = (flag->end).y;
  A[5][1] = (Real)flag->p;
  A[5][2] = (Real)flag->jstride;
  A[6][0] = (Real)flag->kstride;
  A[6][1] = (Real)flag->nstride;
  A[6][2] = *(Real *)&flag->begin;
  A[7][0]._0_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  A[7][0]._4_4_ = uVar43;
  A[7][1]._0_4_ = uVar44;
  A[7]._12_8_ = *(undefined8 *)&(flag->end).z;
  uVar45 = (ccc->end).x;
  uVar46 = (ccc->end).y;
  A[8][0] = (Real)ccc->p;
  A[8][1] = (Real)ccc->jstride;
  A[8][2] = (Real)ccc->kstride;
  A[9][0] = (Real)ccc->nstride;
  A[9][1] = *(Real *)&ccc->begin;
  A[9][2]._0_4_ = (undefined4)*(undefined8 *)&(ccc->begin).z;
  A[9][2]._4_4_ = uVar45;
  A[10][0]._0_4_ = uVar46;
  A[10]._4_8_ = *(undefined8 *)&(ccc->end).z;
  uVar47 = (vfrac->end).x;
  uVar48 = (vfrac->end).y;
  A[10][2] = (Real)vfrac->p;
  A[0xb][0] = (Real)vfrac->jstride;
  A[0xb][1] = (Real)vfrac->kstride;
  A[0xb][2] = (Real)vfrac->nstride;
  A[0xc][0] = *(Real *)&vfrac->begin;
  A[0xc][1]._0_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
  A[0xc][1]._4_4_ = uVar47;
  A[0xc][2]._0_4_ = uVar48;
  A._308_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0xd][1] = (Real)d_bcrec;
  uVar40 = *(undefined8 *)&(fcx->begin).z;
  uVar49 = (fcx->end).y;
  A[0xf][2]._0_4_ = uVar49;
  A._380_8_ = *(undefined8 *)&(fcx->end).z;
  A[0xf][0] = *(Real *)&fcx->begin;
  A[0xf][1]._0_4_ = (undefined4)uVar40;
  A[0xf][1]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
  A[0xe][1] = (Real)fcx->kstride;
  A[0xe][2] = (Real)fcx->nstride;
  A[0xd][2] = (Real)fcx->p;
  A[0xe][0] = (Real)fcx->jstride;
  uVar40 = *(undefined8 *)&(fcy->begin).z;
  uVar50 = (fcy->end).y;
  A[0x12][1]._0_4_ = uVar50;
  A[0x12]._12_8_ = *(undefined8 *)&(fcy->end).z;
  A[0x11][2] = *(Real *)&fcy->begin;
  A[0x12][0]._0_4_ = (undefined4)uVar40;
  A[0x12][0]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
  A[0x11][0] = (Real)fcy->kstride;
  A[0x11][1] = (Real)fcy->nstride;
  A[0x10][1] = (Real)fcy->p;
  A[0x10][2] = (Real)fcy->jstride;
  uVar40 = *(undefined8 *)&(fcz->begin).z;
  uVar51 = (fcz->end).y;
  A[0x15][0]._0_4_ = uVar51;
  A[0x15]._4_8_ = *(undefined8 *)&(fcz->end).z;
  A[0x14][1] = *(Real *)&fcz->begin;
  A[0x14][2]._0_4_ = (undefined4)uVar40;
  A[0x14][2]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
  A[0x13][2] = (Real)fcz->kstride;
  A[0x14][0] = (Real)fcz->nstride;
  A[0x13][0] = (Real)fcz->p;
  A[0x13][1] = (Real)fcz->jstride;
  A[0x15][2]._0_4_ = iVar143;
  A[0x15][2]._4_4_ = iVar180;
  A[0x16][0]._0_4_ = iVar6;
  A[0x16][0]._4_4_ = iVar4;
  A[0x16][1]._0_4_ = iVar5;
  A[0x16][1]._4_4_ = iVar7;
  A[0x16][2]._0_4_ = 2;
  for (; iVar175 = iVar141, iVar140 <= iVar11; iVar140 = iVar140 + 1) {
    for (; iVar175 <= iVar10; iVar175 = iVar175 + 1) {
      iVar178 = iVar9;
      if (iVar9 <= iVar8) {
        do {
          ExtrapVelToFacesBox::anon_class_552_16_5c7b231c::operator()
                    ((anon_class_552_16_5c7b231c *)A,iVar178,iVar175,iVar140);
          iVar178 = iVar178 + 1;
        } while (iVar8 + 1 != iVar178);
      }
    }
  }
LAB_0033ce28:
  pBVar23 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((((pBVar23[1].bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar143)) ||
       ((0xfffffffd < pBVar23[1].bc[3] - 5U && (iVar4 <= (ubx->bigend).vect[0])))) ||
      ((((pBVar23[1].bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar180)) ||
        (iVar8 = (vbx->bigend).vect[1], iVar5 <= iVar8 && 0xfffffffd < pBVar23[1].bc[4] - 5U)) ||
       ((pBVar23[1].bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar6)))))) ||
     ((0xfffffffd < pBVar23[1].bc[5] - 5U && (iVar7 <= (wbx->bigend).vect[2])))) {
    iVar8 = (vbx->smallend).vect[0];
    iVar9 = (vbx->smallend).vect[1];
    iVar141 = (vbx->smallend).vect[2];
    iVar140 = (vbx->bigend).vect[0];
    iVar10 = (vbx->bigend).vect[1];
    iVar11 = (vbx->bigend).vect[2];
    uVar40 = *(undefined8 *)&(v->begin).z;
    uVar52 = (v->end).y;
    A[2][0]._0_4_ = uVar52;
    A[2]._4_8_ = *(undefined8 *)&(v->end).z;
    A[1][1] = *(Real *)&v->begin;
    A[1][2]._0_4_ = (undefined4)uVar40;
    A[1][2]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0][2] = (Real)v->kstride;
    A[1][0] = (Real)v->nstride;
    A[0][0] = (Real)v->p;
    A[0][1] = (Real)v->jstride;
    uVar40 = *(undefined8 *)&(vcc->begin).z;
    uVar53 = (vcc->end).y;
    A[4][2]._0_4_ = uVar53;
    A._116_8_ = *(undefined8 *)&(vcc->end).z;
    A[4][0] = *(Real *)&vcc->begin;
    A[4][1]._0_4_ = (undefined4)uVar40;
    A[4][1]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[3][1] = (Real)vcc->kstride;
    A[3][2] = (Real)vcc->nstride;
    A[2][2] = (Real)vcc->p;
    A[3][0] = (Real)vcc->jstride;
    uVar54 = (flag->end).x;
    uVar55 = (flag->end).y;
    A[5][1] = (Real)flag->p;
    A[5][2] = (Real)flag->jstride;
    A[6][0] = (Real)flag->kstride;
    A[6][1] = (Real)flag->nstride;
    A[6][2] = *(Real *)&flag->begin;
    A[7][0]._0_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
    A[7][0]._4_4_ = uVar54;
    A[7][1]._0_4_ = uVar55;
    A[7]._12_8_ = *(undefined8 *)&(flag->end).z;
    uVar56 = (ccc->end).x;
    uVar57 = (ccc->end).y;
    A[8][0] = (Real)ccc->p;
    A[8][1] = (Real)ccc->jstride;
    A[8][2] = (Real)ccc->kstride;
    A[9][0] = (Real)ccc->nstride;
    A[9][1] = *(Real *)&ccc->begin;
    A[9][2]._0_4_ = (undefined4)*(undefined8 *)&(ccc->begin).z;
    A[9][2]._4_4_ = uVar56;
    A[10][0]._0_4_ = uVar57;
    A[10]._4_8_ = *(undefined8 *)&(ccc->end).z;
    uVar58 = (vfrac->end).x;
    uVar59 = (vfrac->end).y;
    A[10][2] = (Real)vfrac->p;
    A[0xb][0] = (Real)vfrac->jstride;
    A[0xb][1] = (Real)vfrac->kstride;
    A[0xb][2] = (Real)vfrac->nstride;
    A[0xc][0] = *(Real *)&vfrac->begin;
    A[0xc][1]._0_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
    A[0xc][1]._4_4_ = uVar58;
    A[0xc][2]._0_4_ = uVar59;
    A._308_8_ = *(undefined8 *)&(vfrac->end).z;
    A[0xd][1] = (Real)d_bcrec;
    uVar40 = *(undefined8 *)&(fcx->begin).z;
    uVar60 = (fcx->end).y;
    A[0xf][2]._0_4_ = uVar60;
    A._380_8_ = *(undefined8 *)&(fcx->end).z;
    A[0xf][0] = *(Real *)&fcx->begin;
    A[0xf][1]._0_4_ = (undefined4)uVar40;
    A[0xf][1]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0xe][1] = (Real)fcx->kstride;
    A[0xe][2] = (Real)fcx->nstride;
    A[0xd][2] = (Real)fcx->p;
    A[0xe][0] = (Real)fcx->jstride;
    uVar40 = *(undefined8 *)&(fcy->begin).z;
    uVar61 = (fcy->end).y;
    A[0x12][1]._0_4_ = uVar61;
    A[0x12]._12_8_ = *(undefined8 *)&(fcy->end).z;
    A[0x11][2] = *(Real *)&fcy->begin;
    A[0x12][0]._0_4_ = (undefined4)uVar40;
    A[0x12][0]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0x11][0] = (Real)fcy->kstride;
    A[0x11][1] = (Real)fcy->nstride;
    A[0x10][1] = (Real)fcy->p;
    A[0x10][2] = (Real)fcy->jstride;
    uVar40 = *(undefined8 *)&(fcz->begin).z;
    uVar62 = (fcz->end).y;
    A[0x15][0]._0_4_ = uVar62;
    A[0x15]._4_8_ = *(undefined8 *)&(fcz->end).z;
    A[0x14][1] = *(Real *)&fcz->begin;
    A[0x14][2]._0_4_ = (undefined4)uVar40;
    A[0x14][2]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0x13][2] = (Real)fcz->kstride;
    A[0x14][0] = (Real)fcz->nstride;
    A[0x13][0] = (Real)fcz->p;
    A[0x13][1] = (Real)fcz->jstride;
    A[0x15][2]._0_4_ = iVar143;
    A[0x15][2]._4_4_ = iVar180;
    A[0x16][0]._0_4_ = iVar6;
    A[0x16][0]._4_4_ = iVar4;
    A[0x16][1]._0_4_ = iVar5;
    A[0x16][1]._4_4_ = iVar7;
    A[0x16][2]._0_4_ = 2;
    for (; iVar175 = iVar9, iVar141 <= iVar11; iVar141 = iVar141 + 1) {
      for (; iVar175 <= iVar10; iVar175 = iVar175 + 1) {
        iVar178 = iVar8;
        if (iVar8 <= iVar140) {
          do {
            ExtrapVelToFacesBox::anon_class_552_16_3e0d00fb::operator()
                      ((anon_class_552_16_3e0d00fb *)A,iVar178,iVar175,iVar141);
            iVar178 = iVar178 + 1;
          } while (iVar140 + 1 != iVar178);
        }
      }
    }
  }
  else {
    pdVar89 = (double *)(long)(vbx->smallend).vect[2];
    pdVar26 = v->p;
    local_578 = v->jstride;
    lVar24 = v->kstride;
    lVar25 = ccc->kstride;
    lVar152 = ccc->nstride;
    iVar9 = (ccc->begin).x;
    local_4e0 = (long)iVar9;
    iVar141 = (ccc->begin).z;
    local_460 = (ulong)iVar141;
    local_4e8 = lVar152 * 0x10;
    lVar147 = (~local_460 + (long)pdVar89) * lVar25;
    iVar140 = (v->begin).x;
    local_580 = (ulong)(v->begin).y;
    local_468 = (long)(v->begin).z;
    uVar13 = (vfrac->begin).x;
    uVar21 = (vfrac->begin).z;
    local_470 = (long)(int)uVar21;
    local_478 = (ulong)~uVar21;
    uVar22 = (vcc->begin).y;
    local_588 = (long)(int)uVar22;
    local_590 = (ulong)~uVar22;
    iVar10 = (vbx->smallend).vect[0];
    local_5a0 = (ulong)(uint)((iVar10 + -1) - iVar9);
    iVar11 = (vcc->begin).x;
    local_598 = (EBCellFlag *)(ulong)(uint)((iVar10 + -1) - iVar11);
    local_5a8 = (ulong)(uint)(iVar10 - iVar11);
    pdVar32 = ccc->p;
    local_708 = pdVar32 + ((lVar147 + -1) - local_4e0);
    iVar175 = (ccc->begin).y;
    local_5b0 = (double *)(-2 - (long)iVar175);
    local_710 = pdVar32 + ((lVar147 + lVar152 + -1) - local_4e0);
    local_718 = pdVar32 + ((lVar147 + lVar152 * 2 + -1) - local_4e0);
    iVar178 = (vbx->bigend).vect[0];
    local_480 = (long)(vbx->smallend).vect[1];
    iVar14 = (vbx->bigend).vect[2];
    local_5b8 = vcc->p;
    lVar147 = vcc->jstride;
    lVar27 = vcc->kstride;
    lVar28 = vcc->nstride;
    local_3b8 = (long)(vcc->begin).z;
    local_3c0 = flag->p;
    lVar30 = flag->jstride;
    local_3c8 = flag->kstride;
    iVar15 = (flag->begin).x;
    lVar163 = (long)(flag->begin).y;
    local_3d0 = (double *)(long)(flag->begin).z;
    local_3d8 = fcx->p;
    local_5c0 = fcx->jstride;
    local_3e0 = fcx->kstride;
    lVar31 = fcx->nstride;
    iVar16 = (fcx->begin).x;
    local_5c8 = (double *)(long)(fcx->begin).y;
    local_3e8 = (long)(fcx->begin).z;
    local_3f0 = fcy->p;
    lVar33 = fcy->jstride;
    local_3f8 = fcy->kstride;
    local_4c8 = (double)fcy->nstride;
    iVar17 = (fcy->begin).x;
    iVar18 = (fcy->begin).y;
    local_400 = (long)(fcy->begin).z;
    local_408 = fcz->p;
    lVar34 = fcz->jstride;
    local_3a0 = fcz->kstride;
    lVar35 = fcz->nstride;
    iVar19 = (fcz->begin).x;
    lVar164 = (long)(fcz->begin).y;
    local_3a8 = (long)(fcz->begin).z;
    lVar36 = ccc->jstride;
    pdVar37 = vfrac->p;
    local_5d0 = vfrac->jstride;
    local_3b0 = vfrac->kstride;
    iVar20 = (vfrac->begin).y;
    local_5d8 = (long)iVar20;
    while (pEVar29 = local_3c0, pdVar1 = local_3d8, pdVar88 = local_3f0, pdVar38 = local_408,
          (long)pdVar89 <= (long)iVar14) {
      lVar119 = ((long)pdVar89 - (long)local_3d0) * local_3c8;
      lVar120 = ((long)pdVar89 - local_400) * local_3f8;
      iVar82 = (int)pdVar89;
      iVar83 = iVar82 - iVar141;
      lVar121 = iVar83 * lVar25;
      iVar115 = iVar82 - (int)local_3b8;
      lVar93 = iVar115 * lVar27;
      local_558 = ((long)pdVar89 - local_470) * local_3b0;
      lVar94 = ((long)pdVar89 + (-1 - local_470)) * local_3b0;
      local_5e0 = (double *)((long)pdVar89 + 1);
      lVar154 = ((long)local_5e0 - local_470) * local_3b0;
      lVar148 = ((long)pdVar89 + (-1 - local_3b8)) * lVar27;
      lVar124 = ((long)local_5e0 - local_3b8) * lVar27;
      lVar122 = ((long)pdVar89 - local_3e8) * local_3e0;
      lVar168 = ((iVar82 - (int)local_3a8) + 1) * local_3a0;
      lVar92 = ((long)pdVar89 - local_3a8) * local_3a0;
      local_560 = (double *)((int)(~uVar21 + iVar82) * local_3b0);
      local_568 = (int)((iVar82 - uVar21) + 1) * local_3b0;
      local_570 = pdVar37 + local_558;
      lVar123 = local_480;
      while (lVar95 = lVar123, lVar95 <= iVar8) {
        if (iVar178 < iVar10) {
          lVar123 = lVar95 + 1;
        }
        else {
          local_4a8 = pEVar29 + lVar119 + (lVar95 - lVar163) * lVar30;
          iVar157 = (int)lVar95;
          lVar96 = lVar95 + -1;
          lVar98 = lVar147 * (lVar96 - local_588);
          iVar116 = iVar157 - uVar22;
          lVar99 = iVar116 * lVar147;
          lVar100 = (lVar95 - local_5d8) * local_5d0;
          local_538 = local_5b8 + lVar99 + lVar93 + lVar28;
          lVar125 = (lVar96 - local_5d8) * local_5d0;
          local_550 = lVar95 + 1;
          local_520 = local_570 + (local_550 - local_5d8) * local_5d0;
          local_540 = local_5b8 + lVar28 + lVar93 + (local_550 - local_588) * lVar147;
          local_4f8 = pdVar88 + lVar120 + ((iVar157 - iVar18) + 1) * lVar33;
          lVar128 = (lVar95 - (long)local_5c8) * local_5c0;
          lVar129 = (lVar95 - lVar164) * lVar34;
          iVar135 = iVar157 - iVar20;
          local_528 = local_570 + (iVar135 + 1) * local_5d0;
          lVar130 = (lVar96 - iVar175) * lVar36;
          local_518 = (EBCellFlag *)(local_5b8 + lVar98 + lVar93 + lVar28);
          local_510 = local_5b8 + lVar28 + lVar93 + ((lVar95 + -2) - local_588) * lVar147;
          lVar126 = (lVar96 - (long)local_5c8) * local_5c0;
          lVar97 = (lVar96 - lVar164) * lVar34;
          local_548 = local_5b8 + lVar28 + lVar93 + (int)(~uVar22 + iVar157) * lVar147;
          lVar127 = ((long)local_5b0 + lVar95) * lVar36 * 8;
          local_4d8 = (double *)((long)local_708 + lVar127);
          local_4d0 = (double *)(lVar127 + (long)local_718);
          local_508 = pdVar37 + (long)(lVar100 + (long)local_560);
          local_530 = pdVar37 + lVar100 + local_568;
          local_4f0 = pdVar37 + (long)(lVar125 + (long)local_560);
          local_500 = pdVar37 + lVar125 + local_568;
          uVar184 = local_5a8;
          local_a30 = local_598;
          local_9b0 = local_5a0;
          iVar82 = iVar10;
          do {
            lVar123 = (long)iVar82;
            lVar131 = lVar123 - iVar15;
            uVar12 = local_4a8[lVar131].flag;
            dVar197 = 0.0;
            if ((short)uVar12 < 0) {
              pdVar91 = local_4d8 + lVar123;
              lVar138 = (long)local_710 + lVar123 * 8 + lVar127;
              pdVar167 = local_4d0 + lVar123;
              lVar173 = lVar123 - iVar17;
              pdVar181 = pdVar88 + lVar120 + (lVar95 - iVar18) * lVar33 + lVar173;
              dVar197 = *pdVar181;
              dVar199 = pdVar181[(long)local_4c8];
              lVar182 = (long)(iVar82 - iVar9);
              pdVar90 = pdVar32 + lVar121 + (iVar157 - iVar175) * lVar36 + lVar182;
              dVar198 = *pdVar90;
              dVar195 = pdVar90[lVar152];
              dVar186 = pdVar90[lVar152 * 2];
              lVar153 = (long)(iVar82 - iVar11);
              dVar2 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
              dVar3 = local_5b8[lVar99 + lVar153 + lVar93 + lVar28];
              iVar166 = 0;
              cVar170 = '\x05';
              for (lVar159 = -1; lVar159 != 2; lVar159 = lVar159 + 1) {
                iVar84 = (int)lVar159;
                local_a08 = (undefined1  [8])(pdVar32 + (iVar83 + iVar84) * lVar25);
                iVar117 = iVar166;
                cVar162 = cVar170;
                for (lVar101 = -1; iVar117 = iVar117 + 3, lVar101 != 2; lVar101 = lVar101 + 1) {
                  lVar103 = (long)iVar166;
                  paRVar136 = A + lVar103;
                  iVar85 = (int)lVar101;
                  iVar166 = iVar166 + 3;
                  for (lVar102 = 0; iVar117 - lVar103 != lVar102; lVar102 = lVar102 + 1) {
                    iVar86 = (int)lVar102 + -1;
                    if (((iVar85 == 0 && iVar84 == 0) && iVar86 == 0) ||
                       ((1 << (cVar162 + (char)lVar102 & 0x1fU) & uVar12) == 0)) {
                      (*paRVar136)[0] = 0.0;
                      (*paRVar136)[1] = 0.0;
                      (*paRVar136)[2] = 0.0;
                    }
                    else {
                      pdVar90 = pdVar32 + (iVar83 + iVar84) * lVar25 +
                                ((iVar157 - iVar175) + iVar85) * lVar36 +
                                (long)((int)local_9b0 + (int)lVar102);
                      dVar187 = pdVar90[lVar152];
                      (*paRVar136)[0] = (*pdVar90 + (double)iVar86) - dVar198;
                      (*paRVar136)[1] = (dVar187 + (double)iVar85) - dVar195;
                      (*paRVar136)[2] = (pdVar90[lVar152 * 2] + (double)iVar84) - dVar186;
                    }
                    paRVar136 = paRVar136 + 1;
                  }
                  cVar162 = cVar162 + '\x03';
                }
                cVar170 = cVar170 + '\t';
              }
              dVar187 = dVar197 - dVar198;
              iVar166 = 0;
              lVar159 = 5;
              for (lVar101 = -1; iVar117 = (int)local_a30, lVar101 != 2; lVar101 = lVar101 + 1) {
                local_a08 = (undefined1  [8])lVar159;
                lVar103 = lVar159;
                iVar84 = iVar166;
                for (lVar102 = -1; iVar84 = iVar84 + 3, lVar102 != 2; lVar102 = lVar102 + 1) {
                  lVar104 = (long)iVar166;
                  iVar166 = iVar166 + 3;
                  for (lVar105 = 0; iVar84 - lVar104 != lVar105; lVar105 = lVar105 + 1) {
                    RVar188 = 0.0;
                    if (((int)lVar105 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                       ((1 << ((char)lVar103 + (char)lVar105 & 0x1fU) & uVar12) != 0)) {
                      RVar188 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                   (iVar116 + (int)lVar102) * lVar147 +
                                                   (long)(iVar117 + (int)lVar105)] - dVar3;
                    }
                    du[lVar104 + lVar105] = RVar188;
                  }
                  lVar103 = lVar103 + 3;
                }
                lVar159 = lVar159 + 9;
              }
              local_5f8 = dVar199 - dVar186;
              pdVar90 = &local_458;
              for (lVar159 = 0; lVar101 = -0x48, lVar159 != 3; lVar159 = lVar159 + 1) {
                for (; lVar101 != 0; lVar101 = lVar101 + 0x18) {
                  *(undefined8 *)((long)pdVar90 + lVar101 + 0x48) = 0;
                }
                local_618[lVar159] = 0.0;
                pdVar90 = pdVar90 + 1;
              }
              dVar217 = dVar2;
              if (dVar2 <= dVar3) {
                dVar217 = dVar3;
              }
              pRVar114 = A[0] + 2;
              dVar220 = local_418;
              dVar216 = local_618[0];
              dVar218 = local_458;
              dVar221 = local_438;
              dVar235 = dStack_448;
              dVar222 = dStack_430;
              dVar225 = local_450;
              dVar209 = local_618[1];
              dVar211 = local_618[2];
              for (lVar159 = 0; lVar159 != 0x1b; lVar159 = lVar159 + 1) {
                dVar236 = (*(Real (*) [3])(pRVar114 + -2))[0];
                dVar212 = pRVar114[-1];
                dVar234 = *pRVar114;
                dVar221 = dVar221 + dVar212 * pRVar114[-1];
                dVar235 = dVar235 + dVar236 * *pRVar114;
                dVar222 = dVar222 + dVar234 * dVar212;
                dVar225 = dVar225 + dVar212 * dVar236;
                dVar220 = dVar220 + dVar234 * dVar234;
                dVar234 = du[lVar159];
                dVar216 = dVar216 + dVar236 * dVar234;
                dVar218 = dVar218 + dVar236 * dVar236;
                dVar209 = dVar209 + dVar234 * pRVar114[-1];
                dVar211 = dVar211 + dVar234 * *pRVar114;
                pRVar114 = pRVar114 + 3;
              }
              dVar236 = dVar225 * dVar220 - dVar235 * dVar222;
              dVar234 = dVar225 * dVar211 - dVar235 * dVar209;
              dVar212 = dVar225 * dVar222 + dVar235 * -dVar221;
              dVar219 = dVar220 * dVar221 - dVar222 * dVar222;
              dVar220 = dVar220 * dVar209 - dVar222 * dVar211;
              auVar200._0_8_ =
                   dVar235 * (dVar222 * dVar209 - dVar211 * dVar221) +
                   (dVar216 * dVar219 - dVar220 * dVar225);
              auVar200._8_8_ = dVar235 * dVar234 + (dVar218 * dVar220 - dVar236 * dVar216);
              dVar235 = dVar212 * dVar235 + (dVar219 * dVar218 - dVar236 * dVar225);
              auVar191._8_8_ = dVar235;
              auVar191._0_8_ = dVar235;
              auVar231 = divpd(auVar200,auVar191);
              dVar235 = (dVar212 * dVar216 +
                        ((dVar211 * dVar221 + -dVar209 * dVar222) * dVar218 - dVar234 * dVar225)) /
                        dVar235;
              iVar166 = iVar82 - uVar13;
              lVar159 = (long)iVar166;
              local_498 = pdVar37[lVar100 + local_558 + lVar159];
              dVar220 = auVar231._0_8_;
              dVar216 = auVar231._8_8_;
              if ((local_498 == 1.0) && (!NAN(local_498))) {
                if (pdVar37[lVar100 + local_558 + (int)((iVar82 + -1) - uVar13)] == 1.0) {
                  if ((pdVar37[lVar100 + local_558 + (int)((iVar82 + 1) - uVar13)] == 1.0) &&
                     (!NAN(pdVar37[lVar100 + local_558 + (int)((iVar82 + 1) - uVar13)]))) {
                    dVar222 = dVar3 - local_538[(iVar82 + -1) - iVar11];
                    dVar225 = local_538[(iVar82 + 1) - iVar11] - dVar3;
                    dVar222 = dVar222 + dVar222;
                    dVar225 = dVar225 + dVar225;
                    dVar220 = (local_538[(iVar82 + 1) - iVar11] - local_538[(iVar82 + -1) - iVar11])
                              * 0.5;
                    dVar221 = ABS(dVar222);
                    uVar189 = -(ulong)(0.0 < dVar220);
                    dVar220 = ABS(dVar220);
                    dVar218 = ABS(dVar225);
                    if (dVar221 <= dVar220) {
                      dVar220 = dVar221;
                    }
                    if (dVar220 <= dVar218) {
                      dVar218 = dVar220;
                    }
                    uVar185 = -(ulong)(0.0 < dVar222 * dVar225) & (ulong)dVar218;
                    dVar220 = (double)(~uVar189 & (uVar185 ^ 0x8000000000000000) | uVar189 & uVar185
                                      );
                  }
                }
                if (((local_570[lVar125 + lVar159] == 1.0) && (local_520[lVar159] == 1.0)) &&
                   (!NAN(local_520[lVar159]))) {
                  dVar218 = local_540[lVar153] - dVar3;
                  dVar216 = (dVar3 - dVar2) + (dVar3 - dVar2);
                  dVar218 = dVar218 + dVar218;
                  dVar222 = (local_540[lVar153] - dVar2) * 0.5;
                  dVar225 = ABS(dVar216);
                  uVar189 = -(ulong)(0.0 < dVar222);
                  dVar222 = ABS(dVar222);
                  dVar221 = ABS(dVar218);
                  if (dVar225 <= dVar222) {
                    dVar222 = dVar225;
                  }
                  if (dVar222 <= dVar221) {
                    dVar221 = dVar222;
                  }
                  uVar185 = -(ulong)(0.0 < dVar216 * dVar218) & (ulong)dVar221;
                  dVar216 = (double)(~uVar189 & (uVar185 ^ 0x8000000000000000) | uVar189 & uVar185);
                }
                if (((pdVar37[lVar100 + lVar159 + lVar94] == 1.0) &&
                    (!NAN(pdVar37[lVar100 + lVar159 + lVar94]))) &&
                   ((pdVar37[lVar100 + lVar159 + lVar154] == 1.0 &&
                    (!NAN(pdVar37[lVar100 + lVar159 + lVar154]))))) {
                  dVar218 = dVar3 - local_5b8[lVar99 + lVar153 + lVar148 + lVar28];
                  dVar221 = local_5b8[lVar99 + lVar153 + lVar124 + lVar28] - dVar3;
                  dVar218 = dVar218 + dVar218;
                  dVar221 = dVar221 + dVar221;
                  dVar222 = (local_5b8[lVar99 + lVar153 + lVar124 + lVar28] -
                            local_5b8[lVar99 + lVar153 + lVar148 + lVar28]) * 0.5;
                  dVar225 = ABS(dVar218);
                  uVar189 = -(ulong)(0.0 < dVar222);
                  dVar222 = ABS(dVar222);
                  dVar235 = ABS(dVar221);
                  if (dVar225 <= dVar222) {
                    dVar222 = dVar225;
                  }
                  if (dVar222 <= dVar235) {
                    dVar235 = dVar222;
                  }
                  uVar185 = -(ulong)(0.0 < dVar218 * dVar221) & (ulong)dVar235;
                  dVar235 = (double)(~uVar189 & (uVar185 ^ 0x8000000000000000) | uVar189 & uVar185);
                }
              }
              dVar218 = dVar2;
              if (dVar3 <= dVar2) {
                dVar218 = dVar3;
              }
              iVar85 = 0;
              iVar86 = 0;
              auVar76._12_4_ = 0;
              auVar76._0_12_ = stack0xfffffffffffff5fc;
              _local_a08 = auVar76 << 0x20;
              iVar158 = 0;
              iVar84 = -1;
              while (iVar84 != 2) {
                iVar87 = iVar85;
                iVar142 = -1;
                while (iVar142 != 2) {
                  for (iVar118 = 5; iVar118 != 8; iVar118 = iVar118 + 1) {
                    if (((uVar12 >> (iVar87 + iVar118 & 0x1fU) & 1) != 0) &&
                       ((iVar118 != 6 || iVar142 != 0) || iVar84 != 0)) {
                      iVar158 = iVar158 + (uint)((iVar118 - 5U & 0xfffffffd) == 0 &&
                                                (iVar142 == 0 && iVar84 == 0));
                      local_a08._0_4_ =
                           local_a08._0_4_ +
                           (uint)((iVar118 == 6 && iVar84 == 0) &&
                                 (iVar142 == 1 || iVar142 + 1 == 0));
                      iVar86 = iVar86 + (uint)((iVar118 == 6 && iVar142 == 0) &&
                                              (iVar84 == 1 || iVar84 + 1 == 0));
                    }
                  }
                  iVar87 = iVar87 + 3;
                  iVar142 = iVar142 + 1;
                }
                iVar85 = iVar85 + 9;
                iVar84 = iVar84 + 1;
              }
              dVar221 = 2.0;
              if ((uVar12 >> 0x15 & 1) != 0) {
                cVar170 = '\b';
                dVar222 = dVar3;
                dVar221 = dVar3;
                for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                  cVar162 = cVar170;
                  for (lVar102 = 0; lVar102 != 2; lVar102 = lVar102 + 1) {
                    for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                      if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                        dVar225 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                     (iVar116 + (int)lVar102) * lVar147 +
                                                     (long)(iVar117 + (int)lVar103)];
                        dVar209 = dVar225;
                        if (dVar225 <= dVar221) {
                          dVar209 = dVar221;
                        }
                        dVar221 = dVar209;
                        if (dVar225 < dVar222) {
                          dVar222 = dVar225;
                        }
                      }
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar225 = (((local_4f8 + lVar173)[(long)local_4c8] - dVar186) * dVar235 +
                          (0.5 - dVar195) * dVar216 +
                          (local_4f8[lVar173] - dVar198) * dVar220 + dVar3) - dVar3;
                if (dVar225 <= 1e-13) {
                  dVar221 = 1.0;
                  if ((dVar225 < -1e-13) && (dVar221 = (dVar222 - dVar3) / dVar225, 1.0 <= dVar221))
                  {
                    dVar221 = 1.0;
                  }
                }
                else {
                  dVar221 = (dVar221 - dVar3) / dVar225;
                  if (1.0 <= dVar221) {
                    dVar221 = 1.0;
                  }
                }
                if (2.0 <= dVar221) {
                  dVar221 = 2.0;
                }
              }
              cVar170 = '\x05';
              dVar222 = dVar3;
              dVar225 = dVar3;
              for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                cVar162 = cVar170;
                for (lVar102 = -1; lVar102 != 1; lVar102 = lVar102 + 1) {
                  for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                    if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                       ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                      dVar209 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                   (iVar116 + (int)lVar102) * lVar147 +
                                                   (long)(iVar117 + (int)lVar103)];
                      dVar211 = dVar209;
                      if (dVar209 <= dVar225) {
                        dVar211 = dVar225;
                      }
                      dVar225 = dVar211;
                      if (dVar209 < dVar222) {
                        dVar222 = dVar209;
                      }
                    }
                  }
                  cVar162 = cVar162 + '\x03';
                }
                cVar170 = cVar170 + '\t';
              }
              dVar209 = (local_5f8 * dVar235 +
                        -(dVar195 + 0.5) * dVar216 + dVar187 * dVar220 + dVar3) - dVar3;
              if (dVar209 <= 1e-13) {
                dVar225 = 1.0;
                if ((dVar209 < -1e-13) && (dVar225 = (dVar222 - dVar3) / dVar209, 1.0 <= dVar225)) {
                  dVar225 = 1.0;
                }
              }
              else {
                dVar225 = (dVar225 - dVar3) / dVar209;
                if (1.0 <= dVar225) {
                  dVar225 = 1.0;
                }
              }
              if (dVar221 <= dVar225) {
                dVar225 = dVar221;
              }
              iVar84 = (int)uVar184;
              dVar221 = dVar225;
              if ((uVar12 >> 0x13 & 1) != 0) {
                cVar170 = '\x06';
                dVar221 = dVar3;
                dVar222 = dVar3;
                for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                  cVar162 = cVar170;
                  for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                    for (lVar103 = 0; lVar103 != 2; lVar103 = lVar103 + 1) {
                      dVar209 = dVar222;
                      if ((((int)lVar102 != 0 || (int)lVar101 != 0) || (int)lVar103 != 0) &&
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                        dVar209 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                     (iVar116 + (int)lVar102) * lVar147 +
                                                     (long)(iVar84 + (int)lVar103)];
                        dVar211 = dVar209;
                        if (dVar209 <= dVar221) {
                          dVar211 = dVar221;
                        }
                        dVar221 = dVar211;
                        if (dVar222 <= dVar209) {
                          dVar209 = dVar222;
                        }
                      }
                      dVar222 = dVar209;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = (((pdVar1 + lVar122 + lVar128 + ((iVar82 - iVar16) + 1))[lVar31] - dVar186
                           ) * dVar235 +
                          (pdVar1[lVar122 + lVar128 + ((iVar82 - iVar16) + 1)] - dVar195) * dVar216
                          + (0.5 - dVar198) * dVar220 + dVar3) - dVar3;
                if (dVar209 <= 1e-13) {
                  dVar221 = 1.0;
                  if ((dVar209 < -1e-13) && (dVar221 = (dVar222 - dVar3) / dVar209, 1.0 <= dVar221))
                  {
                    dVar221 = 1.0;
                  }
                }
                else {
                  dVar221 = (dVar221 - dVar3) / dVar209;
                  if (1.0 <= dVar221) {
                    dVar221 = 1.0;
                  }
                }
                if (dVar225 <= dVar221) {
                  dVar221 = dVar225;
                }
              }
              dVar222 = dVar221;
              if ((uVar12 >> 0x11 & 1) != 0) {
                cVar170 = '\x05';
                dVar222 = dVar3;
                dVar225 = dVar3;
                for (lVar101 = -1; lVar101 != 2; lVar101 = lVar101 + 1) {
                  cVar162 = cVar170;
                  for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                    for (lVar103 = 0; lVar103 != 2; lVar103 = lVar103 + 1) {
                      dVar209 = dVar225;
                      if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                        dVar209 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                     (iVar116 + (int)lVar102) * lVar147 +
                                                     (long)(iVar117 + (int)lVar103)];
                        dVar211 = dVar209;
                        if (dVar209 <= dVar222) {
                          dVar211 = dVar222;
                        }
                        dVar222 = dVar211;
                        if (dVar225 <= dVar209) {
                          dVar209 = dVar225;
                        }
                      }
                      dVar225 = dVar209;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = (((pdVar1 + lVar122 + lVar128 + (iVar82 - iVar16))[lVar31] - dVar186) *
                           dVar235 +
                          (pdVar1[lVar122 + lVar128 + (iVar82 - iVar16)] - dVar195) * dVar216 +
                          (dVar3 - (dVar198 + 0.5) * dVar220)) - dVar3;
                if (dVar209 <= 1e-13) {
                  dVar222 = 1.0;
                  if ((dVar209 < -1e-13) && (dVar222 = (dVar225 - dVar3) / dVar209, 1.0 <= dVar222))
                  {
                    dVar222 = 1.0;
                  }
                }
                else {
                  dVar222 = (dVar222 - dVar3) / dVar209;
                  if (1.0 <= dVar222) {
                    dVar222 = 1.0;
                  }
                }
                if (dVar221 <= dVar222) {
                  dVar222 = dVar221;
                }
              }
              dVar221 = dVar222;
              if ((uVar12 >> 0x1b & 1) != 0) {
                cVar170 = '\x0e';
                dVar221 = dVar3;
                dVar225 = dVar3;
                for (lVar101 = 0; lVar101 != 2; lVar101 = lVar101 + 1) {
                  cVar162 = cVar170;
                  for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                    for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                      dVar209 = dVar225;
                      if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                        dVar209 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                     (iVar116 + (int)lVar102) * lVar147 +
                                                     (long)(iVar117 + (int)lVar103)];
                        dVar211 = dVar209;
                        if (dVar209 <= dVar221) {
                          dVar211 = dVar221;
                        }
                        dVar221 = dVar211;
                        if (dVar225 <= dVar209) {
                          dVar209 = dVar225;
                        }
                      }
                      dVar225 = dVar209;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = ((0.5 - dVar186) * dVar235 +
                          ((pdVar38 + lVar168 + lVar129 + (iVar82 - iVar19))[lVar35] - dVar195) *
                          dVar216 + (pdVar38[lVar168 + lVar129 + (iVar82 - iVar19)] - dVar198) *
                                    dVar220 + dVar3) - dVar3;
                if (dVar209 <= 1e-13) {
                  dVar221 = 1.0;
                  if ((dVar209 < -1e-13) && (dVar221 = (dVar225 - dVar3) / dVar209, 1.0 <= dVar221))
                  {
                    dVar221 = 1.0;
                  }
                }
                else {
                  dVar221 = (dVar221 - dVar3) / dVar209;
                  if (1.0 <= dVar221) {
                    dVar221 = 1.0;
                  }
                }
                if (dVar222 <= dVar221) {
                  dVar221 = dVar222;
                }
              }
              dVar222 = dVar221;
              if ((uVar12 >> 9 & 1) != 0) {
                cVar170 = '\x05';
                dVar225 = dVar3;
                dVar222 = dVar3;
                for (lVar101 = -1; lVar101 != 1; lVar101 = lVar101 + 1) {
                  cVar162 = cVar170;
                  for (lVar102 = -1; lVar102 != 2; lVar102 = lVar102 + 1) {
                    for (lVar103 = 0; lVar103 != 3; lVar103 = lVar103 + 1) {
                      dVar209 = dVar225;
                      if (((int)lVar103 != 1 || ((int)lVar102 != 0 || (int)lVar101 != 0)) &&
                         ((1 << (cVar162 + (char)lVar103 & 0x1fU) & uVar12) != 0)) {
                        dVar209 = local_5b8[lVar28 + (iVar115 + (int)lVar101) * lVar27 +
                                                     (iVar116 + (int)lVar102) * lVar147 +
                                                     (long)(iVar117 + (int)lVar103)];
                        dVar211 = dVar209;
                        if (dVar209 <= dVar222) {
                          dVar211 = dVar222;
                        }
                        dVar222 = dVar211;
                        if (dVar225 <= dVar209) {
                          dVar209 = dVar225;
                        }
                      }
                      dVar225 = dVar209;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar198 = ((((pdVar38 + lVar92 + lVar129 + (iVar82 - iVar19))[lVar35] - dVar195) *
                            dVar216 +
                           (pdVar38[lVar92 + lVar129 + (iVar82 - iVar19)] - dVar198) * dVar220 +
                           dVar3) - (dVar186 + 0.5) * dVar235) - dVar3;
                if (dVar198 <= 1e-13) {
                  dVar222 = 1.0;
                  if ((dVar198 < -1e-13) && (dVar222 = (dVar225 - dVar3) / dVar198, 1.0 <= dVar222))
                  {
                    dVar222 = 1.0;
                  }
                }
                else {
                  dVar222 = (dVar222 - dVar3) / dVar198;
                  if (1.0 <= dVar222) {
                    dVar222 = 1.0;
                  }
                }
                if (dVar221 <= dVar222) {
                  dVar222 = dVar221;
                }
              }
              dVar198 = 0.0;
              if (1 < iVar158) {
                dVar198 = dVar222;
              }
              uVar203 = 0;
              uVar205 = 0;
              if (1 < (int)local_a08._0_4_) {
                uVar203 = SUB84(dVar222,0);
                uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
              }
              dVar186 = 0.0;
              if (1 < iVar86) {
                dVar186 = dVar222;
              }
              if ((local_498 == 1.0) && (!NAN(local_498))) {
                if ((pdVar37[lVar100 + local_558 + (int)(~uVar13 + iVar82)] == 1.0) &&
                   (((!NAN(pdVar37[lVar100 + local_558 + (int)(~uVar13 + iVar82)]) &&
                     (pdVar37[lVar100 + local_558 + (iVar166 + 1)] == 1.0)) &&
                    (!NAN(pdVar37[lVar100 + local_558 + (iVar166 + 1)]))))) {
                  dVar198 = 1.0;
                }
                if (((local_570[lVar125 + lVar159] == 1.0) && (!NAN(local_570[lVar125 + lVar159])))
                   && ((local_528[lVar159] == 1.0 && (!NAN(local_528[lVar159]))))) {
                  uVar203 = 0;
                  uVar205 = 0x3ff00000;
                }
                if (((local_508[lVar159] == 1.0) && (!NAN(local_508[lVar159]))) &&
                   ((local_530[lVar159] == 1.0 && (!NAN(local_530[lVar159]))))) {
                  dVar186 = 1.0;
                }
              }
              dVar195 = local_5f8 * dVar235 * dVar186 +
                        ((dVar187 * dVar220 * dVar198 + dVar3) -
                        (dVar195 + 0.5) * dVar216 * (double)CONCAT44(uVar205,uVar203));
              dVar198 = dVar217;
              if (dVar195 <= dVar217) {
                dVar198 = dVar195;
              }
              dVar195 = pdVar32[lVar121 + lVar130 + lVar182];
              dVar186 = pdVar32[lVar121 + lVar130 + lVar182 + lVar152];
              dVar3 = pdVar32[lVar121 + lVar130 + lVar182 + lVar152 * 2];
              uVar12 = pEVar29[lVar119 + (lVar96 - lVar163) * lVar30 + lVar131].flag;
              iVar85 = 0;
              cVar170 = '\x05';
              for (lVar131 = -1; lVar131 != 2; lVar131 = lVar131 + 1) {
                lVar101 = lVar138;
                pdVar90 = pdVar167;
                pdVar172 = pdVar91;
                iVar86 = iVar85;
                cVar162 = cVar170;
                for (lVar182 = -1; iVar86 = iVar86 + 3, lVar182 != 2; lVar182 = lVar182 + 1) {
                  lVar103 = (long)iVar85;
                  paRVar136 = A + lVar103;
                  iVar85 = iVar85 + 3;
                  for (lVar102 = 0; iVar86 - lVar103 != lVar102; lVar102 = lVar102 + 1) {
                    iVar158 = (int)lVar102 + -1;
                    if ((((int)lVar182 == 0 && (int)lVar131 == 0) && iVar158 == 0) ||
                       ((1 << ((char)lVar102 + cVar162 & 0x1fU) & uVar12) == 0)) {
                      (*paRVar136)[0] = 0.0;
                      (*paRVar136)[1] = 0.0;
                      (*paRVar136)[2] = 0.0;
                    }
                    else {
                      dVar187 = *(double *)(lVar101 + lVar102 * 8);
                      (*paRVar136)[0] = (pdVar172[lVar102] + (double)iVar158) - dVar195;
                      (*paRVar136)[1] = (dVar187 + (double)(int)lVar182) - dVar186;
                      (*paRVar136)[2] = (pdVar90[lVar102] + (double)(int)lVar131) - dVar3;
                    }
                    paRVar136 = paRVar136 + 1;
                  }
                  pdVar172 = pdVar172 + lVar36;
                  lVar101 = lVar101 + lVar36 * 8;
                  pdVar90 = pdVar90 + lVar36;
                  cVar162 = cVar162 + '\x03';
                }
                pdVar91 = pdVar91 + lVar25;
                lVar138 = lVar138 + lVar25 * 8;
                pdVar167 = pdVar167 + lVar25;
                cVar170 = cVar170 + '\t';
              }
              dVar187 = dVar218;
              if (dVar218 <= dVar198) {
                dVar187 = dVar198;
              }
              iVar85 = 0;
              cVar170 = '\x05';
              for (lVar131 = -1; lVar131 != 2; lVar131 = lVar131 + 1) {
                iVar86 = iVar85;
                cVar162 = cVar170;
                for (lVar138 = -1; iVar86 = iVar86 + 3, lVar138 != 2; lVar138 = lVar138 + 1) {
                  lVar182 = (long)iVar85;
                  iVar85 = iVar85 + 3;
                  for (lVar101 = 0; iVar86 - lVar182 != lVar101; lVar101 = lVar101 + 1) {
                    RVar188 = 0.0;
                    if (((int)lVar101 != 1 || ((int)lVar138 != 0 || (int)lVar131 != 0)) &&
                       ((1 << (cVar162 + (char)lVar101 & 0x1fU) & uVar12) != 0)) {
                      RVar188 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                   (int)(((int)lVar96 - uVar22) + (int)lVar138) *
                                                   lVar147 + (long)(iVar117 + (int)lVar101)] - dVar2
                      ;
                    }
                    du[lVar182 + lVar101] = RVar188;
                  }
                  cVar162 = cVar162 + '\x03';
                }
                cVar170 = cVar170 + '\t';
              }
              pdVar91 = &local_458;
              for (lVar131 = 0; lVar138 = -0x48, lVar131 != 3; lVar131 = lVar131 + 1) {
                for (; lVar138 != 0; lVar138 = lVar138 + 0x18) {
                  *(undefined8 *)((long)pdVar91 + lVar138 + 0x48) = 0;
                }
                local_618[lVar131] = 0.0;
                pdVar91 = pdVar91 + 1;
              }
              pRVar114 = A[0] + 1;
              dVar198 = dStack_430;
              local_a08 = (undefined1  [8])local_450;
              dStack_a00 = local_618[0];
              dVar220 = local_458;
              dVar216 = dStack_448;
              dVar221 = local_438;
              dVar235 = local_418;
              dVar222 = local_618[1];
              dVar225 = local_618[2];
              for (lVar131 = 0; lVar131 != 0x1b; lVar131 = lVar131 + 1) {
                dVar209 = (*(Real (*) [3])(pRVar114 + -1))[0];
                dVar234 = *pRVar114;
                dVar236 = pRVar114[1];
                dVar211 = du[lVar131];
                dVar216 = dVar216 + dVar236 * dVar209;
                dVar198 = dVar198 + dVar236 * dVar234;
                local_a08 = (undefined1  [8])((double)local_a08 + dVar234 * dVar209);
                dVar221 = dVar221 + dVar234 * dVar234;
                dVar235 = dVar235 + dVar236 * dVar236;
                dStack_a00 = dStack_a00 + dVar209 * dVar211;
                dVar220 = dVar220 + dVar209 * dVar209;
                dVar222 = dVar222 + dVar211 * dVar234;
                dVar225 = dVar225 + dVar211 * dVar236;
                pRVar114 = pRVar114 + 3;
              }
              auVar39._8_4_ = SUB84(local_a08,0);
              auVar39._0_8_ = local_a08;
              auVar39._12_4_ = (int)((ulong)local_a08 >> 0x20);
              dVar209 = dVar235 * (double)local_a08 - dVar216 * dVar198;
              dVar234 = dVar225 * (double)local_a08 - dVar216 * dVar222;
              dStack_8d0 = auVar39._8_8_;
              dVar211 = (double)local_a08 * dVar198 + dVar216 * -dVar221;
              dVar236 = dVar235 * dVar221 - dVar198 * dVar198;
              dVar235 = dVar222 * dVar235 - dVar198 * dVar225;
              auVar233._0_8_ =
                   dVar216 * (dVar222 * dVar198 - dVar225 * dVar221) +
                   (dStack_a00 * dVar236 - dVar235 * (double)local_a08);
              auVar233._8_8_ = dVar216 * dVar234 + (dVar220 * dVar235 - dVar209 * dStack_a00);
              dVar216 = dVar211 * dVar216 + (dVar236 * dVar220 - dVar209 * dStack_8d0);
              auVar192._8_8_ = dVar216;
              auVar192._0_8_ = dVar216;
              auVar231 = divpd(auVar233,auVar192);
              dVar216 = (dVar211 * dStack_a00 +
                        ((dVar225 * dVar221 + -dVar222 * dVar198) * dVar220 -
                        dVar234 * (double)local_a08)) / dVar216;
              local_4b8 = pdVar37[lVar125 + local_558 + lVar159];
              dVar198 = auVar231._0_8_;
              dVar220 = auVar231._8_8_;
              if ((local_4b8 == 1.0) && (!NAN(local_4b8))) {
                uVar189 = (ulong)DAT_005fe970;
                if ((pdVar37[lVar125 + local_558 + (int)((iVar82 + -1) - uVar13)] == 1.0) &&
                   (!NAN(pdVar37[lVar125 + local_558 + (int)((iVar82 + -1) - uVar13)]))) {
                  if ((pdVar37[lVar125 + local_558 + (int)((iVar82 + 1) - uVar13)] == 1.0) &&
                     (!NAN(pdVar37[lVar125 + local_558 + (int)((iVar82 + 1) - uVar13)]))) {
                    dVar198 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28] -
                              *(double *)(local_518 + (long)((iVar82 + -1) - iVar11) * 2);
                    dVar221 = *(double *)(local_518 + (long)((iVar82 + 1) - iVar11) * 2) -
                              local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                    dVar198 = dVar198 + dVar198;
                    dVar221 = dVar221 + dVar221;
                    dVar222 = (*(double *)(local_518 + (long)((iVar82 + 1) - iVar11) * 2) -
                              *(double *)(local_518 + (long)((iVar82 + -1) - iVar11) * 2)) * 0.5;
                    dVar235 = (double)((ulong)dVar198 & uVar189);
                    uVar185 = -(ulong)(0.0 < dVar222);
                    dVar222 = (double)((ulong)dVar222 & uVar189);
                    dVar225 = (double)((ulong)dVar221 & uVar189);
                    if (dVar235 <= dVar222) {
                      dVar222 = dVar235;
                    }
                    if (dVar222 <= dVar225) {
                      dVar225 = dVar222;
                    }
                    uVar196 = -(ulong)(0.0 < dVar198 * dVar221) & (ulong)dVar225;
                    dVar198 = (double)(~uVar185 & (uVar196 ^ 0x8000000000000000) | uVar185 & uVar196
                                      );
                  }
                }
                if ((((local_570[((lVar95 + -2) - local_5d8) * local_5d0 + lVar159] == 1.0) &&
                     (!NAN(local_570[((lVar95 + -2) - local_5d8) * local_5d0 + lVar159]))) &&
                    (local_498 == 1.0)) && (!NAN(local_498))) {
                  dVar235 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28] - local_510[lVar153];
                  dVar222 = local_5b8[lVar99 + lVar153 + lVar93 + lVar28] -
                            local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                  dVar235 = dVar235 + dVar235;
                  dVar222 = dVar222 + dVar222;
                  dVar221 = (local_5b8[lVar99 + lVar153 + lVar93 + lVar28] - local_510[lVar153]) *
                            0.5;
                  dVar225 = (double)((ulong)dVar235 & uVar189);
                  uVar185 = -(ulong)(0.0 < dVar221);
                  dVar221 = (double)((ulong)dVar221 & uVar189);
                  uVar203 = SUB84(dVar221,0);
                  uVar205 = (undefined4)((ulong)dVar221 >> 0x20);
                  dVar220 = (double)((ulong)dVar222 & uVar189);
                  if (dVar225 <= dVar221) {
                    uVar203 = SUB84(dVar225,0);
                    uVar205 = (undefined4)((ulong)dVar225 >> 0x20);
                  }
                  if ((double)CONCAT44(uVar205,uVar203) <= dVar220) {
                    dVar220 = (double)CONCAT44(uVar205,uVar203);
                  }
                  uVar196 = -(ulong)(0.0 < dVar235 * dVar222) & (ulong)dVar220;
                  dVar220 = (double)(~uVar185 & (uVar196 ^ 0x8000000000000000) | uVar185 & uVar196);
                }
                if (((pdVar37[lVar125 + lVar159 + lVar94] == 1.0) &&
                    (!NAN(pdVar37[lVar125 + lVar159 + lVar94]))) &&
                   ((pdVar37[lVar125 + lVar159 + lVar154] == 1.0 &&
                    (!NAN(pdVar37[lVar125 + lVar159 + lVar154]))))) {
                  dVar235 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28] -
                            local_5b8[lVar98 + lVar153 + lVar148 + lVar28];
                  dVar222 = local_5b8[lVar98 + lVar153 + lVar124 + lVar28] -
                            local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                  dVar235 = dVar235 + dVar235;
                  dVar222 = dVar222 + dVar222;
                  dVar221 = (local_5b8[lVar98 + lVar153 + lVar124 + lVar28] -
                            local_5b8[lVar98 + lVar153 + lVar148 + lVar28]) * 0.5;
                  dVar225 = (double)((ulong)dVar235 & uVar189);
                  uVar185 = -(ulong)(0.0 < dVar221);
                  dVar221 = (double)((ulong)dVar221 & uVar189);
                  uVar203 = SUB84(dVar221,0);
                  uVar205 = (undefined4)((ulong)dVar221 >> 0x20);
                  dVar216 = (double)((ulong)dVar222 & uVar189);
                  if (dVar225 <= dVar221) {
                    uVar203 = SUB84(dVar225,0);
                    uVar205 = (undefined4)((ulong)dVar225 >> 0x20);
                  }
                  if ((double)CONCAT44(uVar205,uVar203) <= dVar216) {
                    dVar216 = (double)CONCAT44(uVar205,uVar203);
                  }
                  uVar189 = -(ulong)(0.0 < dVar235 * dVar222) & (ulong)dVar216;
                  dVar216 = (double)(~uVar185 & (uVar189 ^ 0x8000000000000000) | uVar185 & uVar189);
                }
              }
              iVar85 = 0;
              auVar77._12_4_ = 0;
              auVar77._0_12_ = stack0xfffffffffffff5fc;
              _local_a08 = auVar77 << 0x20;
              iVar158 = 0;
              iVar86 = 0;
              iVar117 = -1;
              while (iVar117 != 2) {
                iVar87 = iVar85;
                iVar142 = -1;
                while (iVar142 != 2) {
                  for (iVar118 = 5; iVar118 != 8; iVar118 = iVar118 + 1) {
                    if (((uVar12 >> (iVar87 + iVar118 & 0x1fU) & 1) != 0) &&
                       ((iVar118 != 6 || iVar142 != 0) || iVar117 != 0)) {
                      iVar86 = iVar86 + (uint)((iVar118 - 5U & 0xfffffffd) == 0 &&
                                              (iVar142 == 0 && iVar117 == 0));
                      iVar158 = iVar158 + (uint)((iVar118 == 6 && iVar117 == 0) &&
                                                (iVar142 == 1 || iVar142 + 1 == 0));
                      local_a08._0_4_ =
                           local_a08._0_4_ +
                           (uint)((iVar118 == 6 && iVar142 == 0) &&
                                 (iVar117 == 1 || iVar117 + 1 == 0));
                    }
                  }
                  iVar87 = iVar87 + 3;
                  iVar142 = iVar142 + 1;
                }
                iVar85 = iVar85 + 9;
                iVar117 = iVar117 + 1;
              }
              dVar221 = 2.0;
              iVar117 = (int)(lVar96 - local_588);
              if ((uVar12 >> 0x15 & 1) != 0) {
                dVar235 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                cVar170 = '\b';
                uVar203 = SUB84(dVar235,0);
                uVar205 = (undefined4)((ulong)dVar235 >> 0x20);
                uVar204 = 0;
                uVar206 = 0;
                dVar221 = dVar235;
                for (lVar131 = -1; lVar131 != 2; lVar131 = lVar131 + 1) {
                  cVar162 = cVar170;
                  for (lVar138 = 0; lVar138 != 2; lVar138 = lVar138 + 1) {
                    for (lVar182 = -1; lVar182 != 2; lVar182 = lVar182 + 1) {
                      if ((((int)lVar138 == 0 && (int)lVar131 == 0) && (int)lVar182 == 0) ||
                         ((1 << (cVar162 + (char)lVar182 + 1U & 0x1f) & uVar12) == 0)) {
LAB_0033fbfc:
                        auVar214._4_4_ = uVar205;
                        auVar214._0_4_ = uVar203;
                        auVar214._12_4_ = uVar206;
                        auVar214._8_4_ = uVar204;
                      }
                      else {
                        dVar222 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                     (iVar117 + (int)lVar138) * lVar147 +
                                                     (long)(iVar84 + (int)lVar182)];
                        auVar214._8_8_ = 0;
                        auVar214._0_8_ = dVar222;
                        dVar225 = dVar222;
                        if (dVar222 <= dVar221) {
                          dVar225 = dVar221;
                        }
                        dVar221 = dVar225;
                        if ((double)CONCAT44(uVar205,uVar203) < dVar222 ||
                            (double)CONCAT44(uVar205,uVar203) == dVar222) goto LAB_0033fbfc;
                      }
                      uVar203 = auVar214._0_4_;
                      uVar205 = auVar214._4_4_;
                      uVar204 = auVar214._8_4_;
                      uVar206 = auVar214._12_4_;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar222 = ((pdVar181[(long)local_4c8] - dVar3) * dVar216 +
                          (0.5 - dVar186) * dVar220 + (*pdVar181 - dVar195) * dVar198 + dVar235) -
                          dVar235;
                if (dVar222 <= 1e-13) {
                  dVar221 = 1.0;
                  if ((dVar222 < -1e-13) &&
                     (dVar221 = ((double)CONCAT44(uVar205,uVar203) - dVar235) / dVar222,
                     1.0 <= dVar221)) {
                    dVar221 = 1.0;
                  }
                }
                else {
                  dVar221 = (dVar221 - dVar235) / dVar222;
                  if (1.0 <= dVar221) {
                    dVar221 = 1.0;
                  }
                }
                if (2.0 <= dVar221) {
                  dVar221 = 2.0;
                }
              }
              dVar235 = dVar221;
              if ((short)uVar12 < 0) {
                dVar222 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                cVar170 = '\x05';
                uVar203 = SUB84(dVar222,0);
                uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                uVar204 = 0;
                uVar206 = 0;
                dVar225 = dVar222;
                for (lVar131 = -1; lVar131 != 2; lVar131 = lVar131 + 1) {
                  cVar162 = cVar170;
                  for (lVar138 = -1; lVar138 != 1; lVar138 = lVar138 + 1) {
                    for (lVar182 = -1; lVar182 != 2; lVar182 = lVar182 + 1) {
                      if ((((int)lVar138 == 0 && (int)lVar131 == 0) && (int)lVar182 == 0) ||
                         ((1 << (cVar162 + (char)lVar182 + 1U & 0x1f) & uVar12) == 0)) {
                        auVar215._4_4_ = uVar205;
                        auVar215._0_4_ = uVar203;
                        auVar215._12_4_ = uVar206;
                        auVar215._8_4_ = uVar204;
                      }
                      else {
                        dVar235 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                     (iVar117 + (int)lVar138) * lVar147 +
                                                     (long)(iVar84 + (int)lVar182)];
                        dVar209 = dVar235;
                        if (dVar235 <= (double)CONCAT44(uVar205,uVar203)) {
                          dVar209 = (double)CONCAT44(uVar205,uVar203);
                        }
                        auVar215._8_8_ = 0;
                        auVar215._0_8_ = dVar209;
                        if (dVar235 < dVar225) {
                          dVar225 = dVar235;
                        }
                      }
                      uVar203 = auVar215._0_4_;
                      uVar205 = auVar215._4_4_;
                      uVar204 = auVar215._8_4_;
                      uVar206 = auVar215._12_4_;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = (((pdVar88 + lVar120 + (lVar96 - iVar18) * lVar33 + lVar173)
                            [(long)local_4c8] - dVar3) * dVar216 +
                          -(dVar186 + 0.5) * dVar220 +
                          (pdVar88[lVar120 + (lVar96 - iVar18) * lVar33 + lVar173] - dVar195) *
                          dVar198 + dVar222) - dVar222;
                if (dVar209 <= 1e-13) {
                  dVar235 = 1.0;
                  if ((dVar209 < -1e-13) &&
                     (dVar235 = (dVar225 - dVar222) / dVar209, 1.0 <= dVar235)) {
                    dVar235 = 1.0;
                  }
                }
                else {
                  dVar235 = ((double)CONCAT44(uVar205,uVar203) - dVar222) / dVar209;
                  if (1.0 <= dVar235) {
                    dVar235 = 1.0;
                  }
                }
                if (dVar221 <= dVar235) {
                  dVar235 = dVar221;
                }
              }
              dVar221 = dVar235;
              if ((uVar12 >> 0x13 & 1) != 0) {
                dVar222 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                cVar170 = '\x06';
                dVar225 = dVar222;
                dVar221 = dVar222;
                for (lVar131 = -1; lVar131 != 2; lVar131 = lVar131 + 1) {
                  cVar162 = cVar170;
                  for (lVar138 = -1; lVar138 != 2; lVar138 = lVar138 + 1) {
                    for (lVar173 = 0; lVar173 != 2; lVar173 = lVar173 + 1) {
                      dVar209 = dVar225;
                      if ((((int)lVar138 != 0 || (int)lVar131 != 0) || (int)lVar173 != 0) &&
                         ((1 << (cVar162 + (char)lVar173 & 0x1fU) & uVar12) != 0)) {
                        dVar209 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                     (iVar117 + (int)lVar138) * lVar147 +
                                                     (long)(iVar84 + (int)lVar173)];
                        dVar211 = dVar209;
                        if (dVar209 <= dVar221) {
                          dVar211 = dVar221;
                        }
                        dVar221 = dVar211;
                        if (dVar225 <= dVar209) {
                          dVar209 = dVar225;
                        }
                      }
                      dVar225 = dVar209;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = (((pdVar1 + lVar122 + lVar126 + ((iVar82 - iVar16) + 1))[lVar31] - dVar3)
                           * dVar216 +
                          (pdVar1[lVar122 + lVar126 + ((iVar82 - iVar16) + 1)] - dVar186) * dVar220
                          + (0.5 - dVar195) * dVar198 + dVar222) - dVar222;
                if (dVar209 <= 1e-13) {
                  dVar221 = 1.0;
                  if ((dVar209 < -1e-13) &&
                     (dVar221 = (dVar225 - dVar222) / dVar209, 1.0 <= dVar221)) {
                    dVar221 = 1.0;
                  }
                }
                else {
                  dVar221 = (dVar221 - dVar222) / dVar209;
                  if (1.0 <= dVar221) {
                    dVar221 = 1.0;
                  }
                }
                if (dVar235 <= dVar221) {
                  dVar221 = dVar235;
                }
              }
              dVar235 = dVar221;
              if ((uVar12 >> 0x11 & 1) != 0) {
                dVar222 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                cVar170 = '\x05';
                uVar203 = SUB84(dVar222,0);
                uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                uVar204 = 0;
                uVar206 = 0;
                dVar225 = dVar222;
                for (lVar131 = -1; lVar131 != 2; lVar131 = lVar131 + 1) {
                  cVar162 = cVar170;
                  for (lVar138 = -1; lVar138 != 2; lVar138 = lVar138 + 1) {
                    for (lVar173 = -1; lVar173 != 1; lVar173 = lVar173 + 1) {
                      if ((((int)lVar138 == 0 && (int)lVar131 == 0) && (int)lVar173 == 0) ||
                         ((1 << (cVar162 + (char)lVar173 + 1U & 0x1f) & uVar12) == 0)) {
                        auVar238._4_4_ = uVar205;
                        auVar238._0_4_ = uVar203;
                        auVar238._12_4_ = uVar206;
                        auVar238._8_4_ = uVar204;
                        dVar235 = dVar225;
                      }
                      else {
                        dVar235 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                     (iVar117 + (int)lVar138) * lVar147 +
                                                     (long)(iVar84 + (int)lVar173)];
                        dVar209 = dVar235;
                        if (dVar235 <= (double)CONCAT44(uVar205,uVar203)) {
                          dVar209 = (double)CONCAT44(uVar205,uVar203);
                        }
                        auVar238._8_8_ = 0;
                        auVar238._0_8_ = dVar209;
                        if (dVar225 <= dVar235) {
                          dVar235 = dVar225;
                        }
                      }
                      dVar225 = dVar235;
                      uVar203 = auVar238._0_4_;
                      uVar205 = auVar238._4_4_;
                      uVar204 = auVar238._8_4_;
                      uVar206 = auVar238._12_4_;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = (((pdVar1 + lVar122 + lVar126 + (iVar82 - iVar16))[lVar31] - dVar3) *
                           dVar216 +
                          (pdVar1[lVar122 + lVar126 + (iVar82 - iVar16)] - dVar186) * dVar220 +
                          (dVar222 - (dVar195 + 0.5) * dVar198)) - dVar222;
                if (dVar209 <= 1e-13) {
                  dVar235 = 1.0;
                  if ((dVar209 < -1e-13) &&
                     (dVar235 = (dVar225 - dVar222) / dVar209, 1.0 <= dVar235)) {
                    dVar235 = 1.0;
                  }
                }
                else {
                  dVar235 = ((double)CONCAT44(uVar205,uVar203) - dVar222) / dVar209;
                  if (1.0 <= dVar235) {
                    dVar235 = 1.0;
                  }
                }
                if (dVar221 <= dVar235) {
                  dVar235 = dVar221;
                }
              }
              dVar221 = dVar235;
              if ((uVar12 >> 0x1b & 1) != 0) {
                dVar222 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                cVar170 = '\x0e';
                uVar203 = SUB84(dVar222,0);
                uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                dVar225 = dVar222;
                for (lVar131 = 0; lVar131 != 2; lVar131 = lVar131 + 1) {
                  cVar162 = cVar170;
                  for (lVar138 = -1; lVar138 != 2; lVar138 = lVar138 + 1) {
                    for (lVar173 = -1; lVar173 != 2; lVar173 = lVar173 + 1) {
                      if ((((int)lVar138 == 0 && (int)lVar131 == 0) && (int)lVar173 == 0) ||
                         ((1 << (cVar162 + (char)lVar173 + 1U & 0x1f) & uVar12) == 0)) {
                        dVar209 = (double)CONCAT44(uVar205,uVar203);
                        dVar221 = dVar225;
                      }
                      else {
                        dVar221 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                     (iVar117 + (int)lVar138) * lVar147 +
                                                     (long)(iVar84 + (int)lVar173)];
                        dVar209 = dVar221;
                        if (dVar221 <= (double)CONCAT44(uVar205,uVar203)) {
                          dVar209 = (double)CONCAT44(uVar205,uVar203);
                        }
                        if (dVar225 <= dVar221) {
                          dVar221 = dVar225;
                        }
                      }
                      dVar225 = dVar221;
                      uVar203 = SUB84(dVar209,0);
                      uVar205 = (undefined4)((ulong)dVar209 >> 0x20);
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = ((0.5 - dVar3) * dVar216 +
                          ((pdVar38 + lVar168 + lVar97 + (iVar82 - iVar19))[lVar35] - dVar186) *
                          dVar220 + (pdVar38[lVar168 + lVar97 + (iVar82 - iVar19)] - dVar195) *
                                    dVar198 + dVar222) - dVar222;
                if (dVar209 <= 1e-13) {
                  dVar221 = 1.0;
                  if ((dVar209 < -1e-13) &&
                     (dVar221 = (dVar225 - dVar222) / dVar209, 1.0 <= dVar221)) {
                    dVar221 = 1.0;
                  }
                }
                else {
                  dVar221 = ((double)CONCAT44(uVar205,uVar203) - dVar222) / dVar209;
                  if (1.0 <= dVar221) {
                    dVar221 = 1.0;
                  }
                }
                if (dVar235 <= dVar221) {
                  dVar221 = dVar235;
                }
              }
              dVar235 = dVar221;
              if ((uVar12 >> 9 & 1) != 0) {
                dVar222 = local_5b8[lVar98 + lVar153 + lVar93 + lVar28];
                cVar170 = '\x05';
                uVar203 = SUB84(dVar222,0);
                uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                dVar225 = dVar222;
                for (lVar131 = -1; lVar131 != 1; lVar131 = lVar131 + 1) {
                  cVar162 = cVar170;
                  for (lVar138 = -1; lVar138 != 2; lVar138 = lVar138 + 1) {
                    for (lVar173 = -1; lVar173 != 2; lVar173 = lVar173 + 1) {
                      if ((((int)lVar138 == 0 && (int)lVar131 == 0) && (int)lVar173 == 0) ||
                         ((1 << (cVar162 + (char)lVar173 + 1U & 0x1f) & uVar12) == 0)) {
                        dVar209 = (double)CONCAT44(uVar205,uVar203);
                        dVar235 = dVar225;
                      }
                      else {
                        dVar235 = local_5b8[lVar28 + (iVar115 + (int)lVar131) * lVar27 +
                                                     (iVar117 + (int)lVar138) * lVar147 +
                                                     (long)(iVar84 + (int)lVar173)];
                        dVar209 = dVar235;
                        if (dVar235 <= (double)CONCAT44(uVar205,uVar203)) {
                          dVar209 = (double)CONCAT44(uVar205,uVar203);
                        }
                        if (dVar225 <= dVar235) {
                          dVar235 = dVar225;
                        }
                      }
                      uVar203 = SUB84(dVar209,0);
                      uVar205 = (undefined4)((ulong)dVar209 >> 0x20);
                      dVar225 = dVar235;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = ((((pdVar38 + lVar92 + lVar97 + (iVar82 - iVar19))[lVar35] - dVar186) *
                            dVar220 +
                           (pdVar38[lVar92 + lVar97 + (iVar82 - iVar19)] - dVar195) * dVar198 +
                           dVar222) - (dVar3 + 0.5) * dVar216) - dVar222;
                if (dVar209 <= 1e-13) {
                  dVar235 = 1.0;
                  if ((dVar209 < -1e-13) &&
                     (dVar235 = (dVar225 - dVar222) / dVar209, 1.0 <= dVar235)) {
                    dVar235 = 1.0;
                  }
                }
                else {
                  dVar235 = ((double)CONCAT44(uVar205,uVar203) - dVar222) / dVar209;
                  if (1.0 <= dVar235) {
                    dVar235 = 1.0;
                  }
                }
                if (dVar221 <= dVar235) {
                  dVar235 = dVar221;
                }
              }
              uVar204 = (undefined4)((ulong)dVar235 >> 0x20);
              uVar203 = 0;
              uVar205 = 0;
              if (1 < iVar86) {
                uVar203 = SUB84(dVar235,0);
                uVar205 = uVar204;
              }
              dVar221 = 0.0;
              if (1 < iVar158) {
                dVar221 = dVar235;
              }
              uVar206 = 0;
              uVar207 = 0;
              if (1 < (int)local_a08._0_4_) {
                uVar206 = SUB84(dVar235,0);
                uVar207 = uVar204;
              }
              if ((local_4b8 == 1.0) && (!NAN(local_4b8))) {
                if ((pdVar37[lVar125 + local_558 + (int)(~uVar13 + iVar82)] == 1.0) &&
                   (((!NAN(pdVar37[lVar125 + local_558 + (int)(~uVar13 + iVar82)]) &&
                     (pdVar37[lVar125 + local_558 + (iVar166 + 1)] == 1.0)) &&
                    (!NAN(pdVar37[lVar125 + local_558 + (iVar166 + 1)]))))) {
                  uVar203 = 0;
                  uVar205 = 0x3ff00000;
                }
                if (((local_570[(iVar135 + -2) * local_5d0 + lVar159] == 1.0) &&
                    (!NAN(local_570[(iVar135 + -2) * local_5d0 + lVar159]))) &&
                   ((local_570[lVar100 + lVar159] == 1.0 && (!NAN(local_570[lVar100 + lVar159])))))
                {
                  dVar221 = 1.0;
                }
                if (((local_4f0[lVar159] == 1.0) && (!NAN(local_4f0[lVar159]))) &&
                   ((local_500[lVar159] == 1.0 && (!NAN(local_500[lVar159]))))) {
                  uVar206 = 0;
                  uVar207 = 0x3ff00000;
                }
              }
              dVar197 = (0.5 - dVar186) * dVar220 * dVar221 +
                        (dVar197 - dVar195) * dVar198 * (double)CONCAT44(uVar205,uVar203) + dVar2 +
                        (dVar199 - dVar3) * dVar216 * (double)CONCAT44(uVar207,uVar206);
              if (dVar197 <= dVar217) {
                dVar217 = dVar197;
              }
              if (dVar218 <= dVar217) {
                dVar218 = dVar217;
              }
              iVar166 = d_bcrec[1].bc[4];
              if (lVar95 == iVar180) {
                iVar117 = d_bcrec[1].bc[1];
                switch(iVar117) {
                case 1:
                case 2:
                case 4:
                  dVar218 = dVar187;
                default:
                  if (((iVar117 == 4) || (dVar197 = dVar187, iVar117 == 2)) &&
                     (dVar218 = 0.0, dVar197 = 0.0, dVar187 <= 0.0)) {
                    dVar218 = dVar187;
                    dVar197 = dVar187;
                  }
                  break;
                case 3:
                  dVar218 = local_548[lVar153];
                  dVar197 = local_548[lVar153];
                  break;
                case -1:
                  dVar218 = 0.0;
                  dVar197 = 0.0;
                }
                dVar199 = dVar218;
                dVar187 = dVar197;
                if (lVar95 == (long)iVar5 + 1) goto switchD_003406d5_caseD_0;
              }
              else {
                dVar199 = dVar218;
                if (lVar95 != (long)iVar5 + 1) goto LAB_0034072f;
                switch(iVar166) {
                case 1:
                case 2:
                case 4:
                  dVar187 = dVar218;
                default:
switchD_003406d5_caseD_0:
                  if (((iVar166 == 4) || (dVar199 = dVar218, iVar166 == 2)) &&
                     (dVar199 = 0.0, dVar187 = 0.0, 0.0 <= dVar218)) {
                    dVar199 = dVar218;
                    dVar187 = dVar218;
                  }
                  break;
                case 3:
                  dVar199 = local_5b8[lVar99 + lVar153 + lVar93 + lVar28];
                  dVar187 = dVar199;
                  break;
                case -1:
                  dVar199 = 0.0;
                  dVar187 = 0.0;
                  goto LAB_0034074c;
                }
              }
LAB_0034072f:
              if ((0.0 <= dVar199) || (dVar197 = 0.0, dVar187 <= 0.0)) {
LAB_0034074c:
                dVar198 = (dVar187 + dVar199) * 0.5;
                dVar197 = dVar199;
                if ((dVar198 < 1e-08) && (dVar197 = 0.0, dVar198 <= -1e-08)) {
                  dVar197 = dVar187;
                }
              }
            }
            pdVar26[((long)pdVar89 - local_468) * lVar24 +
                    (lVar95 - local_580) * local_578 + (lVar123 - iVar140)] = dVar197;
            local_9b0 = local_9b0 + 1;
            local_a30 = (EBCellFlag *)((long)&local_a30->flag + 1);
            uVar184 = uVar184 + 1;
            bVar183 = iVar82 != iVar178;
            lVar123 = local_550;
            iVar82 = iVar82 + 1;
          } while (bVar183);
        }
      }
      local_708 = local_708 + lVar25;
      local_710 = local_710 + lVar25;
      local_718 = local_718 + lVar25;
      pdVar89 = local_5e0;
    }
  }
  pBVar23 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((((pBVar23[2].bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar143)) ||
       (((0xfffffffd < pBVar23[2].bc[3] - 5U && (iVar4 <= (ubx->bigend).vect[0])) ||
        ((pBVar23[2].bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar180)))))) ||
      ((0xfffffffd < pBVar23[2].bc[4] - 5U && (iVar5 <= (vbx->bigend).vect[1])))) ||
     (((pBVar23[2].bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar6)) ||
      (iVar8 = (wbx->bigend).vect[2], iVar7 <= iVar8 && 0xfffffffd < pBVar23[2].bc[5] - 5U)))) {
    A[0][0] = (Real)local_5e8->p;
    A[0][1] = (Real)local_5e8->jstride;
    A[0][2] = (Real)local_5e8->kstride;
    A[1][0] = (Real)local_5e8->nstride;
    A[1][1] = *(Real *)&local_5e8->begin;
    uVar40 = *(undefined8 *)&(local_5e8->begin).z;
    uVar63 = (local_5e8->end).y;
    A[2]._4_8_ = *(undefined8 *)&(local_5e8->end).z;
    iVar8 = (wbx->smallend).vect[0];
    iVar9 = (wbx->smallend).vect[1];
    iVar141 = (wbx->smallend).vect[2];
    iVar140 = (wbx->bigend).vect[0];
    iVar10 = (wbx->bigend).vect[1];
    iVar11 = (wbx->bigend).vect[2];
    A[1][2]._0_4_ = (undefined4)uVar40;
    A[1][2]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[2][2] = (Real)vcc->p;
    A[3][0] = (Real)vcc->jstride;
    A[3][1] = (Real)vcc->kstride;
    A[3][2] = (Real)vcc->nstride;
    A[4][0] = *(Real *)&vcc->begin;
    uVar40 = *(undefined8 *)&(vcc->begin).z;
    uVar64 = (vcc->end).y;
    A._116_8_ = *(undefined8 *)&(vcc->end).z;
    A[4][1]._0_4_ = (undefined4)uVar40;
    A[4][1]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[5][1] = (Real)flag->p;
    A[5][2] = (Real)flag->jstride;
    A[6][0] = (Real)flag->kstride;
    A[6][1] = (Real)flag->nstride;
    A[6][2] = *(Real *)&flag->begin;
    uVar65 = (flag->end).x;
    uVar66 = (flag->end).y;
    A[7]._12_8_ = *(undefined8 *)&(flag->end).z;
    A[7][0]._0_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
    A[8][0] = (Real)ccc->p;
    A[8][1] = (Real)ccc->jstride;
    A[8][2] = (Real)ccc->kstride;
    A[9][0] = (Real)ccc->nstride;
    A[9][1] = *(Real *)&ccc->begin;
    uVar67 = (ccc->end).x;
    uVar68 = (ccc->end).y;
    A[10]._4_8_ = *(undefined8 *)&(ccc->end).z;
    A[9][2]._0_4_ = (undefined4)*(undefined8 *)&(ccc->begin).z;
    A[10][2] = (Real)vfrac->p;
    A[0xb][0] = (Real)vfrac->jstride;
    A[0xb][1] = (Real)vfrac->kstride;
    A[0xb][2] = (Real)vfrac->nstride;
    A[0xc][0] = *(Real *)&vfrac->begin;
    uVar69 = (vfrac->end).x;
    uVar70 = (vfrac->end).y;
    A._308_8_ = *(undefined8 *)&(vfrac->end).z;
    A[0xc][1]._0_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
    A[0xd][1] = (Real)d_bcrec;
    A[0xd][2] = (Real)fcx->p;
    A[0xe][0] = (Real)fcx->jstride;
    A[0xe][1] = (Real)fcx->kstride;
    A[0xe][2] = (Real)fcx->nstride;
    A[0xf][0] = *(Real *)&fcx->begin;
    uVar40 = *(undefined8 *)&(fcx->begin).z;
    uVar71 = (fcx->end).y;
    A._380_8_ = *(undefined8 *)&(fcx->end).z;
    A[0xf][1]._0_4_ = (undefined4)uVar40;
    A[0xf][1]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0x10][1] = (Real)fcy->p;
    A[0x10][2] = (Real)fcy->jstride;
    A[0x11][0] = (Real)fcy->kstride;
    A[0x11][1] = (Real)fcy->nstride;
    A[0x11][2] = *(Real *)&fcy->begin;
    uVar40 = *(undefined8 *)&(fcy->begin).z;
    uVar72 = (fcy->end).y;
    A[0x12]._12_8_ = *(undefined8 *)&(fcy->end).z;
    A[0x12][0]._0_4_ = (undefined4)uVar40;
    A[0x12][0]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0x13][0] = (Real)fcz->p;
    A[0x13][1] = (Real)fcz->jstride;
    A[0x13][2] = (Real)fcz->kstride;
    A[0x14][0] = (Real)fcz->nstride;
    A[0x14][1] = *(Real *)&fcz->begin;
    uVar40 = *(undefined8 *)&(fcz->begin).z;
    uVar73 = (fcz->end).y;
    A[0x15]._4_8_ = *(undefined8 *)&(fcz->end).z;
    A[0x14][2]._0_4_ = (undefined4)uVar40;
    A[0x14][2]._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
    A[0x16][2]._0_4_ = 2;
    A[2][0]._0_4_ = uVar63;
    A[4][2]._0_4_ = uVar64;
    A[7][0]._4_4_ = uVar65;
    A[7][1]._0_4_ = uVar66;
    A[9][2]._4_4_ = uVar67;
    A[10][0]._0_4_ = uVar68;
    A[0xc][1]._4_4_ = uVar69;
    A[0xc][2]._0_4_ = uVar70;
    A[0xf][2]._0_4_ = uVar71;
    A[0x12][1]._0_4_ = uVar72;
    A[0x15][0]._0_4_ = uVar73;
    A[0x15][2]._0_4_ = iVar143;
    A[0x15][2]._4_4_ = iVar4;
    A[0x16][0]._0_4_ = iVar180;
    A[0x16][0]._4_4_ = iVar5;
    A[0x16][1]._0_4_ = iVar6;
    A[0x16][1]._4_4_ = iVar7;
    for (; iVar143 = iVar9, iVar141 <= iVar11; iVar141 = iVar141 + 1) {
      for (; iVar143 <= iVar10; iVar143 = iVar143 + 1) {
        iVar180 = iVar8;
        if (iVar8 <= iVar140) {
          do {
            ExtrapVelToFacesBox::anon_class_552_16_a6c64e1e::operator()
                      ((anon_class_552_16_a6c64e1e *)A,iVar180,iVar143,iVar141);
            iVar180 = iVar180 + 1;
          } while (iVar140 + 1 != iVar180);
        }
      }
    }
  }
  else {
    lVar168 = (long)(wbx->smallend).vect[2];
    lVar24 = ccc->nstride;
    iVar143 = (ccc->begin).z;
    lVar25 = ccc->kstride;
    lVar148 = ((lVar168 - iVar143) + -2) * lVar25;
    iVar180 = (ccc->begin).x;
    lVar154 = (long)iVar180;
    local_3c0 = (EBCellFlag *)(long)iVar8;
    iVar4 = (wbx->smallend).vect[0];
    iVar5 = (wbx->bigend).vect[0];
    local_3c8 = (long)(wbx->smallend).vect[1];
    iVar8 = (wbx->bigend).vect[1];
    local_3d0 = local_5e8->p;
    lVar152 = local_5e8->jstride;
    local_3d8 = (double *)local_5e8->kstride;
    iVar9 = (local_5e8->begin).x;
    iVar141 = (local_5e8->begin).y;
    local_3e0 = (long)(local_5e8->begin).z;
    pdVar26 = vcc->p;
    lVar147 = vcc->jstride;
    lVar27 = vcc->kstride;
    lVar28 = vcc->nstride;
    iVar140 = (vcc->begin).x;
    iVar10 = (vcc->begin).y;
    uVar13 = (vcc->begin).z;
    local_3e8 = (long)(int)uVar13;
    pEVar29 = flag->p;
    lVar30 = flag->jstride;
    lVar31 = flag->kstride;
    iVar11 = (flag->begin).x;
    iVar175 = (flag->begin).y;
    lVar92 = (long)(flag->begin).z;
    pdVar32 = fcx->p;
    lVar33 = fcx->jstride;
    lVar34 = fcx->kstride;
    lVar35 = fcx->nstride;
    iVar178 = (fcx->begin).x;
    iVar14 = (fcx->begin).y;
    lVar93 = (long)(fcx->begin).z;
    local_3f0 = fcy->p;
    lVar36 = fcy->jstride;
    lVar163 = fcy->kstride;
    lVar164 = fcy->nstride;
    iVar15 = (fcy->begin).x;
    iVar16 = (fcy->begin).y;
    lVar94 = (long)(fcy->begin).z;
    pdVar37 = fcz->p;
    lVar123 = fcz->jstride;
    lVar119 = fcz->kstride;
    lVar120 = fcz->nstride;
    iVar17 = (fcz->begin).x;
    iVar18 = (fcz->begin).y;
    iVar19 = (fcz->begin).z;
    pdVar89 = ccc->p;
    lVar121 = ccc->jstride;
    iVar20 = (ccc->begin).y;
    pdVar38 = vfrac->p;
    lVar122 = vfrac->jstride;
    local_3f8 = vfrac->kstride;
    uVar21 = (vfrac->begin).x;
    uVar22 = (vfrac->begin).y;
    lVar124 = (long)(int)uVar22;
    local_400 = (long)(vfrac->begin).z;
    local_408 = (double *)(ulong)~uVar13;
    local_7e0 = pdVar89 + ((lVar148 + -1) - lVar154);
    local_7e8 = pdVar89 + ((lVar148 + lVar24 + -1) - lVar154);
    local_7f0 = pdVar89 + ((lVar148 + lVar24 * 2 + -1) - lVar154);
    while (pdVar1 = local_3d0, pdVar88 = local_3f0, lVar168 <= (long)local_3c0) {
      lVar95 = (lVar168 - local_3e0) * (long)local_3d8;
      iVar115 = (int)lVar168;
      lVar148 = lVar168 + -1;
      lVar96 = lVar148 - local_3e8;
      lVar125 = lVar27 * lVar96;
      iVar116 = (int)local_3e8;
      iVar82 = iVar115 - iVar116;
      lVar182 = iVar82 * lVar27;
      lVar138 = (lVar168 - local_400) * local_3f8;
      lVar159 = (lVar148 - local_400) * local_3f8;
      local_3b8 = lVar168 + 1;
      lVar126 = (local_3b8 - local_400) * local_3f8;
      lVar97 = local_3b8 - local_3e8;
      lVar98 = (lVar168 - lVar94) * lVar163;
      lVar99 = (lVar168 - lVar93) * lVar34;
      iVar83 = iVar115 - (int)local_400;
      lVar127 = (iVar83 + 1) * local_3f8;
      lVar128 = (lVar148 - iVar143) * lVar25;
      lVar173 = ((lVar168 + -2) - local_400) * local_3f8;
      lVar129 = (lVar168 + -2) - local_3e8;
      lVar130 = (lVar148 - lVar94) * lVar163;
      lVar131 = (lVar148 - lVar93) * lVar34;
      lVar100 = (iVar83 + -2) * local_3f8;
      iVar83 = (int)local_408;
      lVar154 = local_3c8;
      while (lVar154 <= iVar8) {
        if (iVar5 < iVar4) {
          lVar154 = lVar154 + 1;
        }
        else {
          lVar101 = (lVar154 - iVar175) * lVar30;
          lVar102 = lVar154 - iVar141;
          lVar103 = (lVar154 - iVar18) * lVar123;
          iVar135 = (int)lVar154;
          iVar84 = iVar135 - iVar20;
          lVar104 = iVar84 * lVar121;
          iVar85 = iVar135 - iVar10;
          lVar105 = iVar85 * lVar147;
          lVar106 = (lVar154 - lVar124) * lVar122;
          lVar132 = ((lVar154 + -1) - lVar124) * lVar122;
          lVar153 = lVar154 + 1;
          lVar137 = (lVar153 - lVar124) * lVar122;
          lVar107 = ((lVar154 + -1) - (long)iVar10) * lVar147;
          lVar149 = (lVar153 - iVar10) * lVar147;
          lVar155 = ((iVar135 - iVar16) + 1) * lVar36;
          lVar160 = (lVar154 - iVar16) * lVar36;
          lVar165 = (lVar154 - iVar14) * lVar33;
          lVar169 = (int)(~uVar22 + iVar135) * lVar122;
          lVar171 = (int)((iVar135 - uVar22) + 1) * lVar122;
          lVar144 = (lVar154 + ~(long)iVar20) * lVar121 * 8;
          iVar135 = (iVar4 + -1) - iVar180;
          iVar157 = (iVar4 + -1) - iVar140;
          iVar117 = iVar4 - iVar140;
          iVar166 = iVar4;
          do {
            lVar154 = (long)iVar166;
            lVar108 = lVar154 - iVar11;
            uVar13 = pEVar29[lVar101 + lVar108 + (lVar168 - lVar92) * lVar31].flag;
            dVar197 = 0.0;
            if ((uVar13 >> 9 & 1) != 0) {
              lVar161 = (long)local_7e0 + lVar154 * 8 + lVar144;
              lVar177 = (long)local_7e8 + lVar154 * 8 + lVar144;
              lVar109 = (long)local_7f0 + lVar154 * 8 + lVar144;
              lVar110 = lVar154 - iVar17;
              pdVar91 = pdVar37 + lVar103 + lVar110 + (lVar168 - iVar19) * lVar119;
              dVar197 = *pdVar91;
              dVar199 = pdVar91[lVar120];
              lVar111 = (long)(iVar166 - iVar180);
              pdVar167 = pdVar89 + lVar104 + lVar111 + (iVar115 - iVar143) * lVar25;
              dVar198 = *pdVar167;
              dVar195 = pdVar167[lVar24];
              dVar186 = pdVar167[lVar24 * 2];
              lVar133 = (long)(iVar166 - iVar140);
              dVar2 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
              dVar3 = pdVar26[lVar105 + lVar133 + lVar182 + lVar28 * 2];
              iVar86 = 0;
              cVar170 = '\x05';
              for (lVar139 = -1; lVar139 != 2; lVar139 = lVar139 + 1) {
                iVar87 = (int)lVar139;
                iVar158 = iVar86;
                cVar162 = cVar170;
                for (lVar156 = -1; iVar158 = iVar158 + 3, lVar156 != 2; lVar156 = lVar156 + 1) {
                  lVar112 = (long)iVar86;
                  paRVar136 = A + lVar112;
                  iVar142 = (int)lVar156;
                  iVar86 = iVar86 + 3;
                  for (lVar145 = 0; iVar158 - lVar112 != lVar145; lVar145 = lVar145 + 1) {
                    iVar118 = (int)lVar145 + -1;
                    if (((iVar142 == 0 && iVar87 == 0) && iVar118 == 0) ||
                       ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) == 0)) {
                      (*paRVar136)[0] = 0.0;
                      (*paRVar136)[1] = 0.0;
                      (*paRVar136)[2] = 0.0;
                    }
                    else {
                      pdVar167 = pdVar89 + ((iVar115 - iVar143) + iVar87) * lVar25 +
                                           (iVar84 + iVar142) * lVar121 +
                                           (long)(iVar135 + (int)lVar145);
                      auVar210._0_8_ = (*pdVar167 + (double)iVar118) - dVar198;
                      auVar210._8_8_ = (pdVar167[lVar24] + (double)iVar142) - dVar195;
                      *(undefined1 (*) [16])*paRVar136 = auVar210;
                      (*paRVar136)[2] = (pdVar167[lVar24 * 2] + (double)iVar87) - dVar186;
                    }
                    paRVar136 = paRVar136 + 1;
                  }
                  cVar162 = cVar162 + '\x03';
                }
                cVar170 = cVar170 + '\t';
              }
              dVar187 = dVar197 - dVar198;
              iVar86 = 0;
              cVar170 = '\x05';
              for (lVar139 = -1; lVar139 != 2; lVar139 = lVar139 + 1) {
                iVar158 = iVar86;
                cVar162 = cVar170;
                for (lVar156 = -1; iVar158 = iVar158 + 3, lVar156 != 2; lVar156 = lVar156 + 1) {
                  lVar112 = (long)iVar86;
                  iVar86 = iVar86 + 3;
                  for (lVar145 = 0; iVar158 - lVar112 != lVar145; lVar145 = lVar145 + 1) {
                    RVar188 = 0.0;
                    if (((int)lVar145 != 1 || ((int)lVar156 != 0 || (int)lVar139 != 0)) &&
                       ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                      RVar188 = pdVar26[lVar28 * 2 +
                                        (iVar82 + (int)lVar139) * lVar27 +
                                        (iVar85 + (int)lVar156) * lVar147 +
                                        (long)(iVar157 + (int)lVar145)] - dVar3;
                    }
                    du[lVar112 + lVar145] = RVar188;
                  }
                  cVar162 = cVar162 + '\x03';
                }
                cVar170 = cVar170 + '\t';
              }
              pdVar167 = &local_458;
              for (lVar139 = 0; lVar139 != 3; lVar139 = lVar139 + 1) {
                for (lVar156 = -0x48; lVar156 != 0; lVar156 = lVar156 + 0x18) {
                  *(undefined8 *)((long)pdVar167 + lVar156 + 0x48) = 0;
                }
                local_618[lVar139] = 0.0;
                pdVar167 = pdVar167 + 1;
              }
              dVar217 = dVar2;
              if (dVar2 <= dVar3) {
                dVar217 = dVar3;
              }
              pRVar114 = A[0] + 2;
              dVar218 = local_438;
              dVar221 = dStack_448;
              dVar235 = local_418;
              dVar220 = dStack_430;
              local_a08 = (undefined1  [8])local_450;
              dStack_a00 = local_618[0];
              dVar216 = local_458;
              dVar222 = local_618[1];
              dVar225 = local_618[2];
              for (lVar139 = 0; lVar139 != 0x1b; lVar139 = lVar139 + 1) {
                dVar211 = (*(Real (*) [3])(pRVar114 + -2))[0];
                dVar234 = pRVar114[-1];
                dVar209 = *pRVar114;
                dVar218 = dVar218 + dVar234 * pRVar114[-1];
                dVar221 = dVar221 + dVar211 * *pRVar114;
                dVar220 = dVar220 + dVar209 * dVar234;
                local_a08 = (undefined1  [8])((double)local_a08 + dVar234 * dVar211);
                dVar235 = dVar235 + dVar209 * dVar209;
                dVar209 = du[lVar139];
                dStack_a00 = dStack_a00 + dVar211 * dVar209;
                dVar216 = dVar216 + dVar211 * dVar211;
                dVar222 = dVar222 + dVar209 * pRVar114[-1];
                dVar225 = dVar225 + dVar209 * *pRVar114;
                pRVar114 = pRVar114 + 3;
              }
              dVar211 = (double)local_a08 * dVar235 - dVar221 * dVar220;
              dVar234 = (double)local_a08 * dVar225 - dVar221 * dVar222;
              dVar209 = (double)local_a08 * dVar220 + dVar221 * -dVar218;
              dVar236 = dVar235 * dVar218 - dVar220 * dVar220;
              dVar235 = dVar235 * dVar222 - dVar220 * dVar225;
              auVar230._0_8_ =
                   dVar221 * (dVar220 * dVar222 - dVar225 * dVar218) +
                   (dStack_a00 * dVar236 - dVar235 * (double)local_a08);
              auVar230._8_8_ = dVar221 * dVar234 + (dVar216 * dVar235 - dVar211 * dStack_a00);
              dVar221 = dVar209 * dVar221 + (dVar236 * dVar216 - dVar211 * (double)local_a08);
              auVar193._8_8_ = dVar221;
              auVar193._0_8_ = dVar221;
              auVar231 = divpd(auVar230,auVar193);
              dVar221 = (dVar209 * dStack_a00 +
                        ((dVar225 * dVar218 + -dVar222 * dVar220) * dVar216 -
                        dVar234 * (double)local_a08)) / dVar221;
              iVar86 = iVar166 - uVar21;
              lVar139 = (long)iVar86;
              dVar220 = pdVar38[lVar106 + lVar138 + lVar139];
              dVar216 = auVar231._0_8_;
              dVar218 = auVar231._8_8_;
              if ((dVar220 == 1.0) && (!NAN(dVar220))) {
                if ((pdVar38[lVar106 + lVar138 + (int)((iVar166 + -1) - uVar21)] == 1.0) &&
                   (!NAN(pdVar38[lVar106 + lVar138 + (int)((iVar166 + -1) - uVar21)]))) {
                  if ((pdVar38[lVar106 + lVar138 + (int)((iVar166 + 1) - uVar21)] == 1.0) &&
                     (!NAN(pdVar38[lVar106 + lVar138 + (int)((iVar166 + 1) - uVar21)]))) {
                    dVar216 = dVar3 - pdVar26[lVar105 + lVar182 + lVar28 * 2 +
                                                                  (long)((iVar166 + -1) - iVar140)];
                    dVar235 = pdVar26[lVar105 + lVar182 + lVar28 * 2 +
                                                          (long)((iVar166 + 1) - iVar140)] - dVar3;
                    dVar216 = dVar216 + dVar216;
                    dVar235 = dVar235 + dVar235;
                    dVar225 = (pdVar26[lVar105 + lVar182 + lVar28 * 2 +
                                                           (long)((iVar166 + 1) - iVar140)] -
                              pdVar26[lVar105 + lVar182 + lVar28 * 2 +
                                                          (long)((iVar166 + -1) - iVar140)]) * 0.5;
                    dVar209 = ABS(dVar216);
                    uVar184 = -(ulong)(0.0 < dVar225);
                    dVar225 = ABS(dVar225);
                    dVar222 = ABS(dVar235);
                    if (dVar209 <= dVar225) {
                      dVar225 = dVar209;
                    }
                    if (dVar225 <= dVar222) {
                      dVar222 = dVar225;
                    }
                    uVar189 = -(ulong)(0.0 < dVar216 * dVar235) & (ulong)dVar222;
                    dVar216 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189
                                      );
                  }
                }
                if ((((pdVar38[lVar138 + lVar132 + lVar139] == 1.0) &&
                     (!NAN(pdVar38[lVar138 + lVar132 + lVar139]))) &&
                    (pdVar38[lVar138 + lVar137 + lVar139] == 1.0)) &&
                   (!NAN(pdVar38[lVar138 + lVar137 + lVar139]))) {
                  dVar218 = dVar3 - pdVar26[lVar28 * 2 + lVar182 + lVar107 + lVar133];
                  dVar235 = pdVar26[lVar28 * 2 + lVar182 + lVar149 + lVar133] - dVar3;
                  dVar218 = dVar218 + dVar218;
                  dVar235 = dVar235 + dVar235;
                  dVar225 = (pdVar26[lVar28 * 2 + lVar182 + lVar149 + lVar133] -
                            pdVar26[lVar28 * 2 + lVar182 + lVar107 + lVar133]) * 0.5;
                  dVar209 = ABS(dVar218);
                  uVar184 = -(ulong)(0.0 < dVar225);
                  dVar225 = ABS(dVar225);
                  dVar222 = ABS(dVar235);
                  if (dVar209 <= dVar225) {
                    dVar225 = dVar209;
                  }
                  if (dVar225 <= dVar222) {
                    dVar222 = dVar225;
                  }
                  uVar189 = -(ulong)(0.0 < dVar218 * dVar235) & (ulong)dVar222;
                  dVar218 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189);
                }
                if (((pdVar38[lVar106 + lVar139 + lVar159] == 1.0) &&
                    (!NAN(pdVar38[lVar106 + lVar139 + lVar159]))) &&
                   ((pdVar38[lVar106 + lVar139 + lVar126] == 1.0 &&
                    (!NAN(pdVar38[lVar106 + lVar139 + lVar126]))))) {
                  dVar209 = pdVar26[lVar105 + lVar133 + lVar97 * lVar27 + lVar28 * 2] - dVar3;
                  dVar225 = (dVar3 - dVar2) + (dVar3 - dVar2);
                  dVar209 = dVar209 + dVar209;
                  dVar222 = (pdVar26[lVar105 + lVar133 + lVar97 * lVar27 + lVar28 * 2] - dVar2) *
                            0.5;
                  dVar221 = ABS(dVar225);
                  uVar184 = -(ulong)(0.0 < dVar222);
                  dVar222 = ABS(dVar222);
                  dVar235 = ABS(dVar209);
                  if (dVar221 <= dVar222) {
                    dVar222 = dVar221;
                  }
                  if (dVar222 <= dVar235) {
                    dVar235 = dVar222;
                  }
                  uVar189 = -(ulong)(0.0 < dVar225 * dVar209) & (ulong)dVar235;
                  dVar221 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189);
                }
              }
              dVar235 = dVar2;
              if (dVar3 <= dVar2) {
                dVar235 = dVar3;
              }
              local_5f8._0_4_ = SUB84(dVar235,0);
              local_5f8._4_4_ = (undefined4)((ulong)dVar235 >> 0x20);
              dVar222 = dVar199 - dVar195;
              iVar87 = 0;
              auVar78._12_4_ = 0;
              auVar78._0_12_ = stack0xfffffffffffff5fc;
              _local_a08 = auVar78 << 0x20;
              iVar142 = 0;
              iVar118 = 0;
              iVar158 = -1;
              while (iVar158 != 2) {
                iVar151 = iVar87;
                iVar176 = -1;
                while (iVar176 != 2) {
                  for (iVar179 = 5; iVar179 != 8; iVar179 = iVar179 + 1) {
                    if (((uVar13 >> (iVar151 + iVar179 & 0x1fU) & 1) != 0) &&
                       ((iVar179 != 6 || iVar176 != 0) || iVar158 != 0)) {
                      iVar118 = iVar118 + (uint)((iVar179 - 5U & 0xfffffffd) == 0 &&
                                                (iVar176 == 0 && iVar158 == 0));
                      iVar142 = iVar142 + (uint)((iVar179 == 6 && iVar158 == 0) &&
                                                (iVar176 == 1 || iVar176 + 1 == 0));
                      local_a08._0_4_ =
                           local_a08._0_4_ +
                           (uint)((iVar179 == 6 && iVar176 == 0) &&
                                 (iVar158 == 1 || iVar158 + 1 == 0));
                    }
                  }
                  iVar151 = iVar151 + 3;
                  iVar176 = iVar176 + 1;
                }
                iVar87 = iVar87 + 9;
                iVar158 = iVar158 + 1;
              }
              dVar225 = 2.0;
              if ((uVar13 >> 0x15 & 1) != 0) {
                cVar170 = '\b';
                dVar209 = dVar3;
                dVar225 = dVar3;
                for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                  cVar162 = cVar170;
                  for (lVar112 = 0; lVar112 != 2; lVar112 = lVar112 + 1) {
                    for (lVar145 = 0; lVar145 != 3; lVar145 = lVar145 + 1) {
                      if (((int)lVar145 != 1 || ((int)lVar112 != 0 || (int)lVar156 != 0)) &&
                         ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                        dVar211 = pdVar26[lVar28 * 2 +
                                          (iVar82 + (int)lVar156) * lVar27 +
                                          (iVar85 + (int)lVar112) * lVar147 +
                                          (long)(iVar157 + (int)lVar145)];
                        dVar234 = dVar211;
                        if (dVar211 <= dVar225) {
                          dVar234 = dVar225;
                        }
                        dVar225 = dVar234;
                        if (dVar211 < dVar209) {
                          dVar209 = dVar211;
                        }
                      }
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar211 = (((pdVar88 + lVar98 + lVar155 + (iVar166 - iVar15))[lVar164] - dVar186) *
                           dVar221 +
                          (0.5 - dVar195) * dVar218 +
                          (pdVar88[lVar98 + lVar155 + (iVar166 - iVar15)] - dVar198) * dVar216 +
                          dVar3) - dVar3;
                if (dVar211 <= 1e-13) {
                  dVar225 = 1.0;
                  if ((dVar211 < -1e-13) && (dVar225 = (dVar209 - dVar3) / dVar211, 1.0 <= dVar225))
                  {
                    dVar225 = 1.0;
                  }
                }
                else {
                  dVar225 = (dVar225 - dVar3) / dVar211;
                  if (1.0 <= dVar225) {
                    dVar225 = 1.0;
                  }
                }
                if (2.0 <= dVar225) {
                  dVar225 = 2.0;
                }
              }
              dVar209 = dVar225;
              if ((short)uVar13 < 0) {
                cVar170 = '\x05';
                dVar211 = dVar3;
                dVar209 = dVar3;
                for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                  cVar162 = cVar170;
                  for (lVar112 = -1; lVar112 != 1; lVar112 = lVar112 + 1) {
                    for (lVar145 = 0; lVar145 != 3; lVar145 = lVar145 + 1) {
                      if (((int)lVar145 != 1 || ((int)lVar112 != 0 || (int)lVar156 != 0)) &&
                         ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                        dVar234 = pdVar26[lVar28 * 2 +
                                          (iVar82 + (int)lVar156) * lVar27 +
                                          (iVar85 + (int)lVar112) * lVar147 +
                                          (long)(iVar157 + (int)lVar145)];
                        dVar236 = dVar234;
                        if (dVar234 <= dVar209) {
                          dVar236 = dVar209;
                        }
                        dVar209 = dVar236;
                        if (dVar234 < dVar211) {
                          dVar211 = dVar234;
                        }
                      }
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar234 = (((pdVar88 + lVar98 + lVar160 + (iVar166 - iVar15))[lVar164] - dVar186) *
                           dVar221 +
                          -(dVar195 + 0.5) * dVar218 +
                          (pdVar88[lVar98 + lVar160 + (iVar166 - iVar15)] - dVar198) * dVar216 +
                          dVar3) - dVar3;
                if (dVar234 <= 1e-13) {
                  dVar209 = 1.0;
                  if ((dVar234 < -1e-13) && (dVar209 = (dVar211 - dVar3) / dVar234, 1.0 <= dVar209))
                  {
                    dVar209 = 1.0;
                  }
                }
                else {
                  dVar209 = (dVar209 - dVar3) / dVar234;
                  if (1.0 <= dVar209) {
                    dVar209 = 1.0;
                  }
                }
                if (dVar225 <= dVar209) {
                  dVar209 = dVar225;
                }
              }
              dVar225 = dVar209;
              if ((uVar13 >> 0x13 & 1) != 0) {
                cVar170 = '\x06';
                dVar225 = dVar3;
                dVar211 = dVar3;
                for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                  cVar162 = cVar170;
                  for (lVar112 = -1; lVar112 != 2; lVar112 = lVar112 + 1) {
                    for (lVar145 = 0; lVar145 != 2; lVar145 = lVar145 + 1) {
                      dVar234 = dVar211;
                      if ((((int)lVar112 != 0 || (int)lVar156 != 0) || (int)lVar145 != 0) &&
                         ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                        dVar234 = pdVar26[lVar28 * 2 +
                                          (iVar82 + (int)lVar156) * lVar27 +
                                          (iVar85 + (int)lVar112) * lVar147 +
                                          (long)(iVar117 + (int)lVar145)];
                        dVar236 = dVar234;
                        if (dVar234 <= dVar225) {
                          dVar236 = dVar225;
                        }
                        dVar225 = dVar236;
                        if (dVar211 <= dVar234) {
                          dVar234 = dVar211;
                        }
                      }
                      dVar211 = dVar234;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar234 = (((pdVar32 + lVar99 + lVar165 + ((iVar166 - iVar178) + 1))[lVar35] -
                           dVar186) * dVar221 +
                          (pdVar32[lVar99 + lVar165 + ((iVar166 - iVar178) + 1)] - dVar195) *
                          dVar218 + (0.5 - dVar198) * dVar216 + dVar3) - dVar3;
                if (dVar234 <= 1e-13) {
                  dVar225 = 1.0;
                  if ((dVar234 < -1e-13) && (dVar225 = (dVar211 - dVar3) / dVar234, 1.0 <= dVar225))
                  {
                    dVar225 = 1.0;
                  }
                }
                else {
                  dVar225 = (dVar225 - dVar3) / dVar234;
                  if (1.0 <= dVar225) {
                    dVar225 = 1.0;
                  }
                }
                if (dVar209 <= dVar225) {
                  dVar225 = dVar209;
                }
              }
              dVar209 = dVar225;
              if ((uVar13 >> 0x11 & 1) != 0) {
                cVar170 = '\x05';
                dVar211 = dVar3;
                dVar209 = dVar3;
                for (lVar156 = -1; lVar156 != 2; lVar156 = lVar156 + 1) {
                  cVar162 = cVar170;
                  for (lVar112 = -1; lVar112 != 2; lVar112 = lVar112 + 1) {
                    for (lVar145 = 0; lVar145 != 2; lVar145 = lVar145 + 1) {
                      dVar234 = dVar211;
                      if (((int)lVar145 != 1 || ((int)lVar112 != 0 || (int)lVar156 != 0)) &&
                         ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                        dVar234 = pdVar26[lVar28 * 2 +
                                          (iVar82 + (int)lVar156) * lVar27 +
                                          (iVar85 + (int)lVar112) * lVar147 +
                                          (long)(iVar157 + (int)lVar145)];
                        dVar236 = dVar234;
                        if (dVar234 <= dVar209) {
                          dVar236 = dVar209;
                        }
                        dVar209 = dVar236;
                        if (dVar211 <= dVar234) {
                          dVar234 = dVar211;
                        }
                      }
                      dVar211 = dVar234;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar234 = (((pdVar32 + lVar99 + lVar165 + (iVar166 - iVar178))[lVar35] - dVar186) *
                           dVar221 +
                          (pdVar32[lVar99 + lVar165 + (iVar166 - iVar178)] - dVar195) * dVar218 +
                          (dVar3 - (dVar198 + 0.5) * dVar216)) - dVar3;
                if (dVar234 <= 1e-13) {
                  dVar209 = 1.0;
                  if ((dVar234 < -1e-13) && (dVar209 = (dVar211 - dVar3) / dVar234, 1.0 <= dVar209))
                  {
                    dVar209 = 1.0;
                  }
                }
                else {
                  dVar209 = (dVar209 - dVar3) / dVar234;
                  if (1.0 <= dVar209) {
                    dVar209 = 1.0;
                  }
                }
                if (dVar225 <= dVar209) {
                  dVar209 = dVar225;
                }
              }
              dVar225 = dVar209;
              if ((uVar13 >> 0x1b & 1) != 0) {
                cVar170 = '\x0e';
                dVar211 = dVar3;
                dVar225 = dVar3;
                for (lVar156 = 0; lVar156 != 2; lVar156 = lVar156 + 1) {
                  cVar162 = cVar170;
                  for (lVar112 = -1; lVar112 != 2; lVar112 = lVar112 + 1) {
                    for (lVar145 = 0; lVar145 != 3; lVar145 = lVar145 + 1) {
                      dVar234 = dVar211;
                      if (((int)lVar145 != 1 || ((int)lVar112 != 0 || (int)lVar156 != 0)) &&
                         ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                        dVar234 = pdVar26[lVar28 * 2 +
                                          (iVar82 + (int)lVar156) * lVar27 +
                                          (iVar85 + (int)lVar112) * lVar147 +
                                          (long)(iVar157 + (int)lVar145)];
                        dVar236 = dVar234;
                        if (dVar234 <= dVar225) {
                          dVar236 = dVar225;
                        }
                        dVar225 = dVar236;
                        if (dVar211 <= dVar234) {
                          dVar234 = dVar211;
                        }
                      }
                      dVar211 = dVar234;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar198 = ((0.5 - dVar186) * dVar221 +
                          ((pdVar37 + lVar103 + lVar110 + ((iVar115 - iVar19) + 1) * lVar119)
                           [lVar120] - dVar195) * dVar218 +
                          (pdVar37[lVar103 + lVar110 + ((iVar115 - iVar19) + 1) * lVar119] - dVar198
                          ) * dVar216 + dVar3) - dVar3;
                if (dVar198 <= 1e-13) {
                  dVar225 = 1.0;
                  if ((dVar198 < -1e-13) && (dVar225 = (dVar211 - dVar3) / dVar198, 1.0 <= dVar225))
                  {
                    dVar225 = 1.0;
                  }
                }
                else {
                  dVar225 = (dVar225 - dVar3) / dVar198;
                  if (1.0 <= dVar225) {
                    dVar225 = 1.0;
                  }
                }
                if (dVar209 <= dVar225) {
                  dVar225 = dVar209;
                }
              }
              cVar170 = '\x05';
              dVar195 = dVar3;
              dVar198 = dVar3;
              for (lVar156 = -1; lVar156 != 1; lVar156 = lVar156 + 1) {
                cVar162 = cVar170;
                for (lVar112 = -1; lVar112 != 2; lVar112 = lVar112 + 1) {
                  for (lVar145 = 0; lVar145 != 3; lVar145 = lVar145 + 1) {
                    dVar209 = dVar195;
                    if (((int)lVar145 != 1 || ((int)lVar112 != 0 || (int)lVar156 != 0)) &&
                       ((1 << (cVar162 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                      dVar209 = pdVar26[lVar28 * 2 +
                                        (iVar82 + (int)lVar156) * lVar27 +
                                        (iVar85 + (int)lVar112) * lVar147 +
                                        (long)(iVar157 + (int)lVar145)];
                      dVar211 = dVar209;
                      if (dVar209 <= dVar198) {
                        dVar211 = dVar198;
                      }
                      dVar198 = dVar211;
                      if (dVar195 <= dVar209) {
                        dVar209 = dVar195;
                      }
                    }
                    dVar195 = dVar209;
                  }
                  cVar162 = cVar162 + '\x03';
                }
                cVar170 = cVar170 + '\t';
              }
              dVar209 = ((dVar222 * dVar218 + dVar216 * dVar187 + dVar3) - (dVar186 + 0.5) * dVar221
                        ) - dVar3;
              if (dVar209 <= 1e-13) {
                dVar198 = 1.0;
                if ((dVar209 < -1e-13) && (dVar198 = (dVar195 - dVar3) / dVar209, 1.0 <= dVar198)) {
                  dVar198 = 1.0;
                }
              }
              else {
                dVar198 = (dVar198 - dVar3) / dVar209;
                if (1.0 <= dVar198) {
                  dVar198 = 1.0;
                }
              }
              if (dVar225 <= dVar198) {
                dVar198 = dVar225;
              }
              uVar203 = 0;
              uVar205 = 0;
              if (1 < iVar118) {
                uVar203 = SUB84(dVar198,0);
                uVar205 = (undefined4)((ulong)dVar198 >> 0x20);
              }
              dVar195 = 0.0;
              if (1 < iVar142) {
                dVar195 = dVar198;
              }
              dVar225 = 0.0;
              if (1 < (int)local_a08._0_4_) {
                dVar225 = dVar198;
              }
              if ((dVar220 == 1.0) && (!NAN(dVar220))) {
                if ((pdVar38[lVar106 + lVar138 + (int)(~uVar21 + iVar166)] == 1.0) &&
                   (((!NAN(pdVar38[lVar106 + lVar138 + (int)(~uVar21 + iVar166)]) &&
                     (pdVar38[lVar106 + lVar138 + (iVar86 + 1)] == 1.0)) &&
                    (!NAN(pdVar38[lVar106 + lVar138 + (iVar86 + 1)]))))) {
                  uVar203 = 0;
                  uVar205 = 0x3ff00000;
                }
                if (((pdVar38[lVar138 + lVar169 + lVar139] == 1.0) &&
                    (!NAN(pdVar38[lVar138 + lVar169 + lVar139]))) &&
                   ((pdVar38[lVar138 + lVar171 + lVar139] == 1.0 &&
                    (!NAN(pdVar38[lVar138 + lVar171 + lVar139]))))) {
                  dVar195 = 1.0;
                }
                if (((pdVar38[lVar106 + lVar159 + lVar139] == 1.0) &&
                    (!NAN(pdVar38[lVar106 + lVar159 + lVar139]))) &&
                   ((pdVar38[lVar106 + lVar127 + lVar139] == 1.0 &&
                    (!NAN(pdVar38[lVar106 + lVar127 + lVar139]))))) {
                  dVar225 = 1.0;
                }
              }
              dVar198 = (dVar222 * dVar218 * dVar195 +
                        dVar187 * (double)CONCAT44(uVar205,uVar203) * dVar216 + dVar3) -
                        (dVar186 + 0.5) * dVar221 * dVar225;
              dVar195 = dVar217;
              if (dVar198 <= dVar217) {
                dVar195 = dVar198;
              }
              dVar198 = pdVar89[lVar104 + lVar111 + lVar128];
              dVar186 = pdVar89[lVar104 + lVar111 + lVar128 + lVar24];
              dVar3 = pdVar89[lVar104 + lVar111 + lVar128 + lVar24 * 2];
              uVar13 = pEVar29[lVar101 + lVar108 + (lVar148 - lVar92) * lVar31].flag;
              iVar158 = 0;
              cVar170 = '\x05';
              for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                local_a08 = (undefined1  [8])lVar108;
                lVar156 = lVar177;
                lVar112 = lVar161;
                lVar145 = lVar109;
                iVar87 = iVar158;
                cVar162 = cVar170;
                for (lVar111 = -1; iVar87 = iVar87 + 3, lVar111 != 2; lVar111 = lVar111 + 1) {
                  lVar113 = (long)iVar158;
                  paRVar136 = A + lVar113;
                  iVar158 = iVar158 + 3;
                  for (lVar174 = 0; iVar87 - lVar113 != lVar174; lVar174 = lVar174 + 1) {
                    iVar142 = (int)lVar174 + -1;
                    if ((((int)lVar111 == 0 && (int)lVar108 == 0) && iVar142 == 0) ||
                       ((1 << (cVar162 + (char)lVar174 & 0x1fU) & uVar13) == 0)) {
                      (*paRVar136)[0] = 0.0;
                      (*paRVar136)[1] = 0.0;
                      (*paRVar136)[2] = 0.0;
                    }
                    else {
                      dVar187 = *(double *)(lVar156 + lVar174 * 8);
                      (*paRVar136)[0] =
                           (*(double *)(lVar112 + lVar174 * 8) + (double)iVar142) - dVar198;
                      (*paRVar136)[1] = (dVar187 + (double)(int)lVar111) - dVar186;
                      (*paRVar136)[2] =
                           (*(double *)(lVar145 + lVar174 * 8) + (double)(int)lVar108) - dVar3;
                    }
                    paRVar136 = paRVar136 + 1;
                  }
                  lVar112 = lVar112 + lVar121 * 8;
                  lVar156 = lVar156 + lVar121 * 8;
                  lVar145 = lVar145 + lVar121 * 8;
                  cVar162 = cVar162 + '\x03';
                }
                lVar161 = lVar161 + lVar25 * 8;
                lVar177 = lVar177 + lVar25 * 8;
                lVar109 = lVar109 + lVar25 * 8;
                cVar170 = cVar170 + '\t';
              }
              dVar187 = dVar235;
              if (dVar235 <= dVar195) {
                dVar187 = dVar195;
              }
              iVar158 = 0;
              lVar108 = 5;
              for (lVar161 = -1; lVar161 != 2; lVar161 = lVar161 + 1) {
                local_a08 = (undefined1  [8])lVar108;
                lVar109 = lVar108;
                iVar87 = iVar158;
                for (lVar177 = -1; iVar87 = iVar87 + 3, lVar177 != 2; lVar177 = lVar177 + 1) {
                  lVar111 = (long)iVar158;
                  iVar158 = iVar158 + 3;
                  for (lVar156 = 0; iVar87 - lVar111 != lVar156; lVar156 = lVar156 + 1) {
                    RVar188 = 0.0;
                    if (((int)lVar156 != 1 || ((int)lVar177 != 0 || (int)lVar161 != 0)) &&
                       ((1 << ((char)lVar109 + (char)lVar156 & 0x1fU) & uVar13) != 0)) {
                      RVar188 = pdVar26[lVar28 * 2 +
                                        (((int)lVar148 - iVar116) + (int)lVar161) * lVar27 +
                                        (iVar85 + (int)lVar177) * lVar147 +
                                        (long)(iVar157 + (int)lVar156)] - dVar2;
                    }
                    du[lVar111 + lVar156] = RVar188;
                  }
                  lVar109 = lVar109 + 3;
                }
                lVar108 = lVar108 + 9;
              }
              pdVar167 = &local_458;
              for (lVar108 = 0; lVar108 != 3; lVar108 = lVar108 + 1) {
                for (lVar161 = -0x48; lVar161 != 0; lVar161 = lVar161 + 0x18) {
                  *(undefined8 *)((long)pdVar167 + lVar161 + 0x48) = 0;
                }
                local_618[lVar108] = 0.0;
                pdVar167 = pdVar167 + 1;
              }
              pRVar114 = A[0] + 2;
              dVar221 = local_618[0];
              dVar222 = dStack_448;
              dVar225 = local_450;
              dVar209 = local_618[1];
              dVar211 = local_618[2];
              dVar234 = local_418;
              dVar195 = local_458;
              dVar216 = local_438;
              dVar218 = dStack_430;
              for (lVar108 = 0; lVar108 != 0x1b; lVar108 = lVar108 + 1) {
                dVar219 = (*(Real (*) [3])(pRVar114 + -2))[0];
                dVar226 = pRVar114[-1];
                dVar236 = du[lVar108];
                dVar195 = dVar195 + dVar219 * dVar219;
                dVar216 = dVar216 + dVar226 * pRVar114[-1];
                dVar218 = dVar218 + dVar226 * *pRVar114;
                dVar212 = *pRVar114;
                dVar221 = dVar221 + dVar219 * dVar236;
                dVar222 = dVar222 + dVar219 * dVar212;
                dVar225 = dVar225 + dVar226 * dVar219;
                dVar209 = dVar209 + dVar236 * dVar226;
                dVar211 = dVar211 + dVar212 * dVar236;
                dVar234 = dVar234 + dVar212 * dVar212;
                pRVar114 = pRVar114 + 3;
              }
              dVar236 = dVar234 * dVar225 + -dVar218 * dVar222;
              dVar226 = dVar216 * dVar234 - dVar218 * dVar218;
              dVar219 = dVar225 * dVar218 - dVar216 * dVar222;
              dVar212 = dVar225 * dVar211 - dVar222 * dVar209;
              dVar234 = dVar234 * dVar209 - dVar211 * dVar218;
              auVar201._0_8_ =
                   dVar221 * dVar219 +
                   (dVar195 * (dVar216 * dVar211 - dVar218 * dVar209) - dVar225 * dVar212);
              auVar201._8_8_ =
                   dVar222 * (dVar209 * dVar218 - dVar216 * dVar211) +
                   (dVar221 * dVar226 - dVar225 * dVar234);
              dVar216 = dVar219 * dVar222 + (dVar226 * dVar195 - dVar236 * dVar225);
              auVar194._8_8_ = dVar216;
              auVar194._0_8_ = dVar216;
              dVar216 = (dVar212 * dVar222 + (dVar234 * dVar195 - dVar236 * dVar221)) / dVar216;
              auVar202 = divpd(auVar201,auVar194);
              dVar195 = pdVar38[lVar106 + lVar159 + lVar139];
              if ((dVar195 == 1.0) && (!NAN(dVar195))) {
                uVar184 = auVar202._8_8_;
                uVar189 = (ulong)DAT_005fe970;
                if (pdVar38[lVar106 + lVar159 + (int)((iVar166 + -1) - uVar21)] == 1.0) {
                  if ((pdVar38[lVar106 + lVar159 + (int)((iVar166 + 1) - uVar21)] == 1.0) &&
                     (!NAN(pdVar38[lVar106 + lVar159 + (int)((iVar166 + 1) - uVar21)]))) {
                    dVar222 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2] -
                              pdVar26[lVar105 + lVar125 + lVar28 * 2 +
                                                          (long)((iVar166 + -1) - iVar140)];
                    dVar225 = pdVar26[lVar105 + lVar125 + lVar28 * 2 +
                                                          (long)((iVar166 + 1) - iVar140)] -
                              pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                    dVar222 = dVar222 + dVar222;
                    dVar225 = dVar225 + dVar225;
                    dVar221 = (pdVar26[lVar105 + lVar125 + lVar28 * 2 +
                                                           (long)((iVar166 + 1) - iVar140)] -
                              pdVar26[lVar105 + lVar125 + lVar28 * 2 +
                                                          (long)((iVar166 + -1) - iVar140)]) * 0.5;
                    dVar209 = (double)((ulong)dVar222 & uVar189);
                    uVar184 = -(ulong)(0.0 < dVar221);
                    dVar221 = (double)((ulong)dVar221 & uVar189);
                    uVar203 = SUB84(dVar221,0);
                    uVar205 = (undefined4)((ulong)dVar221 >> 0x20);
                    dVar218 = (double)((ulong)dVar225 & uVar189);
                    if (dVar209 <= dVar221) {
                      uVar203 = SUB84(dVar209,0);
                      uVar205 = (undefined4)((ulong)dVar209 >> 0x20);
                    }
                    if ((double)CONCAT44(uVar205,uVar203) <= dVar218) {
                      dVar218 = (double)CONCAT44(uVar205,uVar203);
                    }
                    uVar185 = -(ulong)(0.0 < dVar222 * dVar225) & (ulong)dVar218;
                    uVar184 = ~uVar184 & (uVar185 ^ 0x8000000000000000) | uVar184 & uVar185;
                  }
                }
                if (((pdVar38[lVar159 + lVar132 + lVar139] == 1.0) &&
                    (pdVar38[lVar159 + lVar137 + lVar139] == 1.0)) &&
                   (!NAN(pdVar38[lVar159 + lVar137 + lVar139]))) {
                  dVar222 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2] -
                            pdVar26[lVar28 * 2 + lVar125 + lVar107 + lVar133];
                  dVar225 = pdVar26[lVar28 * 2 + lVar125 + lVar149 + lVar133] -
                            pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                  dVar222 = dVar222 + dVar222;
                  dVar225 = dVar225 + dVar225;
                  dVar221 = (pdVar26[lVar28 * 2 + lVar125 + lVar149 + lVar133] -
                            pdVar26[lVar28 * 2 + lVar125 + lVar107 + lVar133]) * 0.5;
                  dVar216 = (double)((ulong)dVar222 & uVar189);
                  uVar185 = -(ulong)(0.0 < dVar221);
                  dVar221 = (double)((ulong)dVar221 & uVar189);
                  uVar203 = SUB84(dVar221,0);
                  uVar205 = (undefined4)((ulong)dVar221 >> 0x20);
                  dVar218 = (double)((ulong)dVar225 & uVar189);
                  if (dVar216 <= dVar221) {
                    uVar203 = SUB84(dVar216,0);
                    uVar205 = (undefined4)((ulong)dVar216 >> 0x20);
                  }
                  if ((double)CONCAT44(uVar205,uVar203) <= dVar218) {
                    dVar218 = (double)CONCAT44(uVar205,uVar203);
                  }
                  uVar196 = -(ulong)(0.0 < dVar222 * dVar225) & (ulong)dVar218;
                  dVar216 = (double)(~uVar185 & (uVar196 ^ 0x8000000000000000) | uVar185 & uVar196);
                }
                auVar202._8_8_ = uVar184;
                if (((pdVar38[lVar106 + lVar173 + lVar139] == 1.0) && (dVar220 == 1.0)) &&
                   (!NAN(dVar220))) {
                  dVar221 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2] -
                            pdVar26[lVar105 + lVar133 + lVar129 * lVar27 + lVar28 * 2];
                  dVar222 = pdVar26[lVar105 + lVar133 + lVar182 + lVar28 * 2] -
                            pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                  dVar221 = dVar221 + dVar221;
                  dVar222 = dVar222 + dVar222;
                  dVar218 = (pdVar26[lVar105 + lVar133 + lVar182 + lVar28 * 2] -
                            pdVar26[lVar105 + lVar133 + lVar129 * lVar27 + lVar28 * 2]) * 0.5;
                  dVar225 = (double)((ulong)dVar221 & uVar189);
                  uVar185 = -(ulong)(0.0 < dVar218);
                  dVar218 = (double)((ulong)dVar218 & uVar189);
                  uVar203 = SUB84(dVar218,0);
                  uVar205 = (undefined4)((ulong)dVar218 >> 0x20);
                  dVar220 = (double)((ulong)dVar222 & uVar189);
                  if (dVar225 <= dVar218) {
                    uVar203 = SUB84(dVar225,0);
                    uVar205 = (undefined4)((ulong)dVar225 >> 0x20);
                  }
                  if ((double)CONCAT44(uVar205,uVar203) <= dVar220) {
                    dVar220 = (double)CONCAT44(uVar205,uVar203);
                  }
                  uVar189 = -(ulong)(0.0 < dVar221 * dVar222) & (ulong)dVar220;
                  auVar202._0_8_ = ~uVar185 & (uVar189 ^ 0x8000000000000000) | uVar185 & uVar189;
                }
              }
              iVar118 = 0;
              auVar79._12_4_ = 0;
              auVar79._0_12_ = stack0xfffffffffffff5fc;
              _local_a08 = auVar79 << 0x20;
              iVar142 = 0;
              iVar87 = 0;
              iVar158 = -1;
              while (iVar158 != 2) {
                iVar151 = iVar118;
                iVar176 = -1;
                while (iVar176 != 2) {
                  for (iVar179 = 5; iVar179 != 8; iVar179 = iVar179 + 1) {
                    if (((uVar13 >> (iVar151 + iVar179 & 0x1fU) & 1) != 0) &&
                       ((iVar179 != 6 || iVar176 != 0) || iVar158 != 0)) {
                      iVar87 = iVar87 + (uint)((iVar179 - 5U & 0xfffffffd) == 0 &&
                                              (iVar176 == 0 && iVar158 == 0));
                      iVar142 = iVar142 + (uint)((iVar179 == 6 && iVar158 == 0) &&
                                                (iVar176 == 1 || iVar176 + 1 == 0));
                      local_a08._0_4_ =
                           local_a08._0_4_ +
                           (uint)((iVar179 == 6 && iVar176 == 0) &&
                                 (iVar158 == 1 || iVar158 + 1 == 0));
                    }
                  }
                  iVar151 = iVar151 + 3;
                  iVar176 = iVar176 + 1;
                }
                iVar118 = iVar118 + 9;
                iVar158 = iVar158 + 1;
              }
              dVar218 = auVar202._0_8_;
              dVar221 = auVar202._8_8_;
              dVar220 = 2.0;
              iVar158 = (int)lVar96;
              if ((uVar13 >> 0x15 & 1) != 0) {
                dVar222 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                cVar170 = '\b';
                uVar203 = SUB84(dVar222,0);
                uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                uVar204 = 0;
                uVar206 = 0;
                dVar220 = dVar222;
                for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                  cVar162 = cVar170;
                  for (lVar161 = 0; lVar161 != 2; lVar161 = lVar161 + 1) {
                    for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                      if ((((int)lVar161 == 0 && (int)lVar108 == 0) && (int)lVar177 == 0) ||
                         ((1 << (cVar162 + (char)lVar177 + 1U & 0x1f) & uVar13) == 0)) {
LAB_00343271:
                        auVar223._4_4_ = uVar205;
                        auVar223._0_4_ = uVar203;
                        auVar223._12_4_ = uVar206;
                        auVar223._8_4_ = uVar204;
                        dVar209 = dVar220;
                      }
                      else {
                        dVar225 = pdVar26[lVar28 * 2 +
                                          (iVar158 + (int)lVar108) * lVar27 +
                                          (iVar85 + (int)lVar161) * lVar147 +
                                          (long)(iVar117 + (int)lVar177)];
                        auVar223._8_8_ = 0;
                        auVar223._0_8_ = dVar225;
                        dVar209 = dVar225;
                        if (dVar225 <= dVar220) {
                          dVar209 = dVar220;
                        }
                        dVar220 = dVar209;
                        if ((double)CONCAT44(uVar205,uVar203) < dVar225 ||
                            (double)CONCAT44(uVar205,uVar203) == dVar225) goto LAB_00343271;
                      }
                      uVar203 = auVar223._0_4_;
                      uVar205 = auVar223._4_4_;
                      uVar204 = auVar223._8_4_;
                      uVar206 = auVar223._12_4_;
                      dVar220 = dVar209;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar225 = (((pdVar88 + lVar130 + lVar155 + (iVar166 - iVar15))[lVar164] - dVar3) *
                           dVar218 +
                          (0.5 - dVar186) * dVar216 +
                          (pdVar88[lVar130 + lVar155 + (iVar166 - iVar15)] - dVar198) * dVar221 +
                          dVar222) - dVar222;
                if (dVar225 <= 1e-13) {
                  dVar220 = 1.0;
                  if ((dVar225 < -1e-13) &&
                     (dVar220 = ((double)CONCAT44(uVar205,uVar203) - dVar222) / dVar225,
                     1.0 <= dVar220)) {
                    dVar220 = 1.0;
                  }
                }
                else {
                  dVar220 = (dVar220 - dVar222) / dVar225;
                  if (1.0 <= dVar220) {
                    dVar220 = 1.0;
                  }
                }
                if (2.0 <= dVar220) {
                  dVar220 = 2.0;
                }
              }
              dVar222 = dVar220;
              if ((short)uVar13 < 0) {
                dVar225 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                cVar170 = '\x05';
                dVar209 = dVar225;
                dVar222 = dVar225;
                for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                  cVar162 = cVar170;
                  for (lVar161 = -1; lVar161 != 1; lVar161 = lVar161 + 1) {
                    for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                      uVar203 = SUB84(dVar222,0);
                      uVar205 = (undefined4)((ulong)dVar222 >> 0x20);
                      if ((((int)lVar161 != 0 || (int)lVar108 != 0) || (int)lVar177 != 0) &&
                         ((1 << (cVar162 + (char)lVar177 + 1U & 0x1f) & uVar13) != 0)) {
                        dVar211 = pdVar26[lVar28 * 2 +
                                          (iVar158 + (int)lVar108) * lVar27 +
                                          (iVar85 + (int)lVar161) * lVar147 +
                                          (long)(iVar117 + (int)lVar177)];
                        uVar204 = SUB84(dVar211,0);
                        uVar206 = (int)((ulong)dVar211 >> 0x20);
                        if (dVar211 <= dVar222) {
                          uVar204 = uVar203;
                          uVar206 = uVar205;
                        }
                        uVar203 = uVar204;
                        uVar205 = uVar206;
                        if (dVar211 < dVar209) {
                          dVar209 = dVar211;
                        }
                      }
                      dVar222 = (double)CONCAT44(uVar205,uVar203);
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar211 = (((pdVar88 + lVar130 + lVar160 + (iVar166 - iVar15))[lVar164] - dVar3) *
                           dVar218 +
                          -(dVar186 + 0.5) * dVar216 +
                          (pdVar88[lVar130 + lVar160 + (iVar166 - iVar15)] - dVar198) * dVar221 +
                          dVar225) - dVar225;
                if (dVar211 <= 1e-13) {
                  dVar222 = 1.0;
                  if ((dVar211 < -1e-13) &&
                     (dVar222 = (dVar209 - dVar225) / dVar211, 1.0 <= dVar222)) {
                    dVar222 = 1.0;
                  }
                }
                else {
                  dVar222 = (dVar222 - dVar225) / dVar211;
                  if (1.0 <= dVar222) {
                    dVar222 = 1.0;
                  }
                }
                if (dVar220 <= dVar222) {
                  dVar222 = dVar220;
                }
              }
              dVar220 = dVar222;
              if ((uVar13 >> 0x13 & 1) != 0) {
                dVar225 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                cVar170 = '\x06';
                auVar232._8_8_ = 0;
                auVar232._0_8_ = dVar225;
                dVar220 = dVar225;
                for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                  cVar162 = cVar170;
                  for (lVar161 = -1; lVar161 != 2; lVar161 = lVar161 + 1) {
                    for (lVar177 = 0; lVar177 != 2; lVar177 = lVar177 + 1) {
                      auVar239 = auVar232;
                      if ((((int)lVar161 != 0 || (int)lVar108 != 0) || (int)lVar177 != 0) &&
                         ((1 << (cVar162 + (char)lVar177 & 0x1fU) & uVar13) != 0)) {
                        dVar209 = pdVar26[lVar28 * 2 +
                                          (iVar158 + (int)lVar108) * lVar27 +
                                          (iVar85 + (int)lVar161) * lVar147 +
                                          (long)(iVar117 + (int)lVar177)];
                        auVar239._8_8_ = 0;
                        auVar239._0_8_ = dVar209;
                        dVar211 = dVar209;
                        if (dVar209 <= dVar220) {
                          dVar211 = dVar220;
                        }
                        dVar220 = dVar211;
                        if (auVar232._0_8_ <= dVar209) {
                          auVar239 = auVar232;
                        }
                      }
                      auVar232 = auVar239;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar209 = (((pdVar32 + lVar131 + lVar165 + ((iVar166 - iVar178) + 1))[lVar35] -
                           dVar3) * dVar218 +
                          (pdVar32[lVar131 + lVar165 + ((iVar166 - iVar178) + 1)] - dVar186) *
                          dVar216 + (0.5 - dVar198) * dVar221 + dVar225) - dVar225;
                if (dVar209 <= 1e-13) {
                  dVar220 = 1.0;
                  if ((dVar209 < -1e-13) &&
                     (dVar220 = (auVar232._0_8_ - dVar225) / dVar209, 1.0 <= dVar220)) {
                    dVar220 = 1.0;
                  }
                }
                else {
                  dVar220 = (dVar220 - dVar225) / dVar209;
                  if (1.0 <= dVar220) {
                    dVar220 = 1.0;
                  }
                }
                if (dVar222 <= dVar220) {
                  dVar220 = dVar222;
                }
              }
              dVar222 = dVar220;
              if ((uVar13 >> 0x11 & 1) != 0) {
                dVar225 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                cVar170 = '\x05';
                dVar209 = dVar225;
                dVar222 = dVar225;
                for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                  cVar162 = cVar170;
                  for (lVar161 = -1; lVar161 != 2; lVar161 = lVar161 + 1) {
                    for (lVar177 = -1; lVar177 != 1; lVar177 = lVar177 + 1) {
                      dVar211 = dVar209;
                      if ((((int)lVar161 != 0 || (int)lVar108 != 0) || (int)lVar177 != 0) &&
                         ((1 << (cVar162 + (char)lVar177 + 1U & 0x1f) & uVar13) != 0)) {
                        dVar211 = pdVar26[lVar28 * 2 +
                                          (iVar158 + (int)lVar108) * lVar27 +
                                          (iVar85 + (int)lVar161) * lVar147 +
                                          (long)(iVar117 + (int)lVar177)];
                        dVar234 = dVar211;
                        if (dVar211 <= dVar222) {
                          dVar234 = dVar222;
                        }
                        dVar222 = dVar234;
                        if (dVar209 <= dVar211) {
                          dVar211 = dVar209;
                        }
                      }
                      dVar209 = dVar211;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar211 = (((pdVar32 + lVar131 + lVar165 + (iVar166 - iVar178))[lVar35] - dVar3) *
                           dVar218 +
                          (pdVar32[lVar131 + lVar165 + (iVar166 - iVar178)] - dVar186) * dVar216 +
                          (dVar225 - (dVar198 + 0.5) * dVar221)) - dVar225;
                if (dVar211 <= 1e-13) {
                  dVar222 = 1.0;
                  if ((dVar211 < -1e-13) &&
                     (dVar222 = (dVar209 - dVar225) / dVar211, 1.0 <= dVar222)) {
                    dVar222 = 1.0;
                  }
                }
                else {
                  dVar222 = (dVar222 - dVar225) / dVar211;
                  if (1.0 <= dVar222) {
                    dVar222 = 1.0;
                  }
                }
                if (dVar220 <= dVar222) {
                  dVar222 = dVar220;
                }
              }
              dVar220 = dVar222;
              if ((uVar13 >> 0x1b & 1) != 0) {
                dVar225 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                cVar170 = '\x0e';
                dVar220 = dVar225;
                dVar209 = dVar225;
                for (lVar108 = 0; lVar108 != 2; lVar108 = lVar108 + 1) {
                  cVar162 = cVar170;
                  for (lVar161 = -1; lVar161 != 2; lVar161 = lVar161 + 1) {
                    for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                      dVar211 = dVar209;
                      if ((((int)lVar161 != 0 || (int)lVar108 != 0) || (int)lVar177 != 0) &&
                         ((1 << (cVar162 + (char)lVar177 + 1U & 0x1f) & uVar13) != 0)) {
                        dVar211 = pdVar26[lVar28 * 2 +
                                          (iVar158 + (int)lVar108) * lVar27 +
                                          (iVar85 + (int)lVar161) * lVar147 +
                                          (long)(iVar117 + (int)lVar177)];
                        dVar234 = dVar211;
                        if (dVar211 <= dVar220) {
                          dVar234 = dVar220;
                        }
                        dVar220 = dVar234;
                        if (dVar209 <= dVar211) {
                          dVar211 = dVar209;
                        }
                      }
                      dVar209 = dVar211;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar211 = ((0.5 - dVar3) * dVar218 +
                          (pdVar91[lVar120] - dVar186) * dVar216 +
                          (*pdVar91 - dVar198) * dVar221 + dVar225) - dVar225;
                if (dVar211 <= 1e-13) {
                  dVar220 = 1.0;
                  if ((dVar211 < -1e-13) &&
                     (dVar220 = (dVar209 - dVar225) / dVar211, 1.0 <= dVar220)) {
                    dVar220 = 1.0;
                  }
                }
                else {
                  dVar220 = (dVar220 - dVar225) / dVar211;
                  if (1.0 <= dVar220) {
                    dVar220 = 1.0;
                  }
                }
                if (dVar222 <= dVar220) {
                  dVar220 = dVar222;
                }
              }
              dVar222 = dVar220;
              if ((uVar13 >> 9 & 1) != 0) {
                dVar225 = pdVar26[lVar105 + lVar133 + lVar125 + lVar28 * 2];
                cVar170 = '\x05';
                uVar203 = SUB84(dVar225,0);
                uVar205 = (undefined4)((ulong)dVar225 >> 0x20);
                uVar204 = 0;
                uVar206 = 0;
                dVar209 = dVar225;
                for (lVar108 = -1; lVar108 != 1; lVar108 = lVar108 + 1) {
                  cVar162 = cVar170;
                  for (lVar161 = -1; lVar161 != 2; lVar161 = lVar161 + 1) {
                    for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                      if ((((int)lVar161 == 0 && (int)lVar108 == 0) && (int)lVar177 == 0) ||
                         ((1 << (cVar162 + (char)lVar177 + 1U & 0x1f) & uVar13) == 0)) {
                        auVar224._4_4_ = uVar205;
                        auVar224._0_4_ = uVar203;
                        auVar224._12_4_ = uVar206;
                        auVar224._8_4_ = uVar204;
                        dVar222 = dVar209;
                      }
                      else {
                        dVar222 = pdVar26[lVar28 * 2 +
                                          (iVar158 + (int)lVar108) * lVar27 +
                                          (iVar85 + (int)lVar161) * lVar147 +
                                          (long)(iVar117 + (int)lVar177)];
                        dVar211 = dVar222;
                        if (dVar222 <= (double)CONCAT44(uVar205,uVar203)) {
                          dVar211 = (double)CONCAT44(uVar205,uVar203);
                        }
                        auVar224._8_8_ = 0;
                        auVar224._0_8_ = dVar211;
                        if (dVar209 <= dVar222) {
                          dVar222 = dVar209;
                        }
                      }
                      dVar209 = dVar222;
                      uVar203 = auVar224._0_4_;
                      uVar205 = auVar224._4_4_;
                      uVar204 = auVar224._8_4_;
                      uVar206 = auVar224._12_4_;
                    }
                    cVar162 = cVar162 + '\x03';
                  }
                  cVar170 = cVar170 + '\t';
                }
                dVar211 = ((((pdVar37 + lVar103 + lVar110 + (lVar148 - iVar19) * lVar119)[lVar120] -
                            dVar186) * dVar216 +
                           (pdVar37[lVar103 + lVar110 + (lVar148 - iVar19) * lVar119] - dVar198) *
                           dVar221 + dVar225) - (dVar3 + 0.5) * dVar218) - dVar225;
                if (dVar211 <= 1e-13) {
                  dVar222 = 1.0;
                  if ((dVar211 < -1e-13) &&
                     (dVar222 = (dVar209 - dVar225) / dVar211, 1.0 <= dVar222)) {
                    dVar222 = 1.0;
                  }
                }
                else {
                  dVar222 = ((double)CONCAT44(uVar205,uVar203) - dVar225) / dVar211;
                  if (1.0 <= dVar222) {
                    dVar222 = 1.0;
                  }
                }
                if (dVar220 <= dVar222) {
                  dVar222 = dVar220;
                }
              }
              uVar204 = (undefined4)((ulong)dVar222 >> 0x20);
              uVar203 = 0;
              uVar205 = 0;
              if (1 < iVar87) {
                uVar203 = SUB84(dVar222,0);
                uVar205 = uVar204;
              }
              uVar206 = 0;
              uVar207 = 0;
              if (1 < iVar142) {
                uVar206 = SUB84(dVar222,0);
                uVar207 = uVar204;
              }
              dVar220 = 0.0;
              if (1 < (int)local_a08._0_4_) {
                dVar220 = dVar222;
              }
              if ((dVar195 == 1.0) && (!NAN(dVar195))) {
                if ((pdVar38[lVar106 + lVar159 + (int)(~uVar21 + iVar166)] == 1.0) &&
                   (((!NAN(pdVar38[lVar106 + lVar159 + (int)(~uVar21 + iVar166)]) &&
                     (pdVar38[lVar106 + lVar159 + (iVar86 + 1)] == 1.0)) &&
                    (!NAN(pdVar38[lVar106 + lVar159 + (iVar86 + 1)]))))) {
                  uVar203 = 0;
                  uVar205 = 0x3ff00000;
                }
                if (((pdVar38[lVar159 + lVar169 + lVar139] == 1.0) &&
                    (!NAN(pdVar38[lVar159 + lVar169 + lVar139]))) &&
                   ((pdVar38[lVar159 + lVar171 + lVar139] == 1.0 &&
                    (!NAN(pdVar38[lVar159 + lVar171 + lVar139]))))) {
                  uVar206 = 0;
                  uVar207 = 0x3ff00000;
                }
                if (((pdVar38[lVar106 + lVar100 + lVar139] == 1.0) &&
                    (!NAN(pdVar38[lVar106 + lVar100 + lVar139]))) &&
                   ((pdVar38[lVar106 + lVar138 + lVar139] == 1.0 &&
                    (!NAN(pdVar38[lVar106 + lVar138 + lVar139]))))) {
                  dVar220 = 1.0;
                }
              }
              dVar197 = (0.5 - dVar3) * dVar218 * dVar220 +
                        (dVar197 - dVar198) * dVar221 * (double)CONCAT44(uVar205,uVar203) + dVar2 +
                        (dVar199 - dVar186) * dVar216 * (double)CONCAT44(uVar207,uVar206);
              if (dVar197 <= dVar217) {
                dVar217 = dVar197;
              }
              if (dVar235 <= dVar217) {
                local_5f8._0_4_ = SUB84(dVar217,0);
                local_5f8._4_4_ = (undefined4)((ulong)dVar217 >> 0x20);
              }
              iVar86 = d_bcrec[2].bc[5];
              if (lVar168 == iVar6) {
                iVar158 = d_bcrec[2].bc[2];
                uVar203 = (undefined4)((ulong)dVar187 >> 0x20);
                switch(iVar158) {
                case 1:
                case 2:
                case 4:
                  local_5f8._0_4_ = SUB84(dVar187,0);
                  local_5f8._4_4_ = uVar203;
                default:
                  if ((iVar158 == 4) || (iVar158 == 2)) {
                    local_5f8._0_4_ = 0;
                    local_5f8._4_4_ = 0;
                    if (dVar187 <= 0.0) {
                      local_5f8._0_4_ = SUB84(dVar187,0);
                      local_5f8._4_4_ = uVar203;
                    }
                    dVar187 = (double)CONCAT44(local_5f8._4_4_,(int)local_5f8);
                  }
                  break;
                case 3:
                  dVar187 = pdVar26[lVar105 + lVar133 + (iVar83 + iVar115) * lVar27 + lVar28 * 2];
                  local_5f8._0_4_ = SUB84(dVar187,0);
                  local_5f8._4_4_ = (undefined4)((ulong)dVar187 >> 0x20);
                  break;
                case -1:
                  dVar187 = 0.0;
                  local_5f8._0_4_ = 0;
                  local_5f8._4_4_ = 0;
                }
                if (lVar168 == (long)iVar7 + 1) {
LAB_00343e89:
                  if ((iVar86 == 4) || (iVar86 == 2)) {
                    dVar187 = 0.0;
                    if (0.0 <= (double)CONCAT44(local_5f8._4_4_,(int)local_5f8)) {
                      dVar187 = (double)CONCAT44(local_5f8._4_4_,(int)local_5f8);
                    }
                    local_5f8._0_4_ = SUB84(dVar187,0);
                    local_5f8._4_4_ = (undefined4)((ulong)dVar187 >> 0x20);
                  }
                }
LAB_00343ed4:
                if (((double)CONCAT44(local_5f8._4_4_,(int)local_5f8) < 0.0) &&
                   (dVar197 = 0.0, 0.0 < dVar187)) goto LAB_00343f1c;
              }
              else {
                if (lVar168 != (long)iVar7 + 1) goto LAB_00343ed4;
                switch(iVar86) {
                case 1:
                case 2:
                case 4:
                  dVar187 = (double)CONCAT44(local_5f8._4_4_,(int)local_5f8);
                default:
                  goto LAB_00343e89;
                case 3:
                  dVar187 = pdVar26[lVar105 + lVar133 + lVar182 + lVar28 * 2];
                  local_5f8._0_4_ = SUB84(dVar187,0);
                  local_5f8._4_4_ = (undefined4)((ulong)dVar187 >> 0x20);
                  goto LAB_00343ed4;
                case -1:
                  local_5f8._0_4_ = 0;
                  local_5f8._4_4_ = 0;
                  dVar187 = 0.0;
                }
              }
              dVar199 = (dVar187 + (double)CONCAT44(local_5f8._4_4_,(int)local_5f8)) * 0.5;
              dVar197 = (double)CONCAT44(local_5f8._4_4_,(int)local_5f8);
              if ((dVar199 < 1e-08) && (dVar197 = 0.0, dVar199 <= -1e-08)) {
                dVar197 = dVar187;
              }
            }
LAB_00343f1c:
            pdVar1[lVar95 + lVar102 * lVar152 + (lVar154 - iVar9)] = dVar197;
            iVar135 = iVar135 + 1;
            iVar157 = iVar157 + 1;
            iVar117 = iVar117 + 1;
            bVar183 = iVar166 != iVar5;
            lVar154 = lVar153;
            iVar166 = iVar166 + 1;
          } while (bVar183);
        }
      }
      local_7e0 = local_7e0 + lVar25;
      local_7e8 = local_7e8 + lVar25;
      local_7f0 = local_7f0 + lVar25;
      lVar168 = local_3b8;
    }
  }
  return;
}

Assistant:

void
EBMOL::ExtrapVelToFacesBox ( AMREX_D_DECL( Box const& ubx,
                                           Box const& vbx,
                                           Box const& wbx ),
                             AMREX_D_DECL( Array4<Real> const& u,
                                           Array4<Real> const& v,
                                           Array4<Real> const& w ),
                             Array4<Real const> const& vcc,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL( Array4<Real const> const& fcx,
                                           Array4<Real const> const& fcy,
                                           Array4<Real const> const& fcz ),
                             Array4<Real const> const& ccc,
                             Array4<Real const> const& vfrac,
                             const Geometry&  geom,
                             Vector<BCRec> const& h_bcrec,
                             const BCRec* d_bcrec )
{

    const Box& domain_box = geom.Domain();
    AMREX_D_TERM(
        const int domain_ilo = domain_box.smallEnd(0);
        const int domain_ihi = domain_box.bigEnd(0);,
        const int domain_jlo = domain_box.smallEnd(1);
        const int domain_jhi = domain_box.bigEnd(1);,
        const int domain_klo = domain_box.smallEnd(2);
        const int domain_khi = domain_box.bigEnd(2););

    int order = 2;

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************


    int n_for_xbc = 0;

    auto extdir_lohi_x_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_u = extdir_lohi_x_for_u.first;
    bool has_extdir_or_ho_hi_x_for_u = extdir_lohi_x_for_u.second;

    auto extdir_lohi_y_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_u = extdir_lohi_y_for_u.first;
    bool has_extdir_or_ho_hi_y_for_u = extdir_lohi_y_for_u.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_u = extdir_lohi_z_for_u.first;
    bool has_extdir_or_ho_hi_z_for_u = extdir_lohi_z_for_u.second;
#endif



    // ****************************************************************************
    // Predict to x-faces
    // ****************************************************************************
    if ((has_extdir_or_ho_lo_x_for_u && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_u && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_u && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_u && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_u && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_u && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[0].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[0].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[0].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[0].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[0].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[0].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif
               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               Real vcc_mns = vcc(i-1,j,k,0);
               Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }

               if (i == domain_ilo && (d_bcrec[0].lo(0) == BCType::ext_dir)) {
                   u_val = vcc_mns;
               } else if (i == domain_ihi+1 && (d_bcrec[0].hi(0) == BCType::ext_dir)) {
                   u_val = vcc_pls;
               }
            }

            u(i,j,k) = u_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_ilo,domain_ihi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i-1,j,k,0);
               const Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }
            }

            u(i,j,k) = u_val;
        });
    }

    // ****************************************************************************
    // Predict to y-faces
    // ****************************************************************************

    int n_for_ybc = 1;

    auto extdir_lohi_x_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_v = extdir_lohi_x_for_v.first;
    bool has_extdir_or_ho_hi_x_for_v = extdir_lohi_x_for_v.second;

    auto extdir_lohi_y_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_v = extdir_lohi_y_for_v.first;
    bool has_extdir_or_ho_hi_y_for_v = extdir_lohi_y_for_v.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_v = extdir_lohi_z_for_v.first;
    bool has_extdir_or_ho_hi_z_for_v = extdir_lohi_z_for_v.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_v && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_v && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_v && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_v && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_v && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_v && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[1].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[1].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[1].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[1].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[1].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[1].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }

               if (j == domain_jlo && (d_bcrec[1].lo(1) == BCType::ext_dir)) {
                   v_val = vcc_mns;
               }
               else if (j == domain_jhi+1 && (d_bcrec[1].hi(1) == BCType::ext_dir)) {
                   v_val = vcc_pls;
               }
            }

            v(i,j,k) = v_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_jlo,domain_jhi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }
            }

            v(i,j,k) = v_val;
        });
    }

#if (AMREX_SPACEDIM == 3)
    // ****************************************************************************
    // Predict to z-faces
    // ****************************************************************************

    int n_for_zbc = 2;

    auto extdir_lohi_x_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_w = extdir_lohi_x_for_w.first;
    bool has_extdir_or_ho_hi_x_for_w = extdir_lohi_x_for_w.second;

    auto extdir_lohi_y_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_w = extdir_lohi_y_for_w.first;
    bool has_extdir_or_ho_hi_y_for_w = extdir_lohi_y_for_w.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_w = extdir_lohi_z_for_w.first;
    bool has_extdir_or_ho_hi_z_for_w = extdir_lohi_z_for_w.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_w && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_w && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_w && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_w && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_w && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_w && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         domain_ilo,domain_ihi,domain_jlo,domain_jhi,domain_klo,domain_khi,
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            bool extdir_or_ho_ilo = (d_bcrec[2].lo(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (d_bcrec[2].hi(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(0) == BCType::hoextrap);

            bool extdir_or_ho_jlo = (d_bcrec[2].lo(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(1) == BCType::hoextrap);
            bool extdir_or_ho_jhi = (d_bcrec[2].hi(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(1) == BCType::hoextrap);

            bool extdir_or_ho_klo = (d_bcrec[2].lo(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (d_bcrec[2].hi(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(2) == BCType::hoextrap);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }

                if (k == domain_klo && (d_bcrec[2].lo(2) == BCType::ext_dir)) {
                    w_val = vcc_mns;
                }
                else if (k == domain_khi+1 && (d_bcrec[2].hi(2) == BCType::ext_dir)) {
                    w_val = vcc_pls;
                }
            }

            w(i,j,k) = w_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_klo,domain_khi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }
            }

            w(i,j,k) = w_val;
        });
    }
#endif
}